

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Mish_x86_fma::forward_inplace(Mish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [24];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [24];
  long *in_RSI;
  float fVar245;
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  __m256 two;
  __m256 one_2;
  __m256 two_2;
  __m256 one_12;
  __m256 y_1;
  __m256 z;
  __m256 tmp_1;
  __m256 mask_1;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 y_7;
  __m256 z_2;
  __m256 tmp_7;
  __m256 mask_7;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_11;
  __m256i imm0_4;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 pow2n_4;
  __m256 y_6;
  __m256 mask_6;
  __m256 one_10;
  __m256i imm0_3;
  __m256 fx_4;
  __m256 tmp_6;
  __m256 one_13;
  __m256 pow2n_5;
  __m256 y_8;
  __m256 mask_8;
  __m256 one_14;
  __m256i imm0_5;
  __m256 fx_5;
  __m256 tmp_8;
  __m256 one_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_2;
  __m256 one_4;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_2;
  imm_xmm_union u_21;
  imm_xmm_union u_20;
  __m256i ret_8;
  __m128i x2_8;
  __m128i x1_8;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_24;
  imm_xmm_union u_23;
  imm_xmm_union u_22;
  __m256i ret_9;
  __m128i y2_4;
  __m128i y1_4;
  __m128i x2_9;
  __m128i x1_9;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  imm_xmm_union u_7;
  __m256i ret_3;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_12;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_27;
  imm_xmm_union u_26;
  imm_xmm_union u_25;
  __m256i ret_10;
  __m128i y2_5;
  __m128i y1_5;
  __m128i x2_10;
  __m128i x1_10;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  __m256i ret_5;
  __m128i x2_5;
  __m128i x1_5;
  imm_xmm_union u_29;
  imm_xmm_union u_28;
  __m256i ret_11;
  __m128i x2_11;
  __m128i x1_11;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 two_1;
  __m128 one_7;
  __m128 two_3;
  __m128 one_17;
  v4sf y_4;
  v4sf z_1;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_1;
  v4sf y_10;
  v4sf z_3;
  v4sf tmp_10;
  v4sf mask_10;
  v4sf e_3;
  v4sf invalid_mask_3;
  v4sf one_16;
  v4si emm0_4;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf pow2n_6;
  v4sf y_9;
  v4sf mask_9;
  v4sf one_15;
  v4si emm0_3;
  v4sf fx_6;
  v4sf tmp_9;
  __m128 one_18;
  v4sf pow2n_7;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_19;
  v4si emm0_5;
  v4sf fx_7;
  v4sf tmp_11;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_2;
  v4sf fx_3;
  v4sf tmp_5;
  undefined8 local_6ed0;
  undefined8 uStack_6ec8;
  undefined8 local_6ec0;
  undefined8 uStack_6eb8;
  undefined8 uStack_6eb0;
  undefined8 uStack_6ea8;
  int local_6e8c;
  undefined8 local_6e88;
  undefined8 local_6e80;
  undefined8 local_6e78;
  undefined4 local_6e70;
  long local_6e68;
  undefined4 local_6e60;
  undefined4 local_6e5c;
  undefined4 local_6e58;
  undefined4 local_6e54;
  undefined4 local_6e50;
  undefined8 local_6e48;
  undefined1 (*local_6e40) [32];
  int local_6e34;
  undefined8 local_6e30;
  undefined8 uStack_6e28;
  int local_6e1c;
  undefined1 (*local_6dd0) [16];
  int local_6dc4;
  undefined8 local_6dc0;
  undefined8 uStack_6db8;
  undefined8 uStack_6db0;
  undefined8 uStack_6da8;
  int local_6d98;
  undefined1 (*local_6d40) [32];
  int local_6d34;
  int local_6d30;
  int local_6d2c;
  int local_6d28;
  int local_6d24;
  int local_6d20;
  int local_6d1c;
  long *local_6d10;
  undefined1 local_6cf5;
  int local_6cf4;
  undefined8 *local_6ce8;
  undefined8 *local_6cb0;
  undefined8 *local_6c60;
  undefined1 (*local_6c50) [32];
  undefined8 local_6c40;
  undefined8 uStack_6c38;
  undefined8 uStack_6c30;
  undefined8 uStack_6c28;
  undefined8 local_6c00;
  undefined8 uStack_6bf8;
  undefined8 uStack_6bf0;
  undefined8 uStack_6be8;
  undefined1 (*local_6bc8) [32];
  undefined1 (*local_6b80) [32];
  undefined8 local_6b70;
  undefined8 uStack_6b68;
  undefined8 local_6b50;
  undefined8 uStack_6b48;
  undefined1 (*local_6b38) [32];
  long local_6aa0;
  undefined4 local_6a94;
  long local_6a90;
  undefined1 (*local_6a88) [32];
  undefined4 local_6a7c;
  int local_6a78;
  int local_6a74;
  undefined8 *local_6a70;
  undefined4 local_6a64;
  long local_6a60;
  undefined8 *local_6a20;
  float local_6960;
  float fStack_695c;
  float fStack_6958;
  float fStack_6954;
  float local_6940;
  float fStack_693c;
  float fStack_6938;
  float fStack_6934;
  float fStack_6930;
  float fStack_692c;
  float fStack_6928;
  undefined4 uStack_6924;
  undefined1 local_6920 [8];
  float fStack_6918;
  float fStack_6914;
  undefined1 local_6900 [8];
  float fStack_68f8;
  float fStack_68f4;
  float fStack_68f0;
  float fStack_68ec;
  float fStack_68e8;
  undefined4 uStack_68e4;
  float local_6880;
  float fStack_687c;
  float fStack_6878;
  float fStack_6874;
  float fStack_6870;
  float fStack_686c;
  float fStack_6868;
  float local_6860;
  float fStack_685c;
  float fStack_6858;
  float fStack_6854;
  float fStack_6850;
  float fStack_684c;
  float fStack_6848;
  undefined4 uStack_6844;
  undefined8 local_6840;
  undefined8 uStack_6838;
  undefined8 uStack_6830;
  undefined8 uStack_6828;
  undefined8 local_6820;
  undefined8 uStack_6818;
  undefined8 uStack_6810;
  undefined8 uStack_6808;
  undefined8 local_6800;
  undefined8 uStack_67f8;
  undefined8 uStack_67f0;
  undefined8 uStack_67e8;
  undefined8 local_67e0;
  undefined8 uStack_67d8;
  undefined8 uStack_67d0;
  undefined8 uStack_67c8;
  undefined8 local_67c0;
  undefined8 uStack_67b8;
  undefined8 uStack_67b0;
  undefined8 uStack_67a8;
  undefined1 local_67a0 [8];
  undefined8 uStack_6798;
  undefined8 uStack_6790;
  undefined8 uStack_6788;
  undefined1 local_6720 [8];
  float fStack_6718;
  float fStack_6714;
  undefined8 uStack_6710;
  undefined8 uStack_6708;
  undefined1 local_66a0 [8];
  float fStack_6698;
  float fStack_6694;
  undefined8 uStack_6690;
  undefined8 uStack_6688;
  float local_6620;
  float fStack_661c;
  float fStack_6618;
  float fStack_6614;
  undefined1 local_65c0 [8];
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  ulong uStack_65a8;
  float local_65a0;
  float fStack_659c;
  float fStack_6598;
  float fStack_6594;
  float fStack_6590;
  float fStack_658c;
  float fStack_6588;
  float fStack_6584;
  undefined1 local_6580 [32];
  undefined1 local_6560 [32];
  undefined1 local_6540 [8];
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined1 local_6520 [32];
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 local_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  undefined1 local_64c0 [8];
  undefined8 uStack_64b8;
  undefined8 uStack_64b0;
  undefined8 uStack_64a8;
  undefined8 local_64a0;
  undefined8 uStack_6498;
  undefined8 uStack_6490;
  undefined8 uStack_6488;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  ulong uStack_6468;
  undefined8 local_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 local_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 local_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 uStack_63b0;
  undefined8 uStack_63a8;
  undefined8 local_63a0;
  undefined8 uStack_6398;
  undefined8 uStack_6390;
  undefined8 uStack_6388;
  undefined8 local_6380;
  undefined8 uStack_6378;
  undefined8 uStack_6370;
  undefined8 uStack_6368;
  undefined8 local_6360;
  undefined8 uStack_6358;
  undefined8 uStack_6350;
  undefined8 uStack_6348;
  undefined8 local_6340;
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  float local_6320;
  float fStack_631c;
  float fStack_6318;
  float fStack_6314;
  float local_62e0;
  float fStack_62dc;
  float fStack_62d8;
  float fStack_62d4;
  float fStack_62d0;
  float fStack_62cc;
  float fStack_62c8;
  float fStack_62c4;
  float local_62c0;
  float fStack_62bc;
  float fStack_62b8;
  float fStack_62b4;
  float fStack_62b0;
  float fStack_62ac;
  float fStack_62a8;
  float fStack_62a4;
  float local_6280;
  float fStack_627c;
  float fStack_6278;
  float fStack_6274;
  float fStack_6270;
  float fStack_626c;
  float fStack_6268;
  float fStack_6264;
  float local_6260;
  float fStack_625c;
  float fStack_6258;
  float fStack_6254;
  float fStack_6250;
  float fStack_624c;
  float fStack_6248;
  float fStack_6244;
  undefined8 local_6220;
  undefined8 uStack_6218;
  undefined8 uStack_6210;
  undefined8 uStack_6208;
  undefined8 local_6200;
  undefined8 uStack_61f8;
  undefined8 uStack_61f0;
  undefined8 uStack_61e8;
  undefined1 local_61c0 [32];
  undefined8 local_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined1 local_6120 [8];
  float fStack_6118;
  float fStack_6114;
  float local_60e0;
  float fStack_60dc;
  float fStack_60d8;
  float fStack_60d4;
  float fStack_60d0;
  float fStack_60cc;
  float fStack_60c8;
  float local_6080;
  float fStack_607c;
  float fStack_6078;
  float fStack_6074;
  float local_6040;
  float fStack_603c;
  float fStack_6038;
  float fStack_6034;
  undefined8 local_6020;
  undefined8 uStack_6018;
  undefined8 uStack_6010;
  undefined8 uStack_6008;
  undefined1 local_6000 [8];
  undefined8 uStack_5ff8;
  undefined8 uStack_5ff0;
  undefined8 uStack_5fe8;
  undefined1 local_5fe0 [32];
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  undefined1 local_5f80 [32];
  undefined1 local_5f60 [8];
  undefined8 uStack_5f58;
  undefined8 uStack_5f50;
  undefined8 uStack_5f48;
  undefined1 local_5f40 [32];
  undefined8 local_5f20;
  undefined8 uStack_5f18;
  undefined8 uStack_5f10;
  undefined8 uStack_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  undefined8 local_5ee0;
  undefined8 uStack_5ed8;
  undefined8 uStack_5ed0;
  undefined8 uStack_5ec8;
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  undefined8 local_5ea0;
  undefined8 uStack_5e98;
  undefined8 uStack_5e90;
  undefined8 uStack_5e88;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 uStack_5e70;
  undefined8 uStack_5e68;
  undefined4 local_5e58;
  undefined4 local_5e54;
  undefined4 local_5e44;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  undefined8 uStack_5e30;
  undefined8 uStack_5e28;
  undefined8 local_5e20;
  undefined8 uStack_5e18;
  undefined8 uStack_5e10;
  undefined8 uStack_5e08;
  undefined1 local_5e00 [32];
  uint uStack_5dd8;
  uint uStack_5dd4;
  uint uStack_5dd0;
  uint uStack_5dcc;
  uint uStack_5dc8;
  uint uStack_5dc4;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined8 uStack_5d70;
  undefined8 uStack_5d68;
  float local_5d60;
  float fStack_5d5c;
  float fStack_5d58;
  float fStack_5d54;
  float fStack_5d50;
  float fStack_5d4c;
  float fStack_5d48;
  undefined4 uStack_5d44;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  float local_5d20;
  float fStack_5d1c;
  float fStack_5d18;
  float fStack_5d14;
  float fStack_5d10;
  float fStack_5d0c;
  float fStack_5d08;
  float fStack_5d04;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined1 local_5ce0 [8];
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined1 local_5cc0 [32];
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined1 local_5c60 [32];
  undefined1 local_5c40 [8];
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined1 local_5c20 [32];
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined4 local_5b24;
  float local_5b20;
  float fStack_5b1c;
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  float fStack_5b04;
  undefined1 local_5a80 [32];
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 uStack_5a10;
  undefined8 uStack_5a08;
  undefined1 local_59e0 [8];
  float fStack_59d8;
  float fStack_59d4;
  float local_59a0;
  float fStack_599c;
  float fStack_5998;
  float fStack_5994;
  float fStack_5990;
  float fStack_598c;
  float fStack_5988;
  float local_5940;
  float fStack_593c;
  float fStack_5938;
  float fStack_5934;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  float fStack_5844;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 local_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined8 local_5780;
  undefined8 uStack_5778;
  undefined8 uStack_5770;
  undefined8 uStack_5768;
  undefined8 local_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  undefined8 local_5720;
  undefined8 uStack_5718;
  undefined8 uStack_5710;
  undefined8 uStack_5708;
  undefined1 local_56c0 [32];
  undefined8 local_56a0;
  undefined8 uStack_5698;
  undefined8 uStack_5690;
  undefined8 uStack_5688;
  undefined8 local_5680;
  undefined8 uStack_5678;
  undefined8 uStack_5670;
  undefined8 uStack_5668;
  undefined8 local_5660;
  undefined8 uStack_5658;
  undefined8 uStack_5650;
  undefined8 uStack_5648;
  undefined1 local_5580 [32];
  undefined1 local_5560 [32];
  undefined1 local_5540 [32];
  undefined1 local_5500 [32];
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined1 local_52d0 [16];
  undefined1 local_52c0 [16];
  undefined4 local_52a4;
  undefined8 local_52a0;
  undefined8 uStack_5298;
  undefined8 uStack_5290;
  undefined8 uStack_5288;
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 local_4d70;
  undefined8 uStack_4d68;
  undefined1 local_4d60 [16];
  undefined1 local_4d50 [16];
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined1 *local_4b00;
  undefined1 *local_4af8;
  undefined1 *local_4af0;
  float *local_4ae8;
  undefined1 *local_4ae0;
  undefined1 *local_4ad8;
  float *local_4ad0;
  undefined1 *local_4ac8;
  undefined1 *local_4ac0;
  float *local_4ab8;
  undefined1 *local_4ab0;
  undefined1 *local_4aa8;
  float *local_4aa0;
  undefined1 *local_4a98;
  undefined1 *local_4a90;
  float *local_4a88;
  undefined1 *local_4a80;
  undefined1 *local_4a78;
  float *local_4a70;
  float *local_4a68;
  undefined1 *local_4a60;
  undefined1 *local_4a58;
  undefined1 *local_4a50;
  undefined1 *local_4a48;
  float *local_4a40;
  undefined1 *local_4a38;
  undefined1 *local_4a30;
  float *local_4a28;
  undefined1 *local_4a20;
  undefined1 *local_4a18;
  float *local_4a10;
  undefined1 *local_4a08;
  undefined1 *local_4a00;
  float *local_49f8;
  undefined1 *local_49f0;
  undefined1 *local_49e8;
  float *local_49e0;
  undefined1 *local_49d8;
  undefined1 *local_49d0;
  float *local_49c8;
  float *local_49c0;
  undefined1 *local_49b8;
  undefined1 *local_4908;
  float *local_4900;
  undefined1 *local_48f8;
  undefined1 *local_48f0;
  float *local_48e8;
  undefined1 *local_48e0;
  float *local_48d8;
  undefined1 *local_48d0;
  undefined1 *local_48c8;
  float *local_48c0;
  undefined1 *local_48b8;
  undefined1 *local_48b0;
  float *local_48a8;
  undefined1 *local_48a0;
  undefined1 *local_4898;
  float *local_4890;
  undefined1 *local_4888;
  undefined1 *local_4880;
  float *local_4878;
  undefined1 *local_4870;
  undefined1 *local_4868;
  float *local_4860;
  undefined1 *local_4858;
  undefined1 *local_4850;
  float *local_4848;
  undefined1 *local_4840;
  undefined1 *local_4838;
  float *local_4830;
  undefined1 *local_4828;
  undefined1 *local_4820;
  undefined1 *local_46f8;
  float *local_46f0;
  undefined1 *local_46e8;
  undefined1 *local_46e0;
  float *local_46d8;
  undefined1 *local_46d0;
  undefined1 *local_46c8;
  float *local_46c0;
  undefined1 *local_46b8;
  undefined1 *local_46b0;
  float *local_46a8;
  undefined1 *local_46a0;
  undefined1 *local_4668;
  float *local_4660;
  float *local_4658;
  undefined4 local_45f4;
  undefined8 local_45f0;
  undefined8 uStack_45e8;
  undefined4 local_45d4;
  undefined8 local_45d0;
  undefined8 uStack_45c8;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 local_4570;
  undefined8 uStack_4568;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 local_4550;
  undefined8 uStack_4548;
  float local_4180 [2];
  float afStack_4178 [2];
  float afStack_4170 [2];
  float afStack_4168 [2];
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  float local_4120 [2];
  float afStack_4118 [2];
  float afStack_4110 [2];
  float afStack_4108 [2];
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  float local_40c0 [2];
  float afStack_40b8 [2];
  float afStack_40b0 [2];
  float afStack_40a8 [2];
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  float local_4060 [2];
  float afStack_4058 [2];
  float afStack_4050 [2];
  float afStack_4048 [2];
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  float local_4000 [2];
  float afStack_3ff8 [2];
  float afStack_3ff0 [2];
  float afStack_3fe8 [2];
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  float local_3fa0 [2];
  float afStack_3f98 [2];
  float afStack_3f90 [2];
  float afStack_3f88 [2];
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  float local_3f40 [2];
  float afStack_3f38 [2];
  float afStack_3f30 [2];
  float afStack_3f28 [2];
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  float local_3ee0 [2];
  float afStack_3ed8 [2];
  float afStack_3ed0 [2];
  float afStack_3ec8 [2];
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  ulong uStack_3e68;
  float local_3e60 [2];
  float afStack_3e58 [2];
  float afStack_3e50 [2];
  float afStack_3e48 [2];
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  float local_3e00 [2];
  float afStack_3df8 [2];
  float afStack_3df0 [2];
  float afStack_3de8 [2];
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  float local_3b20 [2];
  float afStack_3b18 [2];
  float afStack_3b10 [2];
  float afStack_3b08 [2];
  float local_3b00 [2];
  float afStack_3af8 [2];
  float afStack_3af0 [2];
  float afStack_3ae8 [2];
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  float local_3ac0 [2];
  float afStack_3ab8 [2];
  float afStack_3ab0 [2];
  float afStack_3aa8 [2];
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  float local_3a60 [2];
  float afStack_3a58 [2];
  float afStack_3a50 [2];
  float afStack_3a48 [2];
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  float local_3a00 [2];
  float afStack_39f8 [2];
  float afStack_39f0 [2];
  float afStack_39e8 [2];
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  float local_39a0 [2];
  float afStack_3998 [2];
  float afStack_3990 [2];
  float afStack_3988 [2];
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  float local_3940 [2];
  float afStack_3938 [2];
  float afStack_3930 [2];
  float afStack_3928 [2];
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  float local_3880 [2];
  float afStack_3878 [2];
  float afStack_3870 [2];
  float afStack_3868 [2];
  float local_3860 [2];
  float afStack_3858 [2];
  float afStack_3850 [2];
  float afStack_3848 [2];
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  float local_3820 [2];
  float afStack_3818 [2];
  float afStack_3810 [2];
  float afStack_3808 [2];
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  float local_37c0 [2];
  float afStack_37b8 [2];
  float afStack_37b0 [2];
  float afStack_37a8 [2];
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  float local_3760 [2];
  float afStack_3758 [2];
  float afStack_3750 [2];
  float afStack_3748 [2];
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  float local_3700 [2];
  float afStack_36f8 [2];
  float afStack_36f0 [2];
  float afStack_36e8 [2];
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  float local_36a0 [2];
  float afStack_3698 [2];
  float afStack_3690 [2];
  float afStack_3688 [2];
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  float local_32c0 [2];
  float afStack_32b8 [2];
  float afStack_32b0 [2];
  float afStack_32a8 [2];
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  float local_31a0 [2];
  float afStack_3198 [2];
  float afStack_3190 [2];
  float afStack_3188 [2];
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  float local_3140 [2];
  float afStack_3138 [2];
  float afStack_3130 [2];
  float afStack_3128 [2];
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  float local_30e0 [2];
  float afStack_30d8 [2];
  float afStack_30d0 [2];
  float afStack_30c8 [2];
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  float local_3080 [2];
  float afStack_3078 [2];
  float afStack_3070 [2];
  float afStack_3068 [2];
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  float local_2e80;
  float fStack_2e7c;
  float fStack_2e78;
  float fStack_2e74;
  float fStack_2e70;
  float fStack_2e6c;
  float fStack_2e68;
  float fStack_2e64;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  float local_2e20;
  float fStack_2e1c;
  float fStack_2e18;
  float fStack_2e14;
  float fStack_2e10;
  float fStack_2e0c;
  float fStack_2e08;
  float fStack_2e04;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 local_2c70;
  undefined8 uStack_2c68;
  undefined1 local_2c60 [16];
  undefined1 local_2c50 [16];
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 local_2b70;
  undefined8 uStack_2b68;
  undefined1 local_2b60 [16];
  undefined1 local_2b50 [16];
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28d0 [16];
  undefined1 local_28c0 [16];
  undefined4 local_28a4;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined4 local_27e4;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 local_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 local_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  undefined4 local_2534;
  undefined8 local_2530;
  undefined8 uStack_2528;
  undefined4 local_2514;
  undefined8 local_2510;
  undefined8 uStack_2508;
  undefined4 local_24f4;
  undefined8 local_24f0;
  undefined8 uStack_24e8;
  undefined4 local_24d4;
  undefined8 local_24d0;
  undefined8 uStack_24c8;
  undefined1 local_2440 [16];
  undefined1 auStack_2430 [16];
  undefined4 local_2420;
  undefined4 local_241c;
  undefined4 local_2418;
  undefined4 local_2414;
  undefined4 local_2410;
  undefined4 local_240c;
  undefined4 local_2408;
  undefined4 local_2404;
  undefined1 local_2400 [16];
  undefined1 auStack_23f0 [16];
  undefined4 local_23e0;
  undefined4 local_23dc;
  undefined4 local_23d8;
  undefined4 local_23d4;
  undefined4 local_23d0;
  undefined4 local_23cc;
  undefined4 local_23c8;
  undefined4 local_23c4;
  ulong local_2380;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined1 local_2300 [16];
  undefined1 auStack_22f0 [16];
  undefined4 local_22e0;
  undefined4 local_22dc;
  undefined4 local_22d8;
  undefined4 local_22d4;
  undefined4 local_22d0;
  undefined4 local_22cc;
  undefined4 local_22c8;
  undefined4 local_22c4;
  undefined1 local_22c0 [16];
  undefined1 auStack_22b0 [16];
  undefined4 local_22a0;
  undefined4 local_229c;
  undefined4 local_2298;
  undefined4 local_2294;
  undefined4 local_2290;
  undefined4 local_228c;
  undefined4 local_2288;
  undefined4 local_2284;
  float local_2280;
  float fStack_227c;
  float fStack_2278;
  float fStack_2274;
  float local_2270;
  float fStack_226c;
  float fStack_2268;
  float fStack_2264;
  undefined1 local_2260 [8];
  float fStack_2258;
  float fStack_2254;
  undefined1 local_2250 [8];
  float fStack_2248;
  float fStack_2244;
  float local_2200;
  float fStack_21fc;
  float fStack_21f8;
  float fStack_21f4;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  undefined8 local_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 local_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined1 local_2190 [8];
  float fStack_2188;
  float fStack_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 local_2170;
  undefined8 uStack_2168;
  undefined1 local_2160 [8];
  undefined8 uStack_2158;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined1 local_20e0 [8];
  undefined8 uStack_20d8;
  float local_2060;
  float fStack_205c;
  float fStack_2058;
  float fStack_2054;
  undefined1 local_2030 [8];
  undefined8 uStack_2028;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  undefined1 local_2010 [16];
  undefined1 local_2000 [16];
  undefined1 local_1ff0 [8];
  undefined8 uStack_1fe8;
  undefined1 local_1fe0 [16];
  undefined8 local_1fd0;
  undefined8 uStack_1fc8;
  undefined1 local_1fc0 [16];
  undefined1 local_1fb0 [8];
  undefined8 uStack_1fa8;
  undefined4 local_1f94;
  undefined8 local_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 local_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 local_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 local_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 local_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 local_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 local_1eb0;
  undefined8 uStack_1ea8;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float local_1e80;
  float fStack_1e7c;
  float fStack_1e78;
  float fStack_1e74;
  float local_1e70;
  float fStack_1e6c;
  float fStack_1e68;
  float fStack_1e64;
  float local_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 local_1e10;
  undefined8 uStack_1e08;
  undefined1 local_1df0 [16];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 local_1db0;
  undefined8 uStack_1da8;
  undefined1 local_1da0 [8];
  float fStack_1d98;
  float fStack_1d94;
  float local_1d40;
  float fStack_1d3c;
  float fStack_1d38;
  float fStack_1d34;
  float local_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  float local_1cf0;
  float fStack_1cec;
  float fStack_1ce8;
  float fStack_1ce4;
  float local_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined1 local_1c90 [8];
  undefined8 uStack_1c88;
  undefined1 local_1c80 [16];
  undefined8 local_1c70;
  undefined8 uStack_1c68;
  undefined1 local_1c60 [16];
  undefined1 local_1c50 [8];
  undefined8 uStack_1c48;
  undefined1 local_1c40 [8];
  undefined8 uStack_1c38;
  undefined1 local_1c30 [16];
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 local_1c10;
  undefined8 uStack_1c08;
  undefined4 local_1bf4;
  undefined8 local_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 local_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 local_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 local_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 local_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 local_1b50;
  undefined8 uStack_1b48;
  undefined4 local_1b40;
  undefined4 uStack_1b3c;
  undefined4 uStack_1b38;
  undefined4 uStack_1b34;
  undefined4 local_1b24;
  undefined4 local_1b20;
  undefined4 uStack_1b1c;
  undefined4 uStack_1b18;
  undefined4 uStack_1b14;
  undefined4 local_1b04;
  undefined4 local_1aa0;
  undefined4 uStack_1a9c;
  undefined4 uStack_1a98;
  undefined4 uStack_1a94;
  undefined4 local_1a84;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 local_1a70;
  undefined8 uStack_1a68;
  undefined1 local_1a40 [16];
  undefined8 local_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 local_1a10;
  undefined8 uStack_1a08;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined1 local_19b0 [16];
  undefined8 local_1980;
  undefined8 uStack_1978;
  float local_1970;
  float fStack_196c;
  float fStack_1968;
  float fStack_1964;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined1 local_1950 [16];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined1 local_1930 [8];
  undefined8 uStack_1928;
  undefined1 local_1920 [16];
  undefined8 local_1910;
  undefined8 uStack_1908;
  undefined1 local_1900 [16];
  undefined1 local_18f0 [8];
  undefined8 uStack_18e8;
  undefined1 local_18e0 [8];
  undefined8 uStack_18d8;
  undefined1 local_18d0 [16];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 local_18b0;
  undefined8 uStack_18a8;
  undefined4 local_1894;
  undefined8 local_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined1 local_1870 [16];
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 local_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 local_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 local_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  undefined4 local_17e0;
  undefined4 uStack_17dc;
  undefined4 uStack_17d8;
  undefined4 uStack_17d4;
  undefined4 local_17c4;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 local_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 local_1790;
  undefined8 uStack_1788;
  undefined1 local_1730 [16];
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 local_16f0;
  undefined8 uStack_16e8;
  undefined1 local_16e0 [8];
  float fStack_16d8;
  float fStack_16d4;
  float local_1680;
  float fStack_167c;
  float fStack_1678;
  float fStack_1674;
  float local_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  float local_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  float local_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  undefined1 local_1550 [16];
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 local_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 local_1350;
  undefined8 uStack_1348;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 local_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 local_1230;
  undefined8 uStack_1228;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 local_1170;
  undefined8 uStack_1168;
  undefined1 *local_10b0;
  undefined1 *local_10a8;
  undefined1 *local_10a0;
  float *local_1098;
  undefined1 *local_1090;
  undefined1 *local_1088;
  float *local_1080;
  undefined1 *local_1078;
  undefined1 *local_1070;
  float *local_1068;
  undefined1 *local_1060;
  undefined1 *local_1058;
  float *local_1050;
  undefined1 *local_1048;
  undefined1 *local_1040;
  float *local_1038;
  undefined1 *local_1030;
  undefined1 *local_1028;
  undefined1 *local_1020;
  undefined1 *local_1018;
  undefined1 *local_1010;
  float *local_1008;
  undefined1 *local_1000;
  undefined1 *local_ff8;
  float *local_ff0;
  undefined1 *local_fe8;
  undefined1 *local_fe0;
  float *local_fd8;
  undefined1 *local_fd0;
  undefined1 *local_fc8;
  float *local_fc0;
  undefined1 *local_fb8;
  undefined1 *local_fb0;
  float *local_fa8;
  undefined1 *local_fa0;
  undefined1 *local_f98;
  undefined1 *local_f00;
  float *local_ef8;
  undefined1 *local_ef0;
  undefined1 *local_ee8;
  float *local_ee0;
  undefined1 *local_ed8;
  float *local_ed0;
  undefined1 *local_ec8;
  undefined1 *local_ec0;
  float *local_eb8;
  undefined1 *local_eb0;
  undefined1 *local_ea8;
  float *local_ea0;
  undefined1 *local_e98;
  undefined1 *local_e90;
  float *local_e88;
  undefined1 *local_e80;
  undefined1 *local_e78;
  float *local_e70;
  undefined1 *local_e68;
  undefined1 *local_e60;
  float *local_e58;
  undefined1 *local_e50;
  undefined1 *local_e48;
  float *local_e40;
  undefined1 *local_e38;
  undefined1 *local_e30;
  float *local_e28;
  undefined1 *local_e20;
  undefined1 *local_e18;
  undefined1 *local_cf0;
  float *local_ce8;
  undefined1 *local_ce0;
  undefined1 *local_cd8;
  float *local_cd0;
  undefined1 *local_cc8;
  undefined1 *local_cc0;
  float *local_cb8;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  float *local_ca0;
  undefined1 *local_c98;
  undefined1 *local_c60;
  float *local_c58;
  float *local_c50;
  float local_a50 [2];
  float afStack_a48 [2];
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  float local_a20 [2];
  float afStack_a18 [2];
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  float local_9f0 [2];
  float afStack_9e8 [2];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  float local_9c0 [2];
  float afStack_9b8 [2];
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  float local_990 [2];
  float afStack_988 [2];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  float local_960 [2];
  float afStack_958 [2];
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  float local_930 [2];
  float afStack_928 [2];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  float local_900 [2];
  float afStack_8f8 [2];
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  float local_8c0 [2];
  float afStack_8b8 [2];
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  float local_890 [2];
  float afStack_888 [2];
  undefined8 local_880;
  undefined8 uStack_878;
  float local_750 [2];
  float afStack_748 [2];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  float local_720 [2];
  float afStack_718 [2];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  float local_6f0 [2];
  float afStack_6e8 [2];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  float local_6c0 [2];
  float afStack_6b8 [2];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  float local_690 [2];
  float afStack_688 [2];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  float local_630 [2];
  float afStack_628 [2];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  float local_600 [2];
  float afStack_5f8 [2];
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  float local_5d0 [2];
  float afStack_5c8 [2];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  float local_5a0 [2];
  float afStack_598 [2];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  float local_570 [2];
  float afStack_568 [2];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_3b0 [2];
  float afStack_3a8 [2];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320 [2];
  float afStack_318 [2];
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_2f0 [2];
  float afStack_2e8 [2];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  float local_2c0 [2];
  float afStack_2b8 [2];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  float local_290 [2];
  float afStack_288 [2];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  
  local_6d1c = *(int *)((long)in_RSI + 0x2c);
  local_6d20 = (int)in_RSI[6];
  local_6d24 = *(int *)((long)in_RSI + 0x34);
  local_6d28 = (int)in_RSI[7];
  local_6d2c = local_6d1c * local_6d20 * local_6d24;
  local_6d30 = (int)in_RSI[3];
  if (local_6d30 == 8) {
    for (local_6d34 = 0; local_6d34 < local_6d28; local_6d34 = local_6d34 + 1) {
      local_6d40 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_6d34 * in_RSI[2]);
      for (local_6d98 = 0; local_6d98 < local_6d2c; local_6d98 = local_6d98 + 1) {
        auVar121._8_8_ = 0x42b0c0a542b0c0a5;
        auVar121._0_8_ = 0x42b0c0a542b0c0a5;
        auVar121._16_8_ = 0x42b0c0a542b0c0a5;
        auVar121._24_8_ = 0x42b0c0a542b0c0a5;
        auVar4 = vminps_avx(*local_6d40,auVar121);
        auVar42._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar42._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar42._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar42._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar246 = vmaxps_avx(auVar4,auVar42);
        auVar82._8_4_ = 1.442695;
        auVar82._12_4_ = 1.442695;
        auVar82._0_4_ = 1.442695;
        auVar82._4_4_ = 1.442695;
        auVar82._16_4_ = 1.442695;
        auVar82._20_4_ = 1.442695;
        auVar82._24_4_ = 1.442695;
        auVar82._28_4_ = 1.442695;
        auVar81._8_4_ = 0.5;
        auVar81._12_4_ = 0.5;
        auVar81._0_4_ = 0.5;
        auVar81._4_4_ = 0.5;
        auVar81._16_4_ = 0.5;
        auVar81._20_4_ = 0.5;
        auVar81._24_4_ = 0.5;
        auVar81._28_4_ = 0.5;
        auVar9 = vfmadd213ps_fma(auVar82,auVar246,auVar81);
        auVar8 = vroundps_avx(ZEXT1632(auVar9),1);
        auVar4 = vcmpps_avx(ZEXT1632(auVar9),auVar8,1);
        auVar50._8_8_ = 0x3f8000003f800000;
        auVar50._0_8_ = 0x3f8000003f800000;
        auVar50._16_8_ = 0x3f8000003f800000;
        auVar50._24_8_ = 0x3f8000003f800000;
        auVar4 = vandps_avx(auVar4,auVar50);
        auVar4 = vsubps_avx(auVar8,auVar4);
        auVar110._8_4_ = 0.6933594;
        auVar110._12_4_ = 0.6933594;
        auVar110._0_4_ = 0.6933594;
        auVar110._4_4_ = 0.6933594;
        auVar110._16_4_ = 0.6933594;
        auVar110._20_4_ = 0.6933594;
        auVar110._24_4_ = 0.6933594;
        auVar110._28_4_ = 0.6933594;
        auVar9 = vfnmadd213ps_fma(auVar110,auVar4,auVar246);
        auVar111._8_4_ = -0.00021219444;
        auVar111._12_4_ = -0.00021219444;
        auVar111._0_4_ = -0.00021219444;
        auVar111._4_4_ = -0.00021219444;
        auVar111._16_4_ = -0.00021219444;
        auVar111._20_4_ = -0.00021219444;
        auVar111._24_4_ = -0.00021219444;
        auVar111._28_4_ = -0.00021219444;
        auVar9 = vfnmadd213ps_fma(auVar111,auVar4,ZEXT1632(auVar9));
        auVar246 = ZEXT1632(auVar9);
        local_6080 = auVar9._0_4_;
        fStack_607c = auVar9._4_4_;
        fStack_6078 = auVar9._8_4_;
        fStack_6074 = auVar9._12_4_;
        _local_6120 = ZEXT1632(CONCAT412(fStack_6074 * fStack_6074,
                                         CONCAT48(fStack_6078 * fStack_6078,
                                                  CONCAT44(fStack_607c * fStack_607c,
                                                           local_6080 * local_6080))));
        local_61c0._8_8_ = 0x3950696739506967;
        local_61c0._0_8_ = 0x3950696739506967;
        local_61c0._16_8_ = 0x3950696739506967;
        local_61c0._24_8_ = 0x3950696739506967;
        auVar83._8_4_ = 0.0013981999;
        auVar83._12_4_ = 0.0013981999;
        auVar83._0_4_ = 0.0013981999;
        auVar83._4_4_ = 0.0013981999;
        auVar83._16_4_ = 0.0013981999;
        auVar83._20_4_ = 0.0013981999;
        auVar83._24_4_ = 0.0013981999;
        auVar83._28_4_ = 0.0013981999;
        auVar9 = vfmadd213ps_fma(auVar246,local_61c0,auVar83);
        auVar84._8_4_ = 0.008333452;
        auVar84._12_4_ = 0.008333452;
        auVar84._0_4_ = 0.008333452;
        auVar84._4_4_ = 0.008333452;
        auVar84._16_4_ = 0.008333452;
        auVar84._20_4_ = 0.008333452;
        auVar84._24_4_ = 0.008333452;
        auVar84._28_4_ = 0.008333452;
        auVar9 = vfmadd213ps_fma(auVar246,ZEXT1632(auVar9),auVar84);
        auVar85._8_4_ = 0.041665796;
        auVar85._12_4_ = 0.041665796;
        auVar85._0_4_ = 0.041665796;
        auVar85._4_4_ = 0.041665796;
        auVar85._16_4_ = 0.041665796;
        auVar85._20_4_ = 0.041665796;
        auVar85._24_4_ = 0.041665796;
        auVar85._28_4_ = 0.041665796;
        auVar9 = vfmadd213ps_fma(auVar246,ZEXT1632(auVar9),auVar85);
        auVar86._8_4_ = 0.16666666;
        auVar86._12_4_ = 0.16666666;
        auVar86._0_4_ = 0.16666666;
        auVar86._4_4_ = 0.16666666;
        auVar86._16_4_ = 0.16666666;
        auVar86._20_4_ = 0.16666666;
        auVar86._24_4_ = 0.16666666;
        auVar86._28_4_ = 0.16666666;
        auVar9 = vfmadd213ps_fma(auVar246,ZEXT1632(auVar9),auVar86);
        auVar87._8_4_ = 0.5;
        auVar87._12_4_ = 0.5;
        auVar87._0_4_ = 0.5;
        auVar87._4_4_ = 0.5;
        auVar87._16_4_ = 0.5;
        auVar87._20_4_ = 0.5;
        auVar87._24_4_ = 0.5;
        auVar87._28_4_ = 0.5;
        auVar9 = vfmadd213ps_fma(auVar246,ZEXT1632(auVar9),auVar87);
        auVar9 = vfmadd213ps_fma(_local_6120,ZEXT1632(auVar9),auVar246);
        local_6040 = auVar9._0_4_;
        fStack_603c = auVar9._4_4_;
        fStack_6038 = auVar9._8_4_;
        fStack_6034 = auVar9._12_4_;
        local_2e20 = auVar4._0_4_;
        fStack_2e1c = auVar4._4_4_;
        fStack_2e18 = auVar4._8_4_;
        fStack_2e14 = auVar4._12_4_;
        fStack_2e10 = auVar4._16_4_;
        fStack_2e0c = auVar4._20_4_;
        fStack_2e08 = auVar4._24_4_;
        fStack_2e04 = auVar4._28_4_;
        local_6160 = CONCAT44((int)fStack_2e1c,(int)local_2e20);
        uStack_6158 = CONCAT44((int)fStack_2e14,(int)fStack_2e18);
        uStack_6150 = CONCAT44((int)fStack_2e0c,(int)fStack_2e10);
        uStack_6148 = CONCAT44((int)fStack_2e04,(int)fStack_2e08);
        auVar125._8_8_ = uStack_6158;
        auVar125._0_8_ = local_6160;
        auVar124._8_8_ = 0x7f0000007f;
        auVar124._0_8_ = 0x7f0000007f;
        auVar9 = vpaddd_avx(auVar124,auVar125);
        auVar123._8_8_ = uStack_6148;
        auVar123._0_8_ = uStack_6150;
        auVar122._8_8_ = 0x7f0000007f;
        auVar122._0_8_ = 0x7f0000007f;
        auVar6 = vpaddd_avx(auVar122,auVar123);
        auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
        auVar6 = vpslld_avx(auVar6,ZEXT416(0x17));
        local_60e0 = auVar9._0_4_;
        fStack_60dc = auVar9._4_4_;
        fStack_60d8 = auVar9._8_4_;
        fStack_60d4 = auVar9._12_4_;
        fStack_60d0 = auVar6._0_4_;
        fStack_60cc = auVar6._4_4_;
        fStack_60c8 = auVar6._8_4_;
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        local_6260 = auVar9._0_4_;
        fStack_625c = auVar9._4_4_;
        fStack_6258 = auVar9._8_4_;
        fStack_6254 = auVar9._12_4_;
        fStack_6250 = auVar6._0_4_;
        fStack_624c = auVar6._4_4_;
        fStack_6248 = auVar6._8_4_;
        fStack_6244 = auVar6._12_4_;
        local_66a0._4_4_ = fStack_625c + fStack_60dc * (fStack_603c + 1.0);
        local_66a0._0_4_ = local_6260 + local_60e0 * (local_6040 + 1.0);
        fStack_6698 = fStack_6258 + fStack_60d8 * (fStack_6038 + 1.0);
        fStack_6694 = fStack_6254 + fStack_60d4 * (fStack_6034 + 1.0);
        uStack_6690._0_4_ = fStack_6250 + fStack_60d0 * 1.0;
        uStack_6690._4_4_ = fStack_624c + fStack_60cc * 1.0;
        uStack_6688._0_4_ = fStack_6248 + fStack_60c8 * 1.0;
        uStack_6688._4_4_ = fStack_6244 + 1.0;
        auVar4 = _local_66a0;
        auVar8 = vcmpps_avx(_local_66a0,ZEXT1632(ZEXT816(0) << 0x40),2);
        uStack_6688 = auVar4._24_8_;
        auVar46._16_8_ = uStack_6690;
        auVar46._0_16_ = _local_66a0;
        auVar46._24_8_ = uStack_6688;
        auVar45._8_8_ = 0x80000000800000;
        auVar45._0_8_ = 0x80000000800000;
        auVar45._16_8_ = 0x80000000800000;
        auVar45._24_8_ = 0x80000000800000;
        auVar4 = vmaxps_avx(auVar45,auVar46);
        auVar9 = vpsrld_avx(auVar4._0_16_,ZEXT416(0x17));
        auVar6 = vpsrld_avx(auVar4._16_16_,ZEXT416(0x17));
        auVar54._8_8_ = 0x807fffff807fffff;
        auVar54._0_8_ = 0x807fffff807fffff;
        auVar54._16_8_ = 0x807fffff807fffff;
        auVar54._24_8_ = 0x807fffff807fffff;
        auVar4 = vandps_avx(auVar54,auVar4);
        auVar56._8_8_ = 0x3f0000003f000000;
        auVar56._0_8_ = 0x3f0000003f000000;
        auVar56._16_8_ = 0x3f0000003f000000;
        auVar56._24_8_ = 0x3f0000003f000000;
        auVar5 = vorps_avx(auVar56,auVar4);
        auVar60._8_8_ = 0x7f0000007f;
        auVar60._0_8_ = 0x7f0000007f;
        auVar9 = vpsubd_avx(auVar9,auVar60);
        auVar59._8_8_ = 0x7f0000007f;
        auVar59._0_8_ = 0x7f0000007f;
        auVar6 = vpsubd_avx(auVar6,auVar59);
        local_4c60 = auVar6._0_8_;
        uStack_4c58 = auVar6._8_8_;
        auVar58._16_8_ = local_4c60;
        auVar58._0_16_ = auVar9;
        auVar58._24_8_ = uStack_4c58;
        auVar4 = vcvtdq2ps_avx(auVar58);
        local_6280 = auVar4._0_4_;
        fStack_627c = auVar4._4_4_;
        fStack_6278 = auVar4._8_4_;
        fStack_6274 = auVar4._12_4_;
        fStack_6270 = auVar4._16_4_;
        fStack_626c = auVar4._20_4_;
        fStack_6268 = auVar4._24_4_;
        fStack_6264 = auVar4._28_4_;
        local_6720._4_4_ = fStack_627c + 1.0;
        local_6720._0_4_ = local_6280 + 1.0;
        fStack_6718 = fStack_6278 + 1.0;
        fStack_6714 = fStack_6274 + 1.0;
        uStack_6710._0_4_ = fStack_6270 + 1.0;
        uStack_6710._4_4_ = fStack_626c + 1.0;
        uStack_6708._0_4_ = fStack_6268 + 1.0;
        uStack_6708._4_4_ = fStack_6264 + 1.0;
        auVar33 = _local_6720;
        auVar246 = vcmpps_avx(auVar5,_DAT_01c7a1a0,1);
        auVar4 = vandps_avx(auVar246,auVar5);
        auVar38._8_8_ = 0x3f8000003f800000;
        auVar38._0_8_ = 0x3f8000003f800000;
        auVar38._16_8_ = 0x3f8000003f800000;
        auVar38._24_8_ = 0x3f8000003f800000;
        auVar5 = vsubps_avx(auVar5,auVar38);
        uStack_6708 = auVar33._24_8_;
        auVar53._8_8_ = 0x3f8000003f800000;
        auVar53._0_8_ = 0x3f8000003f800000;
        auVar53._16_8_ = 0x3f8000003f800000;
        auVar53._24_8_ = 0x3f8000003f800000;
        auVar246 = vandps_avx(auVar246,auVar53);
        auVar37._16_8_ = uStack_6710;
        auVar37._0_16_ = _local_6720;
        auVar37._24_8_ = uStack_6708;
        auVar246 = vsubps_avx(auVar37,auVar246);
        local_62c0 = auVar5._0_4_;
        fStack_62bc = auVar5._4_4_;
        fStack_62b8 = auVar5._8_4_;
        fStack_62b4 = auVar5._12_4_;
        fStack_62b0 = auVar5._16_4_;
        fStack_62ac = auVar5._20_4_;
        fStack_62a8 = auVar5._24_4_;
        fStack_62a4 = auVar5._28_4_;
        local_62e0 = auVar4._0_4_;
        fStack_62dc = auVar4._4_4_;
        fStack_62d8 = auVar4._8_4_;
        fStack_62d4 = auVar4._12_4_;
        fStack_62d0 = auVar4._16_4_;
        fStack_62cc = auVar4._20_4_;
        fStack_62c8 = auVar4._24_4_;
        fStack_62c4 = auVar4._28_4_;
        local_66a0._0_4_ = local_62e0 + local_62c0;
        local_66a0._4_4_ = fStack_62dc + fStack_62bc;
        fStack_6698 = fStack_62d8 + fStack_62b8;
        fStack_6694 = fStack_62d4 + fStack_62b4;
        uStack_6690._0_4_ = fStack_62d0 + fStack_62b0;
        uStack_6690._4_4_ = fStack_62cc + fStack_62ac;
        uStack_6688._0_4_ = fStack_62c8 + fStack_62a8;
        uStack_6688._4_4_ = fStack_62c4 + fStack_62a4;
        uStack_6798 = 0x3d9021bb3d9021bb;
        local_67a0 = (undefined1  [8])0x3d9021bb3d9021bb;
        uStack_6790 = 0x3d9021bb3d9021bb;
        uStack_6788 = 0x3d9021bb3d9021bb;
        auVar61._8_4_ = -0.1151461;
        auVar61._12_4_ = -0.1151461;
        auVar61._0_4_ = -0.1151461;
        auVar61._4_4_ = -0.1151461;
        auVar61._16_4_ = -0.1151461;
        auVar61._20_4_ = -0.1151461;
        auVar61._24_4_ = -0.1151461;
        auVar61._28_4_ = -0.1151461;
        auVar9 = vfmadd213ps_fma(_local_66a0,_local_67a0,auVar61);
        auVar62._8_4_ = 0.116769984;
        auVar62._12_4_ = 0.116769984;
        auVar62._0_4_ = 0.116769984;
        auVar62._4_4_ = 0.116769984;
        auVar62._16_4_ = 0.116769984;
        auVar62._20_4_ = 0.116769984;
        auVar62._24_4_ = 0.116769984;
        auVar62._28_4_ = 0.116769984;
        auVar9 = vfmadd213ps_fma(_local_66a0,ZEXT1632(auVar9),auVar62);
        auVar63._8_4_ = -0.12420141;
        auVar63._12_4_ = -0.12420141;
        auVar63._0_4_ = -0.12420141;
        auVar63._4_4_ = -0.12420141;
        auVar63._16_4_ = -0.12420141;
        auVar63._20_4_ = -0.12420141;
        auVar63._24_4_ = -0.12420141;
        auVar63._28_4_ = -0.12420141;
        auVar9 = vfmadd213ps_fma(_local_66a0,ZEXT1632(auVar9),auVar63);
        auVar64._8_4_ = 0.14249323;
        auVar64._12_4_ = 0.14249323;
        auVar64._0_4_ = 0.14249323;
        auVar64._4_4_ = 0.14249323;
        auVar64._16_4_ = 0.14249323;
        auVar64._20_4_ = 0.14249323;
        auVar64._24_4_ = 0.14249323;
        auVar64._28_4_ = 0.14249323;
        auVar9 = vfmadd213ps_fma(_local_66a0,ZEXT1632(auVar9),auVar64);
        auVar65._8_4_ = -0.16668057;
        auVar65._12_4_ = -0.16668057;
        auVar65._0_4_ = -0.16668057;
        auVar65._4_4_ = -0.16668057;
        auVar65._16_4_ = -0.16668057;
        auVar65._20_4_ = -0.16668057;
        auVar65._24_4_ = -0.16668057;
        auVar65._28_4_ = -0.16668057;
        auVar9 = vfmadd213ps_fma(_local_66a0,ZEXT1632(auVar9),auVar65);
        auVar66._8_4_ = 0.20000714;
        auVar66._12_4_ = 0.20000714;
        auVar66._0_4_ = 0.20000714;
        auVar66._4_4_ = 0.20000714;
        auVar66._16_4_ = 0.20000714;
        auVar66._20_4_ = 0.20000714;
        auVar66._24_4_ = 0.20000714;
        auVar66._28_4_ = 0.20000714;
        auVar9 = vfmadd213ps_fma(_local_66a0,ZEXT1632(auVar9),auVar66);
        auVar67._8_4_ = -0.24999994;
        auVar67._12_4_ = -0.24999994;
        auVar67._0_4_ = -0.24999994;
        auVar67._4_4_ = -0.24999994;
        auVar67._16_4_ = -0.24999994;
        auVar67._20_4_ = -0.24999994;
        auVar67._24_4_ = -0.24999994;
        auVar67._28_4_ = -0.24999994;
        auVar9 = vfmadd213ps_fma(_local_66a0,ZEXT1632(auVar9),auVar67);
        auVar68._8_4_ = 0.3333333;
        auVar68._12_4_ = 0.3333333;
        auVar68._0_4_ = 0.3333333;
        auVar68._4_4_ = 0.3333333;
        auVar68._16_4_ = 0.3333333;
        auVar68._20_4_ = 0.3333333;
        auVar68._24_4_ = 0.3333333;
        auVar68._28_4_ = 0.3333333;
        auVar9 = vfmadd213ps_fma(_local_66a0,ZEXT1632(auVar9),auVar68);
        local_6620 = auVar9._0_4_;
        fStack_661c = auVar9._4_4_;
        fStack_6618 = auVar9._8_4_;
        fStack_6614 = auVar9._12_4_;
        local_67a0._4_4_ =
             (float)local_66a0._4_4_ * (float)local_66a0._4_4_ *
             (float)local_66a0._4_4_ * fStack_661c;
        local_67a0._0_4_ =
             (float)local_66a0._0_4_ * (float)local_66a0._0_4_ *
             (float)local_66a0._0_4_ * local_6620;
        uStack_6798._0_4_ = fStack_6698 * fStack_6698 * fStack_6698 * fStack_6618;
        uStack_6798._4_4_ = fStack_6694 * fStack_6694 * fStack_6694 * fStack_6614;
        uStack_6790._0_4_ = (float)uStack_6690 * (float)uStack_6690 * (float)uStack_6690 * 0.0;
        uStack_6790._4_4_ = uStack_6690._4_4_ * uStack_6690._4_4_ * uStack_6690._4_4_ * 0.0;
        uStack_6788._0_4_ = (float)uStack_6688 * (float)uStack_6688 * (float)uStack_6688 * 0.0;
        uStack_6788._4_4_ = 0;
        auVar69._8_4_ = -0.00021219444;
        auVar69._12_4_ = -0.00021219444;
        auVar69._0_4_ = -0.00021219444;
        auVar69._4_4_ = -0.00021219444;
        auVar69._16_4_ = -0.00021219444;
        auVar69._20_4_ = -0.00021219444;
        auVar69._24_4_ = -0.00021219444;
        auVar69._28_4_ = -0.00021219444;
        auVar9 = vfmadd213ps_fma(auVar69,auVar246,_local_67a0);
        auVar240._4_4_ = (float)local_66a0._4_4_ * (float)local_66a0._4_4_;
        auVar240._0_4_ = (float)local_66a0._0_4_ * (float)local_66a0._0_4_;
        auVar240._8_4_ = fStack_6698 * fStack_6698;
        auVar240._12_4_ = fStack_6694 * fStack_6694;
        auVar240._16_4_ = (float)uStack_6690 * (float)uStack_6690;
        auVar240._20_4_ = uStack_6690._4_4_ * uStack_6690._4_4_;
        auVar240._24_4_ = (float)uStack_6688 * (float)uStack_6688;
        auVar240._28_4_ = uStack_6688._4_4_;
        auVar108._8_4_ = 0.5;
        auVar108._12_4_ = 0.5;
        auVar108._0_4_ = 0.5;
        auVar108._4_4_ = 0.5;
        auVar108._16_4_ = 0.5;
        auVar108._20_4_ = 0.5;
        auVar108._24_4_ = 0.5;
        auVar108._28_4_ = 0.5;
        auVar9 = vfnmadd213ps_fma(auVar108,auVar240,ZEXT1632(auVar9));
        local_6320 = auVar9._0_4_;
        fStack_631c = auVar9._4_4_;
        fStack_6318 = auVar9._8_4_;
        fStack_6314 = auVar9._12_4_;
        local_66a0._4_4_ = fStack_631c + (float)local_66a0._4_4_;
        local_66a0._0_4_ = local_6320 + (float)local_66a0._0_4_;
        fStack_6698 = fStack_6318 + fStack_6698;
        fStack_6694 = fStack_6314 + fStack_6694;
        uStack_6690._0_4_ = (float)uStack_6690 + 0.0;
        uStack_6690._4_4_ = uStack_6690._4_4_ + 0.0;
        uStack_6688._0_4_ = (float)uStack_6688 + 0.0;
        uStack_6688._4_4_ = uStack_6688._4_4_ + 0.0;
        auVar70._8_4_ = 0.6933594;
        auVar70._12_4_ = 0.6933594;
        auVar70._0_4_ = 0.6933594;
        auVar70._4_4_ = 0.6933594;
        auVar70._16_4_ = 0.6933594;
        auVar70._20_4_ = 0.6933594;
        auVar70._24_4_ = 0.6933594;
        auVar70._28_4_ = 0.6933594;
        auVar9 = vfmadd213ps_fma(auVar70,auVar246,_local_66a0);
        auVar4 = vorps_avx(auVar8,ZEXT1632(auVar9));
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        local_2380 = auVar9._0_8_;
        auVar1 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        uStack_2330 = auVar2._0_8_;
        uStack_2328 = auVar2._8_8_;
        local_6860 = auVar4._0_4_;
        fStack_685c = auVar4._4_4_;
        fStack_6858 = auVar4._8_4_;
        fStack_6854 = auVar4._12_4_;
        fStack_6850 = auVar4._16_4_;
        fStack_684c = auVar4._20_4_;
        fStack_6848 = auVar4._24_4_;
        uStack_6844 = auVar4._28_4_;
        local_6880 = auVar1._0_4_;
        fStack_687c = auVar1._4_4_;
        fStack_6878 = auVar1._8_4_;
        fStack_6874 = auVar1._12_4_;
        fStack_6870 = auVar2._0_4_;
        fStack_686c = auVar2._4_4_;
        fStack_6868 = auVar2._8_4_;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
        local_5b20 = auVar2._0_4_;
        fStack_5b1c = auVar2._4_4_;
        fStack_5b18 = auVar2._8_4_;
        fStack_5b14 = auVar2._12_4_;
        fStack_5b10 = auVar3._0_4_;
        fStack_5b0c = auVar3._4_4_;
        fStack_5b08 = auVar3._8_4_;
        fStack_5b04 = auVar3._12_4_;
        auVar34._4_4_ = fStack_687c * fStack_685c;
        auVar34._0_4_ = local_6880 * local_6860;
        auVar34._12_4_ = fStack_6874 * fStack_6854;
        auVar34._8_4_ = fStack_6878 * fStack_6858;
        auVar34._20_4_ = fStack_686c * fStack_684c;
        auVar34._16_4_ = fStack_6870 * fStack_6850;
        auVar34._28_4_ = uStack_6844;
        auVar34._24_4_ = fStack_6868 * fStack_6848;
        auVar4 = vsubps_avx(ZEXT832(0),auVar34);
        auVar118._8_8_ = 0x42b0c0a542b0c0a5;
        auVar118._0_8_ = 0x42b0c0a542b0c0a5;
        auVar118._16_8_ = 0x42b0c0a542b0c0a5;
        auVar118._24_8_ = 0x42b0c0a542b0c0a5;
        auVar4 = vminps_avx(auVar4,auVar118);
        auVar39._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar39._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar39._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar39._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar246 = vmaxps_avx(auVar4,auVar39);
        auVar102._8_4_ = 1.442695;
        auVar102._12_4_ = 1.442695;
        auVar102._0_4_ = 1.442695;
        auVar102._4_4_ = 1.442695;
        auVar102._16_4_ = 1.442695;
        auVar102._20_4_ = 1.442695;
        auVar102._24_4_ = 1.442695;
        auVar102._28_4_ = 1.442695;
        auVar101._8_4_ = 0.5;
        auVar101._12_4_ = 0.5;
        auVar101._0_4_ = 0.5;
        auVar101._4_4_ = 0.5;
        auVar101._16_4_ = 0.5;
        auVar101._20_4_ = 0.5;
        auVar101._24_4_ = 0.5;
        auVar101._28_4_ = 0.5;
        auVar3 = vfmadd213ps_fma(auVar102,auVar246,auVar101);
        auVar8 = vroundps_avx(ZEXT1632(auVar3),1);
        auVar4 = vcmpps_avx(ZEXT1632(auVar3),auVar8,1);
        auVar47._8_8_ = 0x3f8000003f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._16_8_ = 0x3f8000003f800000;
        auVar47._24_8_ = 0x3f8000003f800000;
        auVar4 = vandps_avx(auVar4,auVar47);
        auVar4 = vsubps_avx(auVar8,auVar4);
        auVar116._8_4_ = 0.6933594;
        auVar116._12_4_ = 0.6933594;
        auVar116._0_4_ = 0.6933594;
        auVar116._4_4_ = 0.6933594;
        auVar116._16_4_ = 0.6933594;
        auVar116._20_4_ = 0.6933594;
        auVar116._24_4_ = 0.6933594;
        auVar116._28_4_ = 0.6933594;
        auVar3 = vfnmadd213ps_fma(auVar116,auVar4,auVar246);
        auVar117._8_4_ = -0.00021219444;
        auVar117._12_4_ = -0.00021219444;
        auVar117._0_4_ = -0.00021219444;
        auVar117._4_4_ = -0.00021219444;
        auVar117._16_4_ = -0.00021219444;
        auVar117._20_4_ = -0.00021219444;
        auVar117._24_4_ = -0.00021219444;
        auVar117._28_4_ = -0.00021219444;
        auVar3 = vfnmadd213ps_fma(auVar117,auVar4,ZEXT1632(auVar3));
        auVar246 = ZEXT1632(auVar3);
        local_5940 = auVar3._0_4_;
        fStack_593c = auVar3._4_4_;
        fStack_5938 = auVar3._8_4_;
        fStack_5934 = auVar3._12_4_;
        _local_59e0 = ZEXT1632(CONCAT412(fStack_5934 * fStack_5934,
                                         CONCAT48(fStack_5938 * fStack_5938,
                                                  CONCAT44(fStack_593c * fStack_593c,
                                                           local_5940 * local_5940))));
        local_5a80._8_8_ = 0x3950696739506967;
        local_5a80._0_8_ = 0x3950696739506967;
        local_5a80._16_8_ = 0x3950696739506967;
        local_5a80._24_8_ = 0x3950696739506967;
        auVar103._8_4_ = 0.0013981999;
        auVar103._12_4_ = 0.0013981999;
        auVar103._0_4_ = 0.0013981999;
        auVar103._4_4_ = 0.0013981999;
        auVar103._16_4_ = 0.0013981999;
        auVar103._20_4_ = 0.0013981999;
        auVar103._24_4_ = 0.0013981999;
        auVar103._28_4_ = 0.0013981999;
        auVar3 = vfmadd213ps_fma(auVar246,local_5a80,auVar103);
        auVar104._8_4_ = 0.008333452;
        auVar104._12_4_ = 0.008333452;
        auVar104._0_4_ = 0.008333452;
        auVar104._4_4_ = 0.008333452;
        auVar104._16_4_ = 0.008333452;
        auVar104._20_4_ = 0.008333452;
        auVar104._24_4_ = 0.008333452;
        auVar104._28_4_ = 0.008333452;
        auVar3 = vfmadd213ps_fma(auVar246,ZEXT1632(auVar3),auVar104);
        auVar105._8_4_ = 0.041665796;
        auVar105._12_4_ = 0.041665796;
        auVar105._0_4_ = 0.041665796;
        auVar105._4_4_ = 0.041665796;
        auVar105._16_4_ = 0.041665796;
        auVar105._20_4_ = 0.041665796;
        auVar105._24_4_ = 0.041665796;
        auVar105._28_4_ = 0.041665796;
        auVar3 = vfmadd213ps_fma(auVar246,ZEXT1632(auVar3),auVar105);
        auVar106._8_4_ = 0.16666666;
        auVar106._12_4_ = 0.16666666;
        auVar106._0_4_ = 0.16666666;
        auVar106._4_4_ = 0.16666666;
        auVar106._16_4_ = 0.16666666;
        auVar106._20_4_ = 0.16666666;
        auVar106._24_4_ = 0.16666666;
        auVar106._28_4_ = 0.16666666;
        auVar3 = vfmadd213ps_fma(auVar246,ZEXT1632(auVar3),auVar106);
        auVar107._8_4_ = 0.5;
        auVar107._12_4_ = 0.5;
        auVar107._0_4_ = 0.5;
        auVar107._4_4_ = 0.5;
        auVar107._16_4_ = 0.5;
        auVar107._20_4_ = 0.5;
        auVar107._24_4_ = 0.5;
        auVar107._28_4_ = 0.5;
        auVar3 = vfmadd213ps_fma(auVar246,ZEXT1632(auVar3),auVar107);
        auVar3 = vfmadd213ps_fma(_local_59e0,ZEXT1632(auVar3),auVar246);
        local_5900 = auVar3._0_4_;
        fStack_58fc = auVar3._4_4_;
        fStack_58f8 = auVar3._8_4_;
        fStack_58f4 = auVar3._12_4_;
        local_2e80 = auVar4._0_4_;
        fStack_2e7c = auVar4._4_4_;
        fStack_2e78 = auVar4._8_4_;
        fStack_2e74 = auVar4._12_4_;
        fStack_2e70 = auVar4._16_4_;
        fStack_2e6c = auVar4._20_4_;
        fStack_2e68 = auVar4._24_4_;
        fStack_2e64 = auVar4._28_4_;
        local_5a20 = CONCAT44((int)fStack_2e7c,(int)local_2e80);
        uStack_5a18 = CONCAT44((int)fStack_2e74,(int)fStack_2e78);
        uStack_5a10 = CONCAT44((int)fStack_2e6c,(int)fStack_2e70);
        uStack_5a08 = CONCAT44((int)fStack_2e64,(int)fStack_2e68);
        auVar133._8_8_ = uStack_5a18;
        auVar133._0_8_ = local_5a20;
        auVar132._8_8_ = 0x7f0000007f;
        auVar132._0_8_ = 0x7f0000007f;
        auVar3 = vpaddd_avx(auVar133,auVar132);
        auVar131._8_8_ = uStack_5a08;
        auVar131._0_8_ = uStack_5a10;
        auVar130._8_8_ = 0x7f0000007f;
        auVar130._0_8_ = 0x7f0000007f;
        auVar7 = vpaddd_avx(auVar131,auVar130);
        auVar3 = vpslld_avx(auVar3,ZEXT416(0x17));
        auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
        local_59a0 = auVar3._0_4_;
        fStack_599c = auVar3._4_4_;
        fStack_5998 = auVar3._8_4_;
        fStack_5994 = auVar3._12_4_;
        fStack_5990 = auVar7._0_4_;
        fStack_598c = auVar7._4_4_;
        fStack_5988 = auVar7._8_4_;
        auVar32._16_4_ = fStack_5b10;
        auVar32._0_16_ = auVar2;
        auVar32._20_4_ = fStack_5b0c;
        auVar32._24_4_ = fStack_5b08;
        auVar32._28_4_ = fStack_5b04;
        auVar31._4_4_ = fStack_5b1c + (fStack_58fc + 1.0) * fStack_599c;
        auVar31._0_4_ = local_5b20 + (local_5900 + 1.0) * local_59a0;
        auVar31._8_4_ = fStack_5b18 + (fStack_58f8 + 1.0) * fStack_5998;
        auVar31._12_4_ = fStack_5b14 + (fStack_58f4 + 1.0) * fStack_5994;
        auVar31._16_4_ = fStack_5b10 + fStack_5990 * 1.0;
        auVar31._20_4_ = fStack_5b0c + fStack_598c * 1.0;
        auVar31._24_4_ = fStack_5b08 + fStack_5988 * 1.0;
        auVar31._28_4_ = fStack_5b04 + 1.0;
        auVar4 = vrcpps_avx(auVar31);
        auVar10._4_4_ = fStack_5b1c * auVar4._4_4_;
        auVar10._0_4_ = local_5b20 * auVar4._0_4_;
        auVar10._8_4_ = fStack_5b18 * auVar4._8_4_;
        auVar10._12_4_ = fStack_5b14 * auVar4._12_4_;
        auVar10._16_4_ = fStack_5b10 * auVar4._16_4_;
        auVar10._20_4_ = fStack_5b0c * auVar4._20_4_;
        auVar10._24_4_ = fStack_5b08 * auVar4._24_4_;
        auVar10._28_4_ = fStack_5b04;
        auVar2 = vfmsub213ps_fma(auVar10,auVar31,auVar32);
        auVar2 = vfnmadd213ps_fma(ZEXT1632(auVar2),auVar4,auVar10);
        auVar30._16_8_ = uStack_2330;
        auVar30._0_16_ = auVar1;
        auVar30._24_8_ = uStack_2328;
        uStack_5dd8 = auVar9._8_4_;
        uStack_5dd4 = auVar9._12_4_;
        uStack_5dd0 = auVar6._0_4_;
        uStack_5dcc = auVar6._4_4_;
        uStack_5dc8 = auVar6._8_4_;
        uStack_5dc4 = auVar6._12_4_;
        auVar252._0_8_ = local_2380 ^ 0x8000000080000000;
        auVar252._8_4_ = uStack_5dd8 ^ 0x80000000;
        auVar252._12_4_ = uStack_5dd4 ^ 0x80000000;
        auVar252._16_4_ = uStack_5dd0 ^ 0x80000000;
        auVar252._20_4_ = uStack_5dcc ^ 0x80000000;
        auVar252._24_4_ = uStack_5dc8 ^ 0x80000000;
        auVar252._28_4_ = uStack_5dc4 ^ 0x80000000;
        auVar9 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar2),auVar252);
        local_6940 = (float)*(undefined8 *)*local_6d40;
        fStack_693c = (float)((ulong)*(undefined8 *)*local_6d40 >> 0x20);
        fStack_6938 = (float)*(undefined8 *)(*local_6d40 + 8);
        fStack_6934 = (float)((ulong)*(undefined8 *)(*local_6d40 + 8) >> 0x20);
        fStack_6930 = (float)*(undefined8 *)(*local_6d40 + 0x10);
        fStack_692c = (float)((ulong)*(undefined8 *)(*local_6d40 + 0x10) >> 0x20);
        fStack_6928 = (float)*(undefined8 *)(*local_6d40 + 0x18);
        uStack_6924 = (undefined4)((ulong)*(undefined8 *)(*local_6d40 + 0x18) >> 0x20);
        local_6960 = auVar9._0_4_;
        fStack_695c = auVar9._4_4_;
        fStack_6958 = auVar9._8_4_;
        fStack_6954 = auVar9._12_4_;
        local_6dc0 = CONCAT44(fStack_693c * fStack_695c,local_6940 * local_6960);
        uStack_6db8 = CONCAT44(fStack_6934 * fStack_6954,fStack_6938 * fStack_6958);
        uStack_6db0 = CONCAT44(fStack_692c * 0.0,fStack_6930 * 0.0);
        uStack_6da8 = CONCAT44(uStack_6924,fStack_6928 * 0.0);
        auVar27._8_8_ = uStack_6db8;
        auVar27._0_8_ = local_6dc0;
        auVar27._16_8_ = uStack_6db0;
        auVar27._24_8_ = uStack_6da8;
        *local_6d40 = auVar27;
        local_6d40 = local_6d40 + 1;
      }
    }
  }
  else if (local_6d30 == 4) {
    for (local_6dc4 = 0; local_6dc4 < local_6d28; local_6dc4 = local_6dc4 + 1) {
      local_6dd0 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_6dc4 * in_RSI[2]);
      for (local_6e1c = 0; local_6e1c < local_6d2c; local_6e1c = local_6e1c + 1) {
        auVar234._8_8_ = 0x42b0c0a542b0c0a5;
        auVar234._0_8_ = 0x42b0c0a542b0c0a5;
        auVar9 = vminps_avx(*local_6dd0,auVar234);
        auVar160._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar160._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar9,auVar160);
        local_1cf0 = auVar1._0_4_;
        fStack_1cec = auVar1._4_4_;
        fStack_1ce8 = auVar1._8_4_;
        fStack_1ce4 = auVar1._12_4_;
        fVar245 = local_1cf0 * 1.442695 + 0.5;
        fVar248 = fStack_1cec * 1.442695 + 0.5;
        fVar249 = fStack_1ce8 * 1.442695 + 0.5;
        fVar250 = fStack_1ce4 * 1.442695 + 0.5;
        local_1db0 = CONCAT44(fVar248,fVar245);
        uStack_1da8._0_4_ = fVar249;
        uStack_1da8._4_4_ = fVar250;
        local_1dc0 = CONCAT44((int)fVar248,(int)fVar245);
        uStack_1db8._0_4_ = (int)fVar249;
        uStack_1db8._4_4_ = (int)fVar250;
        auVar178._8_8_ = uStack_1db8;
        auVar178._0_8_ = local_1dc0;
        auVar6 = vcvtdq2ps_avx(auVar178);
        auVar238._8_8_ = uStack_1da8;
        auVar238._0_8_ = local_1db0;
        auVar9 = vcmpps_avx(auVar238,auVar6,1);
        auVar168._8_8_ = 0x3f8000003f800000;
        auVar168._0_8_ = 0x3f8000003f800000;
        auVar9 = vpand_avx(auVar9,auVar168);
        auVar9 = vsubps_avx(auVar6,auVar9);
        auVar223._8_4_ = 0.6933594;
        auVar223._12_4_ = 0.6933594;
        auVar223._0_4_ = 0.6933594;
        auVar223._4_4_ = 0.6933594;
        auVar6 = vfnmadd213ps_fma(auVar223,auVar9,auVar1);
        auVar224._8_4_ = -0.00021219444;
        auVar224._12_4_ = -0.00021219444;
        auVar224._0_4_ = -0.00021219444;
        auVar224._4_4_ = -0.00021219444;
        auVar1 = vfnmadd213ps_fma(auVar224,auVar9,auVar6);
        local_1d10 = auVar1._0_4_;
        fStack_1d0c = auVar1._4_4_;
        fStack_1d08 = auVar1._8_4_;
        fStack_1d04 = auVar1._12_4_;
        local_1da0._4_4_ = fStack_1d0c * fStack_1d0c;
        local_1da0._0_4_ = local_1d10 * local_1d10;
        fStack_1d98 = fStack_1d08 * fStack_1d08;
        fStack_1d94 = fStack_1d04 * fStack_1d04;
        local_1df0._8_8_ = 0x3950696739506967;
        local_1df0._0_8_ = 0x3950696739506967;
        auVar201._8_4_ = 0.0013981999;
        auVar201._12_4_ = 0.0013981999;
        auVar201._0_4_ = 0.0013981999;
        auVar201._4_4_ = 0.0013981999;
        auVar6 = vfmadd213ps_fma(auVar1,local_1df0,auVar201);
        auVar202._8_4_ = 0.008333452;
        auVar202._12_4_ = 0.008333452;
        auVar202._0_4_ = 0.008333452;
        auVar202._4_4_ = 0.008333452;
        auVar6 = vfmadd213ps_fma(auVar1,auVar6,auVar202);
        auVar203._8_4_ = 0.041665796;
        auVar203._12_4_ = 0.041665796;
        auVar203._0_4_ = 0.041665796;
        auVar203._4_4_ = 0.041665796;
        auVar6 = vfmadd213ps_fma(auVar1,auVar6,auVar203);
        auVar204._8_4_ = 0.16666666;
        auVar204._12_4_ = 0.16666666;
        auVar204._0_4_ = 0.16666666;
        auVar204._4_4_ = 0.16666666;
        auVar6 = vfmadd213ps_fma(auVar1,auVar6,auVar204);
        auVar205._8_4_ = 0.5;
        auVar205._12_4_ = 0.5;
        auVar205._0_4_ = 0.5;
        auVar205._4_4_ = 0.5;
        auVar6 = vfmadd213ps_fma(auVar1,auVar6,auVar205);
        auVar6 = vfmadd213ps_fma(_local_1da0,auVar6,auVar1);
        local_1cd0 = auVar6._0_4_;
        fStack_1ccc = auVar6._4_4_;
        fStack_1cc8 = auVar6._8_4_;
        fStack_1cc4 = auVar6._12_4_;
        local_130 = auVar9._0_4_;
        fStack_12c = auVar9._4_4_;
        fStack_128 = auVar9._8_4_;
        fStack_124 = auVar9._12_4_;
        local_1dc0 = CONCAT44((int)fStack_12c,(int)local_130);
        uStack_1db8._0_4_ = (int)fStack_128;
        uStack_1db8._4_4_ = (int)fStack_124;
        auVar137._8_8_ = uStack_1db8;
        auVar137._0_8_ = local_1dc0;
        auVar136._8_8_ = 0x7f0000007f;
        auVar136._0_8_ = 0x7f0000007f;
        auVar9 = vpaddd_avx(auVar137,auVar136);
        auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
        local_1d40 = auVar9._0_4_;
        fStack_1d3c = auVar9._4_4_;
        fStack_1d38 = auVar9._8_4_;
        fStack_1d34 = auVar9._12_4_;
        local_20e0._4_4_ = (fStack_1ccc + 1.0) * fStack_1d3c + 1.0;
        local_20e0._0_4_ = (local_1cd0 + 1.0) * local_1d40 + 1.0;
        uStack_20d8._0_4_ = (fStack_1cc8 + 1.0) * fStack_1d38 + 1.0;
        uStack_20d8._4_4_ = (fStack_1cc4 + 1.0) * fStack_1d34 + 1.0;
        auVar156._8_8_ = uStack_20d8;
        auVar156._0_8_ = local_20e0;
        auVar9 = vcmpps_avx(auVar156,ZEXT816(0),2);
        auVar164._8_8_ = uStack_20d8;
        auVar164._0_8_ = local_20e0;
        auVar163._8_8_ = 0x80000000800000;
        auVar163._0_8_ = 0x80000000800000;
        auVar6 = vmaxps_avx(auVar164,auVar163);
        auVar1 = vpsrld_avx(auVar6,ZEXT416(0x17));
        auVar172._8_8_ = 0x807fffff807fffff;
        auVar172._0_8_ = 0x807fffff807fffff;
        auVar6 = vpand_avx(auVar6,auVar172);
        auVar174._8_8_ = 0x3f0000003f000000;
        auVar174._0_8_ = 0x3f0000003f000000;
        auVar2 = vpor_avx(auVar6,auVar174);
        auVar134._8_8_ = 0x7f0000007f;
        auVar134._0_8_ = 0x7f0000007f;
        auVar6 = vpsubd_avx(auVar1,auVar134);
        auVar6 = vcvtdq2ps_avx(auVar6);
        local_1e50 = auVar6._0_4_;
        fStack_1e4c = auVar6._4_4_;
        fStack_1e48 = auVar6._8_4_;
        fStack_1e44 = auVar6._12_4_;
        local_2120 = CONCAT44(fStack_1e4c + 1.0,local_1e50 + 1.0);
        uStack_2118._0_4_ = fStack_1e48 + 1.0;
        uStack_2118._4_4_ = fStack_1e44 + 1.0;
        auVar180._8_8_ = 0x3f3504f33f3504f3;
        auVar180._0_8_ = 0x3f3504f33f3504f3;
        auVar6 = vcmpps_avx(auVar2,auVar180,1);
        auVar1 = vpand_avx(auVar2,auVar6);
        auVar143._8_8_ = 0x3f8000003f800000;
        auVar143._0_8_ = 0x3f8000003f800000;
        auVar2 = vsubps_avx(auVar2,auVar143);
        auVar171._8_8_ = 0x3f8000003f800000;
        auVar171._0_8_ = 0x3f8000003f800000;
        auVar6 = vpand_avx(auVar6,auVar171);
        auVar142._8_8_ = uStack_2118;
        auVar142._0_8_ = local_2120;
        auVar6 = vsubps_avx(auVar142,auVar6);
        local_1e70 = auVar2._0_4_;
        fStack_1e6c = auVar2._4_4_;
        fStack_1e68 = auVar2._8_4_;
        fStack_1e64 = auVar2._12_4_;
        local_1e80 = auVar1._0_4_;
        fStack_1e7c = auVar1._4_4_;
        fStack_1e78 = auVar1._8_4_;
        fStack_1e74 = auVar1._12_4_;
        local_20e0._0_4_ = local_1e70 + local_1e80;
        local_20e0._4_4_ = fStack_1e6c + fStack_1e7c;
        uStack_20d8._0_4_ = fStack_1e68 + fStack_1e78;
        uStack_20d8._4_4_ = fStack_1e64 + fStack_1e74;
        uStack_2158 = 0x3d9021bb3d9021bb;
        local_2160 = (undefined1  [8])0x3d9021bb3d9021bb;
        auVar181._8_4_ = -0.1151461;
        auVar181._12_4_ = -0.1151461;
        auVar181._0_4_ = -0.1151461;
        auVar181._4_4_ = -0.1151461;
        auVar1 = vfmadd213ps_fma(_local_20e0,_local_2160,auVar181);
        auVar182._8_4_ = 0.116769984;
        auVar182._12_4_ = 0.116769984;
        auVar182._0_4_ = 0.116769984;
        auVar182._4_4_ = 0.116769984;
        auVar1 = vfmadd213ps_fma(_local_20e0,auVar1,auVar182);
        auVar183._8_4_ = -0.12420141;
        auVar183._12_4_ = -0.12420141;
        auVar183._0_4_ = -0.12420141;
        auVar183._4_4_ = -0.12420141;
        auVar1 = vfmadd213ps_fma(_local_20e0,auVar1,auVar183);
        auVar184._8_4_ = 0.14249323;
        auVar184._12_4_ = 0.14249323;
        auVar184._0_4_ = 0.14249323;
        auVar184._4_4_ = 0.14249323;
        auVar1 = vfmadd213ps_fma(_local_20e0,auVar1,auVar184);
        auVar185._8_4_ = -0.16668057;
        auVar185._12_4_ = -0.16668057;
        auVar185._0_4_ = -0.16668057;
        auVar185._4_4_ = -0.16668057;
        auVar1 = vfmadd213ps_fma(_local_20e0,auVar1,auVar185);
        auVar186._8_4_ = 0.20000714;
        auVar186._12_4_ = 0.20000714;
        auVar186._0_4_ = 0.20000714;
        auVar186._4_4_ = 0.20000714;
        auVar1 = vfmadd213ps_fma(_local_20e0,auVar1,auVar186);
        auVar187._8_4_ = -0.24999994;
        auVar187._12_4_ = -0.24999994;
        auVar187._0_4_ = -0.24999994;
        auVar187._4_4_ = -0.24999994;
        auVar1 = vfmadd213ps_fma(_local_20e0,auVar1,auVar187);
        auVar188._8_4_ = 0.3333333;
        auVar188._12_4_ = 0.3333333;
        auVar188._0_4_ = 0.3333333;
        auVar188._4_4_ = 0.3333333;
        auVar1 = vfmadd213ps_fma(_local_20e0,auVar1,auVar188);
        local_2060 = auVar1._0_4_;
        fStack_205c = auVar1._4_4_;
        fStack_2058 = auVar1._8_4_;
        fStack_2054 = auVar1._12_4_;
        local_2160._4_4_ =
             fStack_205c * (float)local_20e0._4_4_ *
             (float)local_20e0._4_4_ * (float)local_20e0._4_4_;
        local_2160._0_4_ =
             local_2060 * (float)local_20e0._0_4_ *
             (float)local_20e0._0_4_ * (float)local_20e0._0_4_;
        uStack_2158._0_4_ =
             fStack_2058 * (float)uStack_20d8 * (float)uStack_20d8 * (float)uStack_20d8;
        uStack_2158._4_4_ = fStack_2054 * uStack_20d8._4_4_ * uStack_20d8._4_4_ * uStack_20d8._4_4_;
        auVar189._8_4_ = -0.00021219444;
        auVar189._12_4_ = -0.00021219444;
        auVar189._0_4_ = -0.00021219444;
        auVar189._4_4_ = -0.00021219444;
        auVar1 = vfmadd213ps_fma(auVar189,auVar6,_local_2160);
        auVar242._4_4_ = (float)local_20e0._4_4_ * (float)local_20e0._4_4_;
        auVar242._0_4_ = (float)local_20e0._0_4_ * (float)local_20e0._0_4_;
        auVar242._8_4_ = (float)uStack_20d8 * (float)uStack_20d8;
        auVar242._12_4_ = uStack_20d8._4_4_ * uStack_20d8._4_4_;
        auVar221._8_4_ = 0.5;
        auVar221._12_4_ = 0.5;
        auVar221._0_4_ = 0.5;
        auVar221._4_4_ = 0.5;
        auVar1 = vfnmadd213ps_fma(auVar221,auVar242,auVar1);
        local_1ea0 = auVar1._0_4_;
        fStack_1e9c = auVar1._4_4_;
        fStack_1e98 = auVar1._8_4_;
        fStack_1e94 = auVar1._12_4_;
        local_20e0._4_4_ = (float)local_20e0._4_4_ + fStack_1e9c;
        local_20e0._0_4_ = (float)local_20e0._0_4_ + local_1ea0;
        uStack_20d8._0_4_ = (float)uStack_20d8 + fStack_1e98;
        uStack_20d8._4_4_ = uStack_20d8._4_4_ + fStack_1e94;
        auVar190._8_4_ = 0.6933594;
        auVar190._12_4_ = 0.6933594;
        auVar190._0_4_ = 0.6933594;
        auVar190._4_4_ = 0.6933594;
        auVar6 = vfmadd213ps_fma(auVar190,auVar6,_local_20e0);
        auVar9 = vpor_avx(auVar6,auVar9);
        local_21e0 = auVar9._0_4_;
        fStack_21dc = auVar9._4_4_;
        fStack_21d8 = auVar9._8_4_;
        fStack_21d4 = auVar9._12_4_;
        auVar149._8_8_ = 0x3f8000003f800000;
        auVar149._0_8_ = 0x3f8000003f800000;
        auVar152._4_4_ = fStack_21dc * 2.0;
        auVar152._0_4_ = local_21e0 * 2.0;
        auVar152._12_4_ = fStack_21d4 * 2.0;
        auVar152._8_4_ = fStack_21d8 * 2.0;
        auVar9 = vsubps_avx(ZEXT816(0),auVar152);
        auVar231._8_8_ = 0x42b0c0a542b0c0a5;
        auVar231._0_8_ = 0x42b0c0a542b0c0a5;
        auVar9 = vminps_avx(auVar9,auVar231);
        auVar157._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar157._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar157,auVar9);
        local_1630 = auVar1._0_4_;
        fStack_162c = auVar1._4_4_;
        fStack_1628 = auVar1._8_4_;
        fStack_1624 = auVar1._12_4_;
        fVar245 = local_1630 * 1.442695 + 0.5;
        fVar248 = fStack_162c * 1.442695 + 0.5;
        fVar249 = fStack_1628 * 1.442695 + 0.5;
        fVar250 = fStack_1624 * 1.442695 + 0.5;
        local_16f0 = CONCAT44(fVar248,fVar245);
        uStack_16e8._0_4_ = fVar249;
        uStack_16e8._4_4_ = fVar250;
        local_1700 = CONCAT44((int)fVar248,(int)fVar245);
        uStack_16f8._0_4_ = (int)fVar249;
        uStack_16f8._4_4_ = (int)fVar250;
        auVar175._8_8_ = uStack_16f8;
        auVar175._0_8_ = local_1700;
        auVar6 = vcvtdq2ps_avx(auVar175);
        auVar235._8_8_ = uStack_16e8;
        auVar235._0_8_ = local_16f0;
        auVar9 = vcmpps_avx(auVar235,auVar6,1);
        auVar165._8_8_ = 0x3f8000003f800000;
        auVar165._0_8_ = 0x3f8000003f800000;
        auVar9 = vpand_avx(auVar9,auVar165);
        auVar9 = vsubps_avx(auVar6,auVar9);
        auVar229._8_4_ = 0.6933594;
        auVar229._12_4_ = 0.6933594;
        auVar229._0_4_ = 0.6933594;
        auVar229._4_4_ = 0.6933594;
        auVar6 = vfnmadd213ps_fma(auVar229,auVar9,auVar1);
        auVar230._8_4_ = -0.00021219444;
        auVar230._12_4_ = -0.00021219444;
        auVar230._0_4_ = -0.00021219444;
        auVar230._4_4_ = -0.00021219444;
        auVar1 = vfnmadd213ps_fma(auVar230,auVar9,auVar6);
        local_1650 = auVar1._0_4_;
        fStack_164c = auVar1._4_4_;
        fStack_1648 = auVar1._8_4_;
        fStack_1644 = auVar1._12_4_;
        local_16e0._4_4_ = fStack_164c * fStack_164c;
        local_16e0._0_4_ = local_1650 * local_1650;
        fStack_16d8 = fStack_1648 * fStack_1648;
        fStack_16d4 = fStack_1644 * fStack_1644;
        local_1730._8_8_ = 0x3950696739506967;
        local_1730._0_8_ = 0x3950696739506967;
        auVar216._8_4_ = 0.0013981999;
        auVar216._12_4_ = 0.0013981999;
        auVar216._0_4_ = 0.0013981999;
        auVar216._4_4_ = 0.0013981999;
        auVar6 = vfmadd213ps_fma(auVar1,local_1730,auVar216);
        auVar217._8_4_ = 0.008333452;
        auVar217._12_4_ = 0.008333452;
        auVar217._0_4_ = 0.008333452;
        auVar217._4_4_ = 0.008333452;
        auVar6 = vfmadd213ps_fma(auVar1,auVar6,auVar217);
        auVar218._8_4_ = 0.041665796;
        auVar218._12_4_ = 0.041665796;
        auVar218._0_4_ = 0.041665796;
        auVar218._4_4_ = 0.041665796;
        auVar6 = vfmadd213ps_fma(auVar1,auVar6,auVar218);
        auVar219._8_4_ = 0.16666666;
        auVar219._12_4_ = 0.16666666;
        auVar219._0_4_ = 0.16666666;
        auVar219._4_4_ = 0.16666666;
        auVar6 = vfmadd213ps_fma(auVar1,auVar6,auVar219);
        auVar220._8_4_ = 0.5;
        auVar220._12_4_ = 0.5;
        auVar220._0_4_ = 0.5;
        auVar220._4_4_ = 0.5;
        auVar6 = vfmadd213ps_fma(auVar1,auVar6,auVar220);
        auVar6 = vfmadd213ps_fma(_local_16e0,auVar6,auVar1);
        local_1610 = auVar6._0_4_;
        fStack_160c = auVar6._4_4_;
        fStack_1608 = auVar6._8_4_;
        fStack_1604 = auVar6._12_4_;
        local_190 = auVar9._0_4_;
        fStack_18c = auVar9._4_4_;
        fStack_188 = auVar9._8_4_;
        fStack_184 = auVar9._12_4_;
        local_1700 = CONCAT44((int)fStack_18c,(int)local_190);
        uStack_16f8._0_4_ = (int)fStack_188;
        uStack_16f8._4_4_ = (int)fStack_184;
        auVar151._8_8_ = uStack_16f8;
        auVar151._0_8_ = local_1700;
        auVar150._8_8_ = 0x7f0000007f;
        auVar150._0_8_ = 0x7f0000007f;
        auVar9 = vpaddd_avx(auVar151,auVar150);
        auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
        local_1680 = auVar9._0_4_;
        fStack_167c = auVar9._4_4_;
        fStack_1678 = auVar9._8_4_;
        fStack_1674 = auVar9._12_4_;
        auVar153._4_4_ = (fStack_160c + 1.0) * fStack_167c + 1.0;
        auVar153._0_4_ = (local_1610 + 1.0) * local_1680 + 1.0;
        auVar153._8_4_ = (fStack_1608 + 1.0) * fStack_1678 + 1.0;
        auVar153._12_4_ = (fStack_1604 + 1.0) * fStack_1674 + 1.0;
        auVar9 = vdivps_avx(auVar149,auVar153);
        local_2200 = auVar9._0_4_;
        fStack_21fc = auVar9._4_4_;
        fStack_21f8 = auVar9._8_4_;
        fStack_21f4 = auVar9._12_4_;
        auVar251._0_4_ = local_2200 * 2.0;
        auVar251._4_4_ = fStack_21fc * 2.0;
        auVar251._8_4_ = fStack_21f8 * 2.0;
        auVar251._12_4_ = fStack_21f4 * 2.0;
        auVar145._8_8_ = 0x3f8000003f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        auVar9 = vsubps_avx(auVar251,auVar145);
        local_2270 = (float)*(undefined8 *)*local_6dd0;
        fStack_226c = (float)((ulong)*(undefined8 *)*local_6dd0 >> 0x20);
        fStack_2268 = (float)*(undefined8 *)(*local_6dd0 + 8);
        fStack_2264 = (float)((ulong)*(undefined8 *)(*local_6dd0 + 8) >> 0x20);
        local_2280 = auVar9._0_4_;
        fStack_227c = auVar9._4_4_;
        fStack_2278 = auVar9._8_4_;
        fStack_2274 = auVar9._12_4_;
        local_6e30 = CONCAT44(fStack_226c * fStack_227c,local_2270 * local_2280);
        uStack_6e28 = CONCAT44(fStack_2264 * fStack_2274,fStack_2268 * fStack_2278);
        auVar29._8_8_ = uStack_6e28;
        auVar29._0_8_ = local_6e30;
        *local_6dd0 = auVar29;
        local_6dd0 = local_6dd0 + 1;
      }
    }
  }
  else {
    local_6d10 = in_RSI;
    for (local_6e34 = 0; local_6e34 < local_6d28; local_6e34 = local_6e34 + 1) {
      local_6ce8 = &local_6e88;
      local_6a74 = *(int *)((long)local_6d10 + 0x2c);
      local_6a78 = (int)local_6d10[6];
      local_6a7c = *(undefined4 *)((long)local_6d10 + 0x34);
      local_6a88 = (undefined1 (*) [32])
                   (*local_6d10 + local_6d10[8] * (long)local_6e34 * local_6d10[2]);
      local_6a90 = local_6d10[2];
      local_6a94 = (undefined4)local_6d10[3];
      local_6aa0 = local_6d10[4];
      local_6a70 = &local_6e88;
      local_6a60 = (long)local_6a74 * (long)local_6a78 * local_6a90;
      local_6cb0 = &local_6e88;
      local_6c60 = &local_6e88;
      local_6a64 = 0x10;
      local_6cf4 = local_6e34;
      local_6cf5 = 1;
      local_6e88 = 0;
      local_6e78 = 0;
      local_6e70 = 0;
      local_6e60 = 0;
      local_6e5c = 0;
      local_6e58 = 0;
      local_6e54 = 0;
      local_6e50 = 0;
      local_6e48 = 0;
      local_6e80 = 0;
      local_6e40 = local_6a88;
      for (local_6e8c = 0; local_6e8c + 7 < local_6d2c; local_6e8c = local_6e8c + 8) {
        local_6c50 = local_6e40;
        local_6c40 = *(undefined8 *)*local_6e40;
        uStack_6c38 = *(undefined8 *)(*local_6e40 + 8);
        uStack_6c30 = *(undefined8 *)(*local_6e40 + 0x10);
        auVar239 = *(undefined1 (*) [24])*local_6e40;
        uStack_6c28 = *(undefined8 *)(*local_6e40 + 0x18);
        auVar10 = *local_6e40;
        local_5540 = ZEXT1632(ZEXT816(0) << 0x40);
        local_6500 = 0x3f8000003f800000;
        uStack_64f8 = 0x3f8000003f800000;
        uStack_64f0 = 0x3f8000003f800000;
        uStack_64e8 = 0x3f8000003f800000;
        local_5f40._0_8_ = auVar239._0_8_;
        local_2ee0 = local_5f40._0_8_;
        local_5f40._8_8_ = auVar239._8_8_;
        uStack_2ed8 = local_5f40._8_8_;
        local_5f40._16_8_ = auVar239._16_8_;
        uStack_2ed0 = local_5f40._16_8_;
        local_2f40 = 0x42b0c0a542b0c0a5;
        uStack_2f38 = 0x42b0c0a542b0c0a5;
        uStack_2f30 = 0x42b0c0a542b0c0a5;
        uStack_2f28 = 0x42b0c0a542b0c0a5;
        auVar120._8_8_ = 0x42b0c0a542b0c0a5;
        auVar120._0_8_ = 0x42b0c0a542b0c0a5;
        auVar120._16_8_ = 0x42b0c0a542b0c0a5;
        auVar120._24_8_ = 0x42b0c0a542b0c0a5;
        auVar4 = vminps_avx(*local_6e40,auVar120);
        local_5f40._0_8_ = auVar4._0_8_;
        local_5420 = local_5f40._0_8_;
        local_5f40._8_8_ = auVar4._8_8_;
        uStack_5418 = local_5f40._8_8_;
        local_5f40._16_8_ = auVar4._16_8_;
        uStack_5410 = local_5f40._16_8_;
        local_5f40._24_8_ = auVar4._24_8_;
        uStack_5408 = local_5f40._24_8_;
        local_5480 = 0xc2b0c0a5c2b0c0a5;
        uStack_5478 = 0xc2b0c0a5c2b0c0a5;
        uStack_5470 = 0xc2b0c0a5c2b0c0a5;
        uStack_5468 = 0xc2b0c0a5c2b0c0a5;
        auVar41._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar41._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar41._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar246 = vmaxps_avx(auVar4,auVar41);
        local_4a58 = local_5f40;
        local_49c0 = ::_ps256_cephes_LOG2EF;
        local_49c8 = ::_ps256_0p5;
        local_5f40._0_8_ = auVar246._0_8_;
        local_3ae0 = local_5f40._0_8_;
        local_5f40._8_8_ = auVar246._8_8_;
        uStack_3ad8 = local_5f40._8_8_;
        local_5f40._16_8_ = auVar246._16_8_;
        uStack_3ad0 = local_5f40._16_8_;
        local_5f40._24_8_ = auVar246._24_8_;
        uStack_3ac8 = local_5f40._24_8_;
        local_3b00[0] = 1.442695;
        local_3b00[1] = 1.442695;
        afStack_3af8[0] = 1.442695;
        afStack_3af8[1] = 1.442695;
        afStack_3af0[0] = 1.442695;
        afStack_3af0[1] = 1.442695;
        afStack_3ae8[0] = 1.442695;
        afStack_3ae8[1] = 1.442695;
        local_3b20[0] = 0.5;
        local_3b20[1] = 0.5;
        afStack_3b18[0] = 0.5;
        afStack_3b18[1] = 0.5;
        afStack_3b10[0] = 0.5;
        afStack_3b10[1] = 0.5;
        afStack_3b08[0] = 0.5;
        afStack_3b08[1] = 0.5;
        auVar88._8_4_ = 1.442695;
        auVar88._12_4_ = 1.442695;
        auVar88._0_4_ = 1.442695;
        auVar88._4_4_ = 1.442695;
        auVar88._16_4_ = 1.442695;
        auVar88._20_4_ = 1.442695;
        auVar88._24_4_ = 1.442695;
        auVar88._28_4_ = 1.442695;
        auVar247._8_4_ = 0.5;
        auVar247._12_4_ = 0.5;
        auVar247._0_4_ = 0.5;
        auVar247._4_4_ = 0.5;
        auVar247._16_4_ = 0.5;
        auVar247._20_4_ = 0.5;
        auVar247._24_4_ = 0.5;
        auVar247._28_4_ = 0.5;
        auVar9 = vfmadd213ps_fma(auVar88,auVar246,auVar247);
        auVar8 = vroundps_avx(ZEXT1632(auVar9),1);
        auVar4 = vcmpps_avx(ZEXT1632(auVar9),auVar8,1);
        local_5fe0._0_8_ = auVar4._0_8_;
        local_50e0 = local_5fe0._0_8_;
        local_5fe0._8_8_ = auVar4._8_8_;
        uStack_50d8 = local_5fe0._8_8_;
        local_5fe0._16_8_ = auVar4._16_8_;
        uStack_50d0 = local_5fe0._16_8_;
        local_5fe0._24_8_ = auVar4._24_8_;
        uStack_50c8 = local_5fe0._24_8_;
        local_5100 = 0x3f8000003f800000;
        uStack_50f8 = 0x3f8000003f800000;
        uStack_50f0 = 0x3f8000003f800000;
        uStack_50e8 = 0x3f8000003f800000;
        auVar49._8_8_ = 0x3f8000003f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._16_8_ = 0x3f8000003f800000;
        auVar49._24_8_ = 0x3f8000003f800000;
        local_5fe0 = vandps_avx(auVar4,auVar49);
        local_5f60 = auVar8._0_8_;
        local_5720 = local_5f60;
        uStack_5f58 = auVar8._8_8_;
        uStack_5718 = uStack_5f58;
        uStack_5f50 = auVar8._16_8_;
        uStack_5710 = uStack_5f50;
        uStack_5f48 = auVar8._24_8_;
        uStack_5708 = uStack_5f48;
        local_5740 = local_5fe0._0_8_;
        uStack_5738 = local_5fe0._8_8_;
        uStack_5730 = local_5fe0._16_8_;
        uStack_5728 = local_5fe0._24_8_;
        local_5f80 = vsubps_avx(auVar8,local_5fe0);
        local_46b8 = local_5f80;
        local_46a8 = ::_ps256_cephes_exp_C1;
        local_3180 = local_5f80._0_8_;
        uStack_3178 = local_5f80._8_8_;
        uStack_3170 = local_5f80._16_8_;
        uStack_3168 = local_5f80._24_8_;
        local_31a0[0] = 0.6933594;
        local_31a0[1] = 0.6933594;
        afStack_3198[0] = 0.6933594;
        afStack_3198[1] = 0.6933594;
        afStack_3190[0] = 0.6933594;
        afStack_3190[1] = 0.6933594;
        afStack_3188[0] = 0.6933594;
        afStack_3188[1] = 0.6933594;
        local_31c0 = local_5f40._0_8_;
        uStack_31b8 = local_5f40._8_8_;
        uStack_31b0 = local_5f40._16_8_;
        uStack_31a8 = local_5f40._24_8_;
        auVar112._8_4_ = 0.6933594;
        auVar112._12_4_ = 0.6933594;
        auVar112._0_4_ = 0.6933594;
        auVar112._4_4_ = 0.6933594;
        auVar112._16_4_ = 0.6933594;
        auVar112._20_4_ = 0.6933594;
        auVar112._24_4_ = 0.6933594;
        auVar112._28_4_ = 0.6933594;
        auVar9 = vfnmadd213ps_fma(auVar112,local_5f80,auVar246);
        local_46c0 = ::_ps256_cephes_exp_C2;
        local_3120 = local_5f80._0_8_;
        uStack_3118 = local_5f80._8_8_;
        uStack_3110 = local_5f80._16_8_;
        uStack_3108 = local_5f80._24_8_;
        local_3140[0] = -0.00021219444;
        local_3140[1] = -0.00021219444;
        afStack_3138[0] = -0.00021219444;
        afStack_3138[1] = -0.00021219444;
        afStack_3130[0] = -0.00021219444;
        afStack_3130[1] = -0.00021219444;
        afStack_3128[0] = -0.00021219444;
        afStack_3128[1] = -0.00021219444;
        local_5f40._0_8_ = auVar9._0_8_;
        local_3160 = local_5f40._0_8_;
        local_5f40._8_8_ = auVar9._8_8_;
        uStack_3158 = local_5f40._8_8_;
        uStack_3150 = 0;
        uStack_3148 = 0;
        auVar113._8_4_ = -0.00021219444;
        auVar113._12_4_ = -0.00021219444;
        auVar113._0_4_ = -0.00021219444;
        auVar113._4_4_ = -0.00021219444;
        auVar113._16_4_ = -0.00021219444;
        auVar113._20_4_ = -0.00021219444;
        auVar113._24_4_ = -0.00021219444;
        auVar113._28_4_ = -0.00021219444;
        auVar9 = vfnmadd213ps_fma(auVar113,local_5f80,ZEXT1632(auVar9));
        auVar247 = ZEXT1632(auVar9);
        local_5f40._0_8_ = auVar9._0_8_;
        local_5ee0 = local_5f40._0_8_;
        local_5f40._8_8_ = auVar9._8_8_;
        uStack_5ed8 = local_5f40._8_8_;
        uStack_5ed0 = 0;
        uStack_5ec8 = 0;
        local_5ec0._0_4_ = auVar9._0_4_;
        local_5ec0._4_4_ = auVar9._4_4_;
        uStack_5eb8._0_4_ = auVar9._8_4_;
        uStack_5eb8._4_4_ = auVar9._12_4_;
        local_5f60._4_4_ = local_5ec0._4_4_ * local_5ec0._4_4_;
        local_5f60._0_4_ = (float)local_5ec0 * (float)local_5ec0;
        local_38c0 = local_5f60;
        uStack_5f58._0_4_ = (float)uStack_5eb8 * (float)uStack_5eb8;
        uStack_5f58._4_4_ = uStack_5eb8._4_4_ * uStack_5eb8._4_4_;
        auVar6 = _local_5f60;
        _local_5f60 = ZEXT1632(_local_5f60);
        auVar49 = _local_5f60;
        uStack_5ff8 = 0x3950696739506967;
        local_6000 = (undefined1  [8])0x3950696739506967;
        uStack_5ff0 = 0x3950696739506967;
        uStack_5fe8 = 0x3950696739506967;
        local_4a48 = local_6000;
        local_49e0 = ::_ps256_cephes_exp_p1;
        local_3a80 = 0x3950696739506967;
        uStack_3a78 = 0x3950696739506967;
        uStack_3a70 = 0x3950696739506967;
        uStack_3a68 = 0x3950696739506967;
        local_3aa0 = local_5f40._0_8_;
        uStack_3a98 = local_5f40._8_8_;
        uStack_3a90 = 0;
        uStack_3a88 = 0;
        local_3ac0[0] = 0.0013981999;
        local_3ac0[1] = 0.0013981999;
        afStack_3ab8[0] = 0.0013981999;
        afStack_3ab8[1] = 0.0013981999;
        afStack_3ab0[0] = 0.0013981999;
        afStack_3ab0[1] = 0.0013981999;
        afStack_3aa8[0] = 0.0013981999;
        afStack_3aa8[1] = 0.0013981999;
        auVar89._8_4_ = 0.0013981999;
        auVar89._12_4_ = 0.0013981999;
        auVar89._0_4_ = 0.0013981999;
        auVar89._4_4_ = 0.0013981999;
        auVar89._16_4_ = 0.0013981999;
        auVar89._20_4_ = 0.0013981999;
        auVar89._24_4_ = 0.0013981999;
        auVar89._28_4_ = 0.0013981999;
        auVar9 = vfmadd213ps_fma(auVar247,_local_6000,auVar89);
        local_49f8 = ::_ps256_cephes_exp_p2;
        local_6000 = auVar9._0_8_;
        local_3a20 = local_6000;
        uStack_5ff8 = auVar9._8_8_;
        uStack_3a18 = uStack_5ff8;
        uStack_3a10 = 0;
        uStack_3a08 = 0;
        local_3a40 = local_5f40._0_8_;
        uStack_3a38 = local_5f40._8_8_;
        uStack_3a30 = 0;
        uStack_3a28 = 0;
        local_3a60[0] = 0.008333452;
        local_3a60[1] = 0.008333452;
        afStack_3a58[0] = 0.008333452;
        afStack_3a58[1] = 0.008333452;
        afStack_3a50[0] = 0.008333452;
        afStack_3a50[1] = 0.008333452;
        afStack_3a48[0] = 0.008333452;
        afStack_3a48[1] = 0.008333452;
        auVar90._8_4_ = 0.008333452;
        auVar90._12_4_ = 0.008333452;
        auVar90._0_4_ = 0.008333452;
        auVar90._4_4_ = 0.008333452;
        auVar90._16_4_ = 0.008333452;
        auVar90._20_4_ = 0.008333452;
        auVar90._24_4_ = 0.008333452;
        auVar90._28_4_ = 0.008333452;
        auVar9 = vfmadd213ps_fma(auVar247,ZEXT1632(auVar9),auVar90);
        local_4a10 = ::_ps256_cephes_exp_p3;
        local_6000 = auVar9._0_8_;
        local_39c0 = local_6000;
        uStack_5ff8 = auVar9._8_8_;
        uStack_39b8 = uStack_5ff8;
        uStack_39b0 = 0;
        uStack_39a8 = 0;
        local_39e0 = local_5f40._0_8_;
        uStack_39d8 = local_5f40._8_8_;
        uStack_39d0 = 0;
        uStack_39c8 = 0;
        local_3a00[0] = 0.041665796;
        local_3a00[1] = 0.041665796;
        afStack_39f8[0] = 0.041665796;
        afStack_39f8[1] = 0.041665796;
        afStack_39f0[0] = 0.041665796;
        afStack_39f0[1] = 0.041665796;
        afStack_39e8[0] = 0.041665796;
        afStack_39e8[1] = 0.041665796;
        auVar91._8_4_ = 0.041665796;
        auVar91._12_4_ = 0.041665796;
        auVar91._0_4_ = 0.041665796;
        auVar91._4_4_ = 0.041665796;
        auVar91._16_4_ = 0.041665796;
        auVar91._20_4_ = 0.041665796;
        auVar91._24_4_ = 0.041665796;
        auVar91._28_4_ = 0.041665796;
        auVar9 = vfmadd213ps_fma(auVar247,ZEXT1632(auVar9),auVar91);
        local_4a28 = ::_ps256_cephes_exp_p4;
        local_6000 = auVar9._0_8_;
        local_3960 = local_6000;
        uStack_5ff8 = auVar9._8_8_;
        uStack_3958 = uStack_5ff8;
        uStack_3950 = 0;
        uStack_3948 = 0;
        local_3980 = local_5f40._0_8_;
        uStack_3978 = local_5f40._8_8_;
        uStack_3970 = 0;
        uStack_3968 = 0;
        local_39a0[0] = 0.16666666;
        local_39a0[1] = 0.16666666;
        afStack_3998[0] = 0.16666666;
        afStack_3998[1] = 0.16666666;
        afStack_3990[0] = 0.16666666;
        afStack_3990[1] = 0.16666666;
        afStack_3988[0] = 0.16666666;
        afStack_3988[1] = 0.16666666;
        auVar92._8_4_ = 0.16666666;
        auVar92._12_4_ = 0.16666666;
        auVar92._0_4_ = 0.16666666;
        auVar92._4_4_ = 0.16666666;
        auVar92._16_4_ = 0.16666666;
        auVar92._20_4_ = 0.16666666;
        auVar92._24_4_ = 0.16666666;
        auVar92._28_4_ = 0.16666666;
        auVar9 = vfmadd213ps_fma(auVar247,ZEXT1632(auVar9),auVar92);
        local_4a40 = ::_ps256_cephes_exp_p5;
        local_6000 = auVar9._0_8_;
        local_3900 = local_6000;
        uStack_5ff8 = auVar9._8_8_;
        uStack_38f8 = uStack_5ff8;
        uStack_38f0 = 0;
        uStack_38e8 = 0;
        local_3920 = local_5f40._0_8_;
        uStack_3918 = local_5f40._8_8_;
        uStack_3910 = 0;
        uStack_3908 = 0;
        local_3940[0] = 0.5;
        local_3940[1] = 0.5;
        afStack_3938[0] = 0.5;
        afStack_3938[1] = 0.5;
        afStack_3930[0] = 0.5;
        afStack_3930[1] = 0.5;
        afStack_3928[0] = 0.5;
        afStack_3928[1] = 0.5;
        auVar93._8_4_ = 0.5;
        auVar93._12_4_ = 0.5;
        auVar93._0_4_ = 0.5;
        auVar93._4_4_ = 0.5;
        auVar93._16_4_ = 0.5;
        auVar93._20_4_ = 0.5;
        auVar93._24_4_ = 0.5;
        auVar93._28_4_ = 0.5;
        auVar9 = vfmadd213ps_fma(auVar247,ZEXT1632(auVar9),auVar93);
        local_4a50 = local_5f60;
        local_6000 = auVar9._0_8_;
        local_38a0 = local_6000;
        uStack_5ff8 = auVar9._8_8_;
        uStack_3898 = uStack_5ff8;
        uStack_3890 = 0;
        uStack_3888 = 0;
        uStack_5f58 = auVar6._8_8_;
        uStack_38b8 = uStack_5f58;
        uStack_38b0 = 0;
        uStack_38a8 = 0;
        local_38e0 = local_5f40._0_8_;
        uStack_38d8 = local_5f40._8_8_;
        uStack_38d0 = 0;
        uStack_38c8 = 0;
        auVar9 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar9),auVar247);
        local_6000 = auVar9._0_8_;
        uVar11 = local_6000;
        uStack_5ff8 = auVar9._8_8_;
        uVar12 = uStack_5ff8;
        uStack_5e70 = 0;
        uStack_5e68 = 0;
        local_5ea0 = 0x3f8000003f800000;
        uStack_5e98 = 0x3f8000003f800000;
        uStack_5e90 = 0x3f8000003f800000;
        uStack_5e88 = 0x3f8000003f800000;
        local_5e80._0_4_ = auVar9._0_4_;
        local_5e80._4_4_ = auVar9._4_4_;
        uStack_5e78._0_4_ = auVar9._8_4_;
        uStack_5e78._4_4_ = auVar9._12_4_;
        local_6000._4_4_ = local_5e80._4_4_ + 1.0;
        local_6000._0_4_ = (float)local_5e80 + 1.0;
        uStack_5ff8._0_4_ = (float)uStack_5e78 + 1.0;
        uStack_5ff8._4_4_ = uStack_5e78._4_4_ + 1.0;
        uStack_5ff0._0_4_ = 0x3f800000;
        uStack_5ff0._4_4_ = 0x3f800000;
        auVar244 = _local_6000;
        uStack_5fe8._0_4_ = 0x3f800000;
        uStack_5fe8._4_4_ = 0x3f800000;
        auVar4 = _local_6000;
        local_2e40._0_4_ = local_5f80._0_4_;
        local_2e40._4_4_ = local_5f80._4_4_;
        uStack_2e38._0_4_ = local_5f80._8_4_;
        uStack_2e38._4_4_ = local_5f80._12_4_;
        uStack_2e30._0_4_ = local_5f80._16_4_;
        uStack_2e30._4_4_ = local_5f80._20_4_;
        uStack_2e28._0_4_ = local_5f80._24_4_;
        uStack_2e28._4_4_ = local_5f80._28_4_;
        local_5fa0 = CONCAT44((int)local_2e40._4_4_,(int)(float)local_2e40);
        uStack_5f98 = CONCAT44((int)uStack_2e38._4_4_,(int)(float)uStack_2e38);
        uStack_5f90 = CONCAT44((int)uStack_2e30._4_4_,(int)(float)uStack_2e30);
        uStack_5f88 = CONCAT44((int)uStack_2e28._4_4_,(int)(float)uStack_2e28);
        local_2b20 = local_5fa0;
        uStack_2b18 = uStack_5f98;
        uStack_2b10 = uStack_5f90;
        uStack_2b08 = uStack_5f88;
        local_4d40 = 0x7f0000007f;
        uStack_4d38 = 0x7f0000007f;
        uStack_4d30 = 0x7f0000007f;
        uStack_4d28 = 0x7f0000007f;
        local_2bc0 = local_5fa0;
        uStack_2bb8 = uStack_5f98;
        uStack_2bb0 = uStack_5f90;
        uStack_2ba8 = uStack_5f88;
        local_2be0 = 0x7f0000007f;
        uStack_2bd8 = 0x7f0000007f;
        uStack_2bd0 = 0x7f0000007f;
        uStack_2bc8 = 0x7f0000007f;
        local_2b70 = 0x7f0000007f;
        uStack_2b68 = 0x7f0000007f;
        local_2b80 = 0x7f0000007f;
        uStack_2b78 = 0x7f0000007f;
        local_2610 = local_5fa0;
        uStack_2608 = uStack_5f98;
        local_2620 = 0x7f0000007f;
        uStack_2618 = 0x7f0000007f;
        auVar7._8_8_ = uStack_5f98;
        auVar7._0_8_ = local_5fa0;
        auVar3._8_8_ = 0x7f0000007f;
        auVar3._0_8_ = 0x7f0000007f;
        local_2b50 = vpaddd_avx(auVar3,auVar7);
        local_2630 = uStack_5f90;
        uStack_2628 = uStack_5f88;
        local_2640 = 0x7f0000007f;
        uStack_2638 = 0x7f0000007f;
        auVar2._8_8_ = uStack_5f88;
        auVar2._0_8_ = uStack_5f90;
        auVar1._8_8_ = 0x7f0000007f;
        auVar1._0_8_ = 0x7f0000007f;
        local_2b60 = vpaddd_avx(auVar1,auVar2);
        local_2c00 = local_2b50._0_8_;
        uStack_2bf8 = local_2b50._8_8_;
        uStack_2bf0 = local_2b60._0_8_;
        uStack_2be8 = local_2b60._8_8_;
        local_2ba0 = local_2b50._0_8_;
        uStack_2b98 = local_2b50._8_8_;
        uStack_2b90 = local_2b60._0_8_;
        uStack_2b88 = local_2b60._8_8_;
        local_27e0 = local_2b50._0_8_;
        uStack_27d8 = local_2b50._8_8_;
        uStack_27d0 = local_2b60._0_8_;
        uStack_27c8 = local_2b60._8_8_;
        local_27e4 = 0x17;
        local_2860 = local_2b50._0_8_;
        uStack_2858 = local_2b50._8_8_;
        uStack_2850 = local_2b60._0_8_;
        uStack_2848 = local_2b60._8_8_;
        local_2510 = local_2b50._0_8_;
        uStack_2508 = local_2b50._8_8_;
        local_2514 = 0x17;
        local_2800 = vpslld_avx(local_2b50,ZEXT416(0x17));
        local_2530 = local_2b60._0_8_;
        uStack_2528 = local_2b60._8_8_;
        local_2534 = 0x17;
        local_2810 = vpslld_avx(local_2b60,ZEXT416(0x17));
        local_2880 = local_2800._0_8_;
        uStack_2878 = local_2800._8_8_;
        uStack_2870 = local_2810._0_8_;
        uStack_2868 = local_2810._8_8_;
        local_2840 = local_2800._0_8_;
        uStack_2838 = local_2800._8_8_;
        uStack_2830 = local_2810._0_8_;
        uStack_2828 = local_2810._8_8_;
        local_5fa0 = local_2800._0_8_;
        uStack_5f98 = local_2800._8_8_;
        uStack_5f90 = local_2810._0_8_;
        uStack_5f88 = local_2810._8_8_;
        local_26c0 = local_2800._0_8_;
        uStack_26b8 = local_2800._8_8_;
        uStack_26b0 = local_2810._0_8_;
        uStack_26a8 = local_2810._8_8_;
        local_6020 = local_2800._0_8_;
        uStack_6018 = local_2800._8_8_;
        uStack_6010 = local_2810._0_8_;
        uStack_6008 = local_2810._8_8_;
        local_5f00 = local_6000;
        uStack_5ef8 = uStack_5ff8;
        uStack_5ff0 = auVar244._16_8_;
        uStack_5ef0 = uStack_5ff0;
        uStack_5fe8 = auVar4._24_8_;
        uStack_5ee8 = uStack_5fe8;
        local_5f20._0_4_ = local_2800._0_4_;
        local_5f20._4_4_ = local_2800._4_4_;
        uStack_5f18._0_4_ = local_2800._8_4_;
        uStack_5f18._4_4_ = local_2800._12_4_;
        uStack_5f10._0_4_ = local_2810._0_4_;
        uStack_5f10._4_4_ = local_2810._4_4_;
        uStack_5f08._0_4_ = local_2810._8_4_;
        local_6000._0_4_ = (float)local_5f20 * ((float)local_5e80 + 1.0);
        local_6000._4_4_ = local_5f20._4_4_ * (local_5e80._4_4_ + 1.0);
        uStack_5f18._0_4_ = (float)uStack_5f18 * ((float)uStack_5e78 + 1.0);
        uStack_5f18._4_4_ = uStack_5f18._4_4_ * (uStack_5e78._4_4_ + 1.0);
        uStack_5ff8._0_4_ = (float)uStack_5f18;
        uStack_5ff8._4_4_ = uStack_5f18._4_4_;
        uStack_5ff0._0_4_ = (float)uStack_5f10 * 1.0;
        uStack_5ff0._4_4_ = uStack_5f10._4_4_ * 1.0;
        auVar244 = _local_6000;
        uStack_5fe8._0_4_ = (float)uStack_5f08 * 1.0;
        uStack_5fe8._4_4_ = 0x3f800000;
        auVar41 = _local_6000;
        local_6200 = local_6000;
        uStack_61f8 = uStack_5ff8;
        uStack_5ff0 = auVar244._16_8_;
        uStack_61f0 = uStack_5ff0;
        uStack_5fe8 = auVar41._24_8_;
        uStack_61e8 = uStack_5fe8;
        local_5e44 = 0x3f800000;
        local_23e0 = 0x3f800000;
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        local_2400 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        auStack_23f0 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        local_6220._0_4_ = local_2400._0_4_;
        local_6220._4_4_ = local_2400._4_4_;
        uStack_6218._0_4_ = local_2400._8_4_;
        uStack_6218._4_4_ = local_2400._12_4_;
        uStack_6210._0_4_ = auStack_23f0._0_4_;
        uStack_6210._4_4_ = auStack_23f0._4_4_;
        uStack_6208._0_4_ = auStack_23f0._8_4_;
        uStack_6208._4_4_ = auStack_23f0._12_4_;
        local_64c0._4_4_ = local_6220._4_4_ + (float)local_6000._4_4_;
        local_64c0._0_4_ = (float)local_6220 + (float)local_6000._0_4_;
        uStack_64b8._0_4_ = (float)uStack_6218 + (float)uStack_5f18;
        uStack_64b8._4_4_ = uStack_6218._4_4_ + uStack_5f18._4_4_;
        uStack_64b0._0_4_ = (float)uStack_6210 + (float)uStack_5f10 * 1.0;
        uStack_64b0._4_4_ = uStack_6210._4_4_ + uStack_5f10._4_4_ * 1.0;
        auVar244 = _local_64c0;
        uStack_64a8._0_4_ = (float)uStack_6208 + (float)uStack_5f08 * 1.0;
        uStack_64a8._4_4_ = uStack_6208._4_4_ + 1.0;
        auVar4 = _local_64c0;
        local_6520 = vcmpps_avx(_local_64c0,local_5540,2);
        local_53a0 = local_64c0;
        uStack_5398 = uStack_64b8;
        uStack_64b0 = auVar244._16_8_;
        uStack_5390 = uStack_64b0;
        uStack_64a8 = auVar4._24_8_;
        uStack_5388 = uStack_64a8;
        local_53c0 = 0x80000000800000;
        uStack_53b8 = 0x80000000800000;
        uStack_53b0 = 0x80000000800000;
        uStack_53a8 = 0x80000000800000;
        auVar44._16_8_ = uStack_64b0;
        auVar44._0_16_ = _local_64c0;
        auVar44._24_8_ = uStack_64a8;
        auVar43._8_8_ = 0x80000000800000;
        auVar43._0_8_ = 0x80000000800000;
        auVar43._16_8_ = 0x80000000800000;
        auVar43._24_8_ = 0x80000000800000;
        auVar4 = vmaxps_avx(auVar43,auVar44);
        local_64c0 = auVar4._0_8_;
        local_51c0 = local_64c0;
        uStack_64b8 = auVar4._8_8_;
        uStack_51b8 = uStack_64b8;
        uStack_64b0 = auVar4._16_8_;
        uStack_51b0 = uStack_64b0;
        uStack_64a8 = auVar4._24_8_;
        uStack_51a8 = uStack_64a8;
        local_52a0 = local_64c0;
        uStack_5298 = uStack_64b8;
        uStack_5290 = uStack_64b0;
        uStack_5288 = uStack_64a8;
        local_52a4 = 0x17;
        local_5320 = local_64c0;
        uStack_5318 = uStack_64b8;
        uStack_5310 = uStack_64b0;
        uStack_5308 = uStack_64a8;
        local_45d0 = local_64c0;
        uStack_45c8 = uStack_64b8;
        local_45d4 = 0x17;
        local_52c0 = vpsrld_avx(auVar4._0_16_,ZEXT416(0x17));
        local_45f0 = uStack_64b0;
        uStack_45e8 = uStack_64a8;
        local_45f4 = 0x17;
        local_52d0 = vpsrld_avx(auVar4._16_16_,ZEXT416(0x17));
        local_5340 = local_52c0._0_8_;
        uStack_5338 = local_52c0._8_8_;
        uStack_5330 = local_52d0._0_8_;
        uStack_5328 = local_52d0._8_8_;
        local_5300 = local_52c0._0_8_;
        uStack_52f8 = local_52c0._8_8_;
        uStack_52f0 = local_52d0._0_8_;
        uStack_52e8 = local_52d0._8_8_;
        local_4fe0 = local_64c0;
        uStack_4fd8 = uStack_64b8;
        uStack_4fd0 = uStack_64b0;
        uStack_4fc8 = uStack_64a8;
        local_5000 = 0x807fffff807fffff;
        uStack_4ff8 = 0x807fffff807fffff;
        uStack_4ff0 = 0x807fffff807fffff;
        uStack_4fe8 = 0x807fffff807fffff;
        auVar52._8_8_ = 0x807fffff807fffff;
        auVar52._0_8_ = 0x807fffff807fffff;
        auVar52._16_8_ = 0x807fffff807fffff;
        auVar52._24_8_ = 0x807fffff807fffff;
        auVar4 = vandps_avx(auVar52,auVar4);
        local_64c0 = auVar4._0_8_;
        local_4ea0 = local_64c0;
        uStack_64b8 = auVar4._8_8_;
        uStack_4e98 = uStack_64b8;
        uStack_64b0 = auVar4._16_8_;
        uStack_4e90 = uStack_64b0;
        uStack_64a8 = auVar4._24_8_;
        uStack_4e88 = uStack_64a8;
        local_4ec0 = 0x3f0000003f000000;
        uStack_4eb8 = 0x3f0000003f000000;
        uStack_4eb0 = 0x3f0000003f000000;
        uStack_4ea8 = 0x3f0000003f000000;
        auVar55._8_8_ = 0x3f0000003f000000;
        auVar55._0_8_ = 0x3f0000003f000000;
        auVar55._16_8_ = 0x3f0000003f000000;
        auVar55._24_8_ = 0x3f0000003f000000;
        auVar246 = vorps_avx(auVar55,auVar4);
        local_4d20 = local_52c0._0_8_;
        uStack_4d18 = local_52c0._8_8_;
        uStack_4d10 = local_52d0._0_8_;
        uStack_4d08 = local_52d0._8_8_;
        local_4dc0 = local_52c0._0_8_;
        uStack_4db8 = local_52c0._8_8_;
        uStack_4db0 = local_52d0._0_8_;
        uStack_4da8 = local_52d0._8_8_;
        local_4de0 = 0x7f0000007f;
        uStack_4dd8 = 0x7f0000007f;
        uStack_4dd0 = 0x7f0000007f;
        uStack_4dc8 = 0x7f0000007f;
        local_4d70 = 0x7f0000007f;
        uStack_4d68 = 0x7f0000007f;
        local_4d80 = 0x7f0000007f;
        uStack_4d78 = 0x7f0000007f;
        local_4550 = local_52c0._0_8_;
        uStack_4548 = local_52c0._8_8_;
        local_4560 = 0x7f0000007f;
        uStack_4558 = 0x7f0000007f;
        auVar6._8_8_ = 0x7f0000007f;
        auVar6._0_8_ = 0x7f0000007f;
        local_4d50 = vpsubd_avx(local_52c0,auVar6);
        local_4570 = local_52d0._0_8_;
        uStack_4568 = local_52d0._8_8_;
        local_4580 = 0x7f0000007f;
        uStack_4578 = 0x7f0000007f;
        auVar9._8_8_ = 0x7f0000007f;
        auVar9._0_8_ = 0x7f0000007f;
        local_4d60 = vpsubd_avx(local_52d0,auVar9);
        local_4e00 = local_4d50._0_8_;
        uStack_4df8 = local_4d50._8_8_;
        uStack_4df0 = local_4d60._0_8_;
        uStack_4de8 = local_4d60._8_8_;
        local_4da0 = local_4d50._0_8_;
        uStack_4d98 = local_4d50._8_8_;
        uStack_4d90 = local_4d60._0_8_;
        uStack_4d88 = local_4d60._8_8_;
        local_64e0 = local_4d50._0_8_;
        uStack_64d8 = local_4d50._8_8_;
        uStack_64d0 = local_4d60._0_8_;
        uStack_64c8 = local_4d60._8_8_;
        local_4c00 = local_4d50._0_8_;
        uStack_4bf8 = local_4d50._8_8_;
        uStack_4bf0 = local_4d60._0_8_;
        uStack_4be8 = local_4d60._8_8_;
        auVar57._16_8_ = local_4d60._0_8_;
        auVar57._0_16_ = local_4d50;
        auVar57._24_8_ = local_4d60._8_8_;
        auVar4 = vcvtdq2ps_avx(auVar57);
        local_6540 = auVar4._0_8_;
        uVar13 = local_6540;
        uStack_6538 = auVar4._8_8_;
        uVar14 = uStack_6538;
        uStack_6530 = auVar4._16_8_;
        uVar15 = uStack_6530;
        uStack_6528 = auVar4._24_8_;
        uVar16 = uStack_6528;
        local_6360 = 0x3f8000003f800000;
        uStack_6358 = 0x3f8000003f800000;
        uStack_6350 = 0x3f8000003f800000;
        uStack_6348 = 0x3f8000003f800000;
        local_6340._0_4_ = auVar4._0_4_;
        local_6340._4_4_ = auVar4._4_4_;
        uStack_6338._0_4_ = auVar4._8_4_;
        uStack_6338._4_4_ = auVar4._12_4_;
        uStack_6330._0_4_ = auVar4._16_4_;
        uStack_6330._4_4_ = auVar4._20_4_;
        uStack_6328._0_4_ = auVar4._24_4_;
        uStack_6328._4_4_ = auVar4._28_4_;
        local_6540._4_4_ = local_6340._4_4_ + 1.0;
        local_6540._0_4_ = (float)local_6340 + 1.0;
        uStack_6538._0_4_ = (float)uStack_6338 + 1.0;
        uStack_6538._4_4_ = uStack_6338._4_4_ + 1.0;
        uStack_6530._0_4_ = (float)uStack_6330 + 1.0;
        uStack_6530._4_4_ = uStack_6330._4_4_ + 1.0;
        auVar244 = _local_6540;
        uStack_6528._0_4_ = (float)uStack_6328 + 1.0;
        uStack_6528._4_4_ = uStack_6328._4_4_ + 1.0;
        auVar8 = _local_6540;
        local_6560 = vcmpps_avx(auVar246,_DAT_01c7a1a0,1);
        local_64c0 = auVar246._0_8_;
        local_5020 = local_64c0;
        uStack_64b8 = auVar246._8_8_;
        uStack_5018 = uStack_64b8;
        uStack_64b0 = auVar246._16_8_;
        uStack_5010 = uStack_64b0;
        uStack_64a8 = auVar246._24_8_;
        uStack_5008 = uStack_64a8;
        local_5040 = local_6560._0_8_;
        uStack_5038 = local_6560._8_8_;
        uStack_5030 = local_6560._16_8_;
        uStack_5028 = local_6560._24_8_;
        local_6580 = vandps_avx(local_6560,auVar246);
        local_5660 = local_64c0;
        uStack_5658 = uStack_64b8;
        uStack_5650 = uStack_64b0;
        uStack_5648 = uStack_64a8;
        local_5680 = 0x3f8000003f800000;
        uStack_5678 = 0x3f8000003f800000;
        uStack_5670 = 0x3f8000003f800000;
        uStack_5668 = 0x3f8000003f800000;
        auVar254._8_8_ = 0x3f8000003f800000;
        auVar254._0_8_ = 0x3f8000003f800000;
        auVar254._16_8_ = 0x3f8000003f800000;
        auVar254._24_8_ = 0x3f8000003f800000;
        auVar4 = vsubps_avx(auVar246,auVar254);
        local_56a0 = local_6540;
        uStack_5698 = uStack_6538;
        uStack_6530 = auVar244._16_8_;
        uStack_5690 = uStack_6530;
        uStack_6528 = auVar8._24_8_;
        uStack_5688 = uStack_6528;
        local_5060 = 0x3f8000003f800000;
        uStack_5058 = 0x3f8000003f800000;
        uStack_5050 = 0x3f8000003f800000;
        uStack_5048 = 0x3f8000003f800000;
        local_5080 = local_6560._0_8_;
        uStack_5078 = local_6560._8_8_;
        uStack_5070 = local_6560._16_8_;
        uStack_5068 = local_6560._24_8_;
        auVar51._8_8_ = 0x3f8000003f800000;
        auVar51._0_8_ = 0x3f8000003f800000;
        auVar51._16_8_ = 0x3f8000003f800000;
        auVar51._24_8_ = 0x3f8000003f800000;
        local_56c0 = vandps_avx(local_6560,auVar51);
        auVar36._16_8_ = uStack_6530;
        auVar36._0_16_ = _local_6540;
        auVar36._24_8_ = uStack_6528;
        _local_6540 = vsubps_avx(auVar36,local_56c0);
        local_64c0 = auVar4._0_8_;
        uVar17 = local_64c0;
        uStack_64b8 = auVar4._8_8_;
        uVar18 = uStack_64b8;
        uStack_64b0 = auVar4._16_8_;
        uVar19 = uStack_64b0;
        uStack_64a8 = auVar4._24_8_;
        uVar20 = uStack_64a8;
        local_6380._0_4_ = auVar4._0_4_;
        local_6380._4_4_ = auVar4._4_4_;
        uStack_6378._0_4_ = auVar4._8_4_;
        uStack_6378._4_4_ = auVar4._12_4_;
        uStack_6370._0_4_ = auVar4._16_4_;
        uStack_6370._4_4_ = auVar4._20_4_;
        uStack_6368._0_4_ = auVar4._24_4_;
        uStack_6368._4_4_ = auVar4._28_4_;
        local_63a0._0_4_ = local_6580._0_4_;
        local_63a0._4_4_ = local_6580._4_4_;
        uStack_6398._0_4_ = local_6580._8_4_;
        uStack_6398._4_4_ = local_6580._12_4_;
        uStack_6390._0_4_ = local_6580._16_4_;
        uStack_6390._4_4_ = local_6580._20_4_;
        uStack_6388._0_4_ = local_6580._24_4_;
        uStack_6388._4_4_ = local_6580._28_4_;
        local_64c0._0_4_ = (float)local_63a0 + (float)local_6380;
        local_64c0._4_4_ = local_63a0._4_4_ + local_6380._4_4_;
        uStack_6398._0_4_ = (float)uStack_6398 + (float)uStack_6378;
        uStack_6398._4_4_ = uStack_6398._4_4_ + uStack_6378._4_4_;
        uStack_6390._0_4_ = (float)uStack_6390 + (float)uStack_6370;
        uStack_6390._4_4_ = uStack_6390._4_4_ + uStack_6370._4_4_;
        uStack_6388._0_4_ = (float)uStack_6388 + (float)uStack_6368;
        fStack_6584 = uStack_6388._4_4_ + uStack_6368._4_4_;
        uStack_64b8._0_4_ = (float)uStack_6398;
        uStack_64b8._4_4_ = uStack_6398._4_4_;
        uStack_64b0._0_4_ = (float)uStack_6390;
        uStack_64b0._4_4_ = uStack_6390._4_4_;
        auVar244 = _local_64c0;
        uStack_64a8._0_4_ = (float)uStack_6388;
        uStack_64a8._4_4_ = fStack_6584;
        auVar4 = _local_64c0;
        local_6420 = local_64c0;
        uStack_6418 = uStack_64b8;
        uStack_64b0 = auVar244._16_8_;
        uStack_6410 = uStack_64b0;
        uStack_64a8 = auVar4._24_8_;
        uStack_6408 = uStack_64a8;
        local_65a0 = (float)local_64c0._0_4_ * (float)local_64c0._0_4_;
        fStack_659c = (float)local_64c0._4_4_ * (float)local_64c0._4_4_;
        fStack_6598 = (float)uStack_6398 * (float)uStack_6398;
        fStack_6594 = uStack_6398._4_4_ * uStack_6398._4_4_;
        fStack_6590 = (float)uStack_6390 * (float)uStack_6390;
        fStack_658c = uStack_6390._4_4_ * uStack_6390._4_4_;
        fStack_6588 = (float)uStack_6388 * (float)uStack_6388;
        uStack_65b8 = 0x3d9021bb3d9021bb;
        local_65c0 = (undefined1  [8])0x3d9021bb3d9021bb;
        uStack_65b0 = 0x3d9021bb3d9021bb;
        uStack_65a8 = 0x3d9021bb3d9021bb;
        local_48f0 = local_65c0;
        local_4908 = local_64c0;
        local_4830 = ::_ps256_cephes_log_p1;
        local_4140 = 0x3d9021bb3d9021bb;
        uStack_4138 = 0x3d9021bb3d9021bb;
        uStack_4130 = 0x3d9021bb3d9021bb;
        uStack_4128 = 0x3d9021bb3d9021bb;
        local_4160 = local_64c0;
        uStack_4158 = uStack_64b8;
        uStack_4150 = uStack_64b0;
        uStack_4148 = uStack_64a8;
        local_4180[0] = -0.1151461;
        local_4180[1] = -0.1151461;
        afStack_4178[0] = -0.1151461;
        afStack_4178[1] = -0.1151461;
        afStack_4170[0] = -0.1151461;
        afStack_4170[1] = -0.1151461;
        afStack_4168[0] = -0.1151461;
        afStack_4168[1] = -0.1151461;
        auVar71._8_4_ = -0.1151461;
        auVar71._12_4_ = -0.1151461;
        auVar71._0_4_ = -0.1151461;
        auVar71._4_4_ = -0.1151461;
        auVar71._16_4_ = -0.1151461;
        auVar71._20_4_ = -0.1151461;
        auVar71._24_4_ = -0.1151461;
        auVar71._28_4_ = -0.1151461;
        auVar9 = vfmadd213ps_fma(auVar4,_local_65c0,auVar71);
        local_4848 = ::_ps256_cephes_log_p2;
        local_65c0 = auVar9._0_8_;
        local_40e0 = local_65c0;
        uStack_65b8 = auVar9._8_8_;
        uStack_40d8 = uStack_65b8;
        uStack_40d0 = 0;
        uStack_40c8 = 0;
        local_4100 = local_64c0;
        uStack_40f8 = uStack_64b8;
        uStack_40f0 = uStack_64b0;
        uStack_40e8 = uStack_64a8;
        local_4120[0] = 0.116769984;
        local_4120[1] = 0.116769984;
        afStack_4118[0] = 0.116769984;
        afStack_4118[1] = 0.116769984;
        afStack_4110[0] = 0.116769984;
        afStack_4110[1] = 0.116769984;
        afStack_4108[0] = 0.116769984;
        afStack_4108[1] = 0.116769984;
        auVar72._8_4_ = 0.116769984;
        auVar72._12_4_ = 0.116769984;
        auVar72._0_4_ = 0.116769984;
        auVar72._4_4_ = 0.116769984;
        auVar72._16_4_ = 0.116769984;
        auVar72._20_4_ = 0.116769984;
        auVar72._24_4_ = 0.116769984;
        auVar72._28_4_ = 0.116769984;
        auVar9 = vfmadd213ps_fma(auVar4,ZEXT1632(auVar9),auVar72);
        local_4860 = ::_ps256_cephes_log_p3;
        local_65c0 = auVar9._0_8_;
        local_4080 = local_65c0;
        uStack_65b8 = auVar9._8_8_;
        uStack_4078 = uStack_65b8;
        uStack_4070 = 0;
        uStack_4068 = 0;
        local_40a0 = local_64c0;
        uStack_4098 = uStack_64b8;
        uStack_4090 = uStack_64b0;
        uStack_4088 = uStack_64a8;
        local_40c0[0] = -0.12420141;
        local_40c0[1] = -0.12420141;
        afStack_40b8[0] = -0.12420141;
        afStack_40b8[1] = -0.12420141;
        afStack_40b0[0] = -0.12420141;
        afStack_40b0[1] = -0.12420141;
        afStack_40a8[0] = -0.12420141;
        afStack_40a8[1] = -0.12420141;
        auVar73._8_4_ = -0.12420141;
        auVar73._12_4_ = -0.12420141;
        auVar73._0_4_ = -0.12420141;
        auVar73._4_4_ = -0.12420141;
        auVar73._16_4_ = -0.12420141;
        auVar73._20_4_ = -0.12420141;
        auVar73._24_4_ = -0.12420141;
        auVar73._28_4_ = -0.12420141;
        auVar9 = vfmadd213ps_fma(auVar4,ZEXT1632(auVar9),auVar73);
        local_4878 = ::_ps256_cephes_log_p4;
        local_65c0 = auVar9._0_8_;
        local_4020 = local_65c0;
        uStack_65b8 = auVar9._8_8_;
        uStack_4018 = uStack_65b8;
        uStack_4010 = 0;
        uStack_4008 = 0;
        local_4040 = local_64c0;
        uStack_4038 = uStack_64b8;
        uStack_4030 = uStack_64b0;
        uStack_4028 = uStack_64a8;
        local_4060[0] = 0.14249323;
        local_4060[1] = 0.14249323;
        afStack_4058[0] = 0.14249323;
        afStack_4058[1] = 0.14249323;
        afStack_4050[0] = 0.14249323;
        afStack_4050[1] = 0.14249323;
        afStack_4048[0] = 0.14249323;
        afStack_4048[1] = 0.14249323;
        auVar74._8_4_ = 0.14249323;
        auVar74._12_4_ = 0.14249323;
        auVar74._0_4_ = 0.14249323;
        auVar74._4_4_ = 0.14249323;
        auVar74._16_4_ = 0.14249323;
        auVar74._20_4_ = 0.14249323;
        auVar74._24_4_ = 0.14249323;
        auVar74._28_4_ = 0.14249323;
        auVar9 = vfmadd213ps_fma(auVar4,ZEXT1632(auVar9),auVar74);
        local_4890 = ::_ps256_cephes_log_p5;
        local_65c0 = auVar9._0_8_;
        local_3fc0 = local_65c0;
        uStack_65b8 = auVar9._8_8_;
        uStack_3fb8 = uStack_65b8;
        uStack_3fb0 = 0;
        uStack_3fa8 = 0;
        local_3fe0 = local_64c0;
        uStack_3fd8 = uStack_64b8;
        uStack_3fd0 = uStack_64b0;
        uStack_3fc8 = uStack_64a8;
        local_4000[0] = -0.16668057;
        local_4000[1] = -0.16668057;
        afStack_3ff8[0] = -0.16668057;
        afStack_3ff8[1] = -0.16668057;
        afStack_3ff0[0] = -0.16668057;
        afStack_3ff0[1] = -0.16668057;
        afStack_3fe8[0] = -0.16668057;
        afStack_3fe8[1] = -0.16668057;
        auVar75._8_4_ = -0.16668057;
        auVar75._12_4_ = -0.16668057;
        auVar75._0_4_ = -0.16668057;
        auVar75._4_4_ = -0.16668057;
        auVar75._16_4_ = -0.16668057;
        auVar75._20_4_ = -0.16668057;
        auVar75._24_4_ = -0.16668057;
        auVar75._28_4_ = -0.16668057;
        auVar9 = vfmadd213ps_fma(auVar4,ZEXT1632(auVar9),auVar75);
        local_48a8 = ::_ps256_cephes_log_p6;
        local_65c0 = auVar9._0_8_;
        local_3f60 = local_65c0;
        uStack_65b8 = auVar9._8_8_;
        uStack_3f58 = uStack_65b8;
        uStack_3f50 = 0;
        uStack_3f48 = 0;
        local_3f80 = local_64c0;
        uStack_3f78 = uStack_64b8;
        uStack_3f70 = uStack_64b0;
        uStack_3f68 = uStack_64a8;
        local_3fa0[0] = 0.20000714;
        local_3fa0[1] = 0.20000714;
        afStack_3f98[0] = 0.20000714;
        afStack_3f98[1] = 0.20000714;
        afStack_3f90[0] = 0.20000714;
        afStack_3f90[1] = 0.20000714;
        afStack_3f88[0] = 0.20000714;
        afStack_3f88[1] = 0.20000714;
        auVar76._8_4_ = 0.20000714;
        auVar76._12_4_ = 0.20000714;
        auVar76._0_4_ = 0.20000714;
        auVar76._4_4_ = 0.20000714;
        auVar76._16_4_ = 0.20000714;
        auVar76._20_4_ = 0.20000714;
        auVar76._24_4_ = 0.20000714;
        auVar76._28_4_ = 0.20000714;
        auVar9 = vfmadd213ps_fma(auVar4,ZEXT1632(auVar9),auVar76);
        local_48c0 = ::_ps256_cephes_log_p7;
        local_65c0 = auVar9._0_8_;
        local_3f00 = local_65c0;
        uStack_65b8 = auVar9._8_8_;
        uStack_3ef8 = uStack_65b8;
        uStack_3ef0 = 0;
        uStack_3ee8 = 0;
        local_3f20 = local_64c0;
        uStack_3f18 = uStack_64b8;
        uStack_3f10 = uStack_64b0;
        uStack_3f08 = uStack_64a8;
        local_3f40[0] = -0.24999994;
        local_3f40[1] = -0.24999994;
        afStack_3f38[0] = -0.24999994;
        afStack_3f38[1] = -0.24999994;
        afStack_3f30[0] = -0.24999994;
        afStack_3f30[1] = -0.24999994;
        afStack_3f28[0] = -0.24999994;
        afStack_3f28[1] = -0.24999994;
        auVar77._8_4_ = -0.24999994;
        auVar77._12_4_ = -0.24999994;
        auVar77._0_4_ = -0.24999994;
        auVar77._4_4_ = -0.24999994;
        auVar77._16_4_ = -0.24999994;
        auVar77._20_4_ = -0.24999994;
        auVar77._24_4_ = -0.24999994;
        auVar77._28_4_ = -0.24999994;
        auVar9 = vfmadd213ps_fma(auVar4,ZEXT1632(auVar9),auVar77);
        local_48d8 = ::_ps256_cephes_log_p8;
        local_65c0 = auVar9._0_8_;
        local_3ea0 = local_65c0;
        uStack_65b8 = auVar9._8_8_;
        uStack_3e98 = uStack_65b8;
        uStack_3e90 = 0;
        uStack_3e88 = 0;
        local_3ec0 = local_64c0;
        uStack_3eb8 = uStack_64b8;
        uStack_3eb0 = uStack_64b0;
        uStack_3ea8 = uStack_64a8;
        local_3ee0[0] = 0.3333333;
        local_3ee0[1] = 0.3333333;
        afStack_3ed8[0] = 0.3333333;
        afStack_3ed8[1] = 0.3333333;
        afStack_3ed0[0] = 0.3333333;
        afStack_3ed0[1] = 0.3333333;
        afStack_3ec8[0] = 0.3333333;
        afStack_3ec8[1] = 0.3333333;
        auVar78._8_4_ = 0.3333333;
        auVar78._12_4_ = 0.3333333;
        auVar78._0_4_ = 0.3333333;
        auVar78._4_4_ = 0.3333333;
        auVar78._16_4_ = 0.3333333;
        auVar78._20_4_ = 0.3333333;
        auVar78._24_4_ = 0.3333333;
        auVar78._28_4_ = 0.3333333;
        auVar9 = vfmadd213ps_fma(auVar4,ZEXT1632(auVar9),auVar78);
        local_65c0 = auVar9._0_8_;
        uVar21 = local_65c0;
        uStack_65b8 = auVar9._8_8_;
        uVar22 = uStack_65b8;
        uStack_6430 = 0;
        uStack_6428 = 0;
        local_6460 = local_64c0;
        uStack_6458 = uStack_64b8;
        uStack_6450 = uStack_64b0;
        uStack_6448 = uStack_64a8;
        local_6440._0_4_ = auVar9._0_4_;
        local_6440._4_4_ = auVar9._4_4_;
        uStack_6438._0_4_ = auVar9._8_4_;
        uStack_6438._4_4_ = auVar9._12_4_;
        local_65c0._4_4_ = (float)local_64c0._4_4_ * local_6440._4_4_;
        local_65c0._0_4_ = (float)local_64c0._0_4_ * (float)local_6440;
        uStack_65b8._0_4_ = (float)uStack_6398 * (float)uStack_6438;
        uStack_65b8._4_4_ = uStack_6398._4_4_ * uStack_6438._4_4_;
        uStack_65b0._0_4_ = (float)uStack_6390 * 0.0;
        uStack_65b0._4_4_ = uStack_6390._4_4_ * 0.0;
        auVar244 = _local_65c0;
        local_6480 = local_65c0;
        uStack_6478 = uStack_65b8;
        uStack_65b0 = auVar244._16_8_;
        uStack_6470 = uStack_65b0;
        uStack_65a8 = (ulong)(uint)((float)uStack_6388 * 0.0);
        uStack_6468 = uStack_65a8;
        local_64a0 = CONCAT44(fStack_659c,local_65a0);
        uStack_6498 = CONCAT44(fStack_6594,fStack_6598);
        uStack_6490 = CONCAT44(fStack_658c,fStack_6590);
        uStack_6488 = CONCAT44(fStack_6584,fStack_6588);
        uStack_65a8._0_4_ = fStack_6588 * (float)uStack_6388 * 0.0;
        local_65c0._4_4_ = fStack_659c * (float)local_64c0._4_4_ * local_6440._4_4_;
        local_65c0._0_4_ = local_65a0 * (float)local_64c0._0_4_ * (float)local_6440;
        uStack_65b8._0_4_ = fStack_6598 * (float)uStack_6398 * (float)uStack_6438;
        uStack_65b8._4_4_ = fStack_6594 * uStack_6398._4_4_ * uStack_6438._4_4_;
        uStack_65b0._0_4_ = fStack_6590 * (float)uStack_6390 * 0.0;
        uStack_65b0._4_4_ = fStack_658c * uStack_6390._4_4_ * 0.0;
        auVar244 = _local_65c0;
        uStack_65a8._4_4_ = 0;
        auVar4 = _local_65c0;
        local_48f8 = local_6540;
        local_48e8 = ::_ps256_cephes_log_q1;
        local_3e40 = local_6540;
        uStack_3e38 = uStack_6538;
        uStack_3e30 = uStack_6530;
        uStack_3e28 = uStack_6528;
        local_3e60[0] = -0.00021219444;
        local_3e60[1] = -0.00021219444;
        afStack_3e58[0] = -0.00021219444;
        afStack_3e58[1] = -0.00021219444;
        afStack_3e50[0] = -0.00021219444;
        afStack_3e50[1] = -0.00021219444;
        afStack_3e48[0] = -0.00021219444;
        afStack_3e48[1] = -0.00021219444;
        local_3e80 = local_65c0;
        uStack_3e78 = uStack_65b8;
        uStack_65b0 = auVar244._16_8_;
        uStack_3e70 = uStack_65b0;
        uStack_65a8 = (ulong)(uint)(float)uStack_65a8;
        uStack_3e68 = uStack_65a8;
        auVar79._8_4_ = -0.00021219444;
        auVar79._12_4_ = -0.00021219444;
        auVar79._0_4_ = -0.00021219444;
        auVar79._4_4_ = -0.00021219444;
        auVar79._16_4_ = -0.00021219444;
        auVar79._20_4_ = -0.00021219444;
        auVar79._24_4_ = -0.00021219444;
        auVar79._28_4_ = -0.00021219444;
        auVar9 = vfmadd213ps_fma(auVar79,_local_6540,auVar4);
        local_4658 = &local_65a0;
        local_4660 = ::_ps256_0p5;
        local_32a0 = CONCAT44(fStack_659c,local_65a0);
        uStack_3298 = CONCAT44(fStack_6594,fStack_6598);
        uStack_3290 = CONCAT44(fStack_658c,fStack_6590);
        uStack_3288 = CONCAT44(fStack_6584,fStack_6588);
        auVar241._4_4_ = fStack_659c;
        auVar241._0_4_ = local_65a0;
        auVar241._8_4_ = fStack_6598;
        auVar241._12_4_ = fStack_6594;
        auVar241._16_4_ = fStack_6590;
        auVar241._20_4_ = fStack_658c;
        auVar241._24_4_ = fStack_6588;
        auVar241._28_4_ = fStack_6584;
        local_32c0[0] = 0.5;
        local_32c0[1] = 0.5;
        afStack_32b8[0] = 0.5;
        afStack_32b8[1] = 0.5;
        afStack_32b0[0] = 0.5;
        afStack_32b0[1] = 0.5;
        afStack_32a8[0] = 0.5;
        afStack_32a8[1] = 0.5;
        local_65c0 = auVar9._0_8_;
        local_32e0 = local_65c0;
        uStack_65b8 = auVar9._8_8_;
        uStack_32d8 = uStack_65b8;
        uStack_32d0 = 0;
        uStack_32c8 = 0;
        auVar109._8_4_ = 0.5;
        auVar109._12_4_ = 0.5;
        auVar109._0_4_ = 0.5;
        auVar109._4_4_ = 0.5;
        auVar109._16_4_ = 0.5;
        auVar109._20_4_ = 0.5;
        auVar109._24_4_ = 0.5;
        auVar109._28_4_ = 0.5;
        auVar9 = vfnmadd213ps_fma(auVar109,auVar241,ZEXT1632(auVar9));
        local_63c0 = local_64c0;
        uStack_63b8 = uStack_64b8;
        uStack_63b0 = uStack_64b0;
        uStack_63a8 = uStack_64a8;
        local_65c0 = auVar9._0_8_;
        uVar23 = local_65c0;
        uStack_65b8 = auVar9._8_8_;
        uVar24 = uStack_65b8;
        uStack_63d0 = 0;
        uStack_63c8 = 0;
        local_63e0._0_4_ = auVar9._0_4_;
        local_63e0._4_4_ = auVar9._4_4_;
        uStack_63d8._0_4_ = auVar9._8_4_;
        uStack_63d8._4_4_ = auVar9._12_4_;
        local_64c0._4_4_ = local_63e0._4_4_ + (float)local_64c0._4_4_;
        local_64c0._0_4_ = (float)local_63e0 + (float)local_64c0._0_4_;
        uStack_64b8._0_4_ = (float)uStack_63d8 + (float)uStack_6398;
        uStack_64b8._4_4_ = uStack_63d8._4_4_ + uStack_6398._4_4_;
        uStack_64b0._0_4_ = (float)uStack_6390 + 0.0;
        uStack_64b0._4_4_ = uStack_6390._4_4_ + 0.0;
        auVar244 = _local_64c0;
        uStack_64a8._0_4_ = (float)uStack_6388 + 0.0;
        uStack_64a8._4_4_ = fStack_6584 + 0.0;
        auVar4 = _local_64c0;
        local_4900 = ::_ps256_cephes_log_q2;
        local_3de0 = local_6540;
        uStack_3dd8 = uStack_6538;
        uStack_3dd0 = uStack_6530;
        uStack_3dc8 = uStack_6528;
        local_3e00[0] = 0.6933594;
        local_3e00[1] = 0.6933594;
        afStack_3df8[0] = 0.6933594;
        afStack_3df8[1] = 0.6933594;
        afStack_3df0[0] = 0.6933594;
        afStack_3df0[1] = 0.6933594;
        afStack_3de8[0] = 0.6933594;
        afStack_3de8[1] = 0.6933594;
        local_3e20 = local_64c0;
        uStack_3e18 = uStack_64b8;
        uStack_64b0 = auVar244._16_8_;
        uStack_3e10 = uStack_64b0;
        uStack_64a8 = auVar4._24_8_;
        uStack_3e08 = uStack_64a8;
        auVar80._8_4_ = 0.6933594;
        auVar80._12_4_ = 0.6933594;
        auVar80._0_4_ = 0.6933594;
        auVar80._4_4_ = 0.6933594;
        auVar80._16_4_ = 0.6933594;
        auVar80._20_4_ = 0.6933594;
        auVar80._24_4_ = 0.6933594;
        auVar80._28_4_ = 0.6933594;
        auVar6 = vfmadd213ps_fma(auVar80,_local_6540,auVar4);
        local_64c0 = auVar6._0_8_;
        local_4ee0 = local_64c0;
        uStack_64b8 = auVar6._8_8_;
        uStack_4ed8 = uStack_64b8;
        uStack_4ed0 = 0;
        uStack_4ec8 = 0;
        local_4f00 = local_6520._0_8_;
        uStack_4ef8 = local_6520._8_8_;
        uStack_4ef0 = local_6520._16_8_;
        uStack_4ee8 = local_6520._24_8_;
        _local_65c0 = vorps_avx(local_6520,ZEXT1632(auVar6));
        local_6800 = local_65c0;
        uStack_67f8 = uStack_65b8;
        uStack_67f0 = uStack_65b0;
        uStack_67e8 = uStack_65a8;
        local_5e54 = 0x3f800000;
        local_22e0 = 0x3f800000;
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        local_2300 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        auStack_22f0 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        local_6820 = local_2300._0_8_;
        uStack_6818 = local_2300._8_8_;
        uStack_6810 = auStack_22f0._0_8_;
        uStack_6808 = auStack_22f0._8_8_;
        local_5e58 = 0x40000000;
        local_22a0 = 0x40000000;
        auVar9 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x40000000),0x20);
        local_22c0 = vinsertps_avx(auVar9,ZEXT416(0x40000000),0x30);
        auVar9 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x40000000),0x20);
        auStack_22b0 = vinsertps_avx(auVar9,ZEXT416(0x40000000),0x30);
        local_6840 = local_22c0._0_8_;
        uStack_6838 = local_22c0._8_8_;
        uStack_6830 = auStack_22b0._0_8_;
        uStack_6828 = auStack_22b0._8_8_;
        local_67c0._0_4_ = local_65c0._0_4_;
        local_67c0._4_4_ = local_65c0._4_4_;
        uStack_67b8._0_4_ = local_65c0._8_4_;
        uStack_67b8._4_4_ = local_65c0._12_4_;
        uStack_67b0._0_4_ = local_65c0._16_4_;
        uStack_67b0._4_4_ = local_65c0._20_4_;
        uStack_67a8._0_4_ = local_65c0._24_4_;
        uStack_67a8._4_4_ = local_65c0._28_4_;
        uStack_5d44 = uStack_67a8._4_4_;
        local_67e0._0_4_ = local_22c0._0_4_;
        local_67e0._4_4_ = local_22c0._4_4_;
        uStack_67d8._0_4_ = local_22c0._8_4_;
        uStack_67d8._4_4_ = local_22c0._12_4_;
        uStack_67d0._0_4_ = auStack_22b0._0_4_;
        uStack_67d0._4_4_ = auStack_22b0._4_4_;
        uStack_67c8._0_4_ = auStack_22b0._8_4_;
        local_5d60 = (float)local_67e0 * (float)local_67c0;
        fStack_5d5c = local_67e0._4_4_ * local_67c0._4_4_;
        fStack_5d58 = (float)uStack_67d8 * (float)uStack_67b8;
        fStack_5d54 = uStack_67d8._4_4_ * uStack_67b8._4_4_;
        fStack_5d50 = (float)uStack_67d0 * (float)uStack_67b0;
        fStack_5d4c = uStack_67d0._4_4_ * uStack_67b0._4_4_;
        fStack_5d48 = (float)uStack_67c8 * (float)uStack_67a8;
        local_5b24 = 0x3f800000;
        local_2420 = 0x3f800000;
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        local_2440 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        auStack_2430 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        local_5d80._0_4_ = local_2440._0_4_;
        local_5d20 = (float)local_5d80;
        local_5d80._4_4_ = local_2440._4_4_;
        fStack_5d1c = local_5d80._4_4_;
        uStack_5d78._0_4_ = local_2440._8_4_;
        fStack_5d18 = (float)uStack_5d78;
        uStack_5d78._4_4_ = local_2440._12_4_;
        fStack_5d14 = uStack_5d78._4_4_;
        uStack_5d70._0_4_ = auStack_2430._0_4_;
        fStack_5d10 = (float)uStack_5d70;
        uStack_5d70._4_4_ = auStack_2430._4_4_;
        fStack_5d0c = uStack_5d70._4_4_;
        uStack_5d68._0_4_ = auStack_2430._8_4_;
        fStack_5d08 = (float)uStack_5d68;
        uStack_5d68._4_4_ = auStack_2430._12_4_;
        fStack_5d04 = uStack_5d68._4_4_;
        local_5580 = ZEXT1632(ZEXT816(0) << 0x40);
        local_5760 = 0;
        uStack_5758 = 0;
        uStack_5750 = 0;
        uStack_5748 = 0;
        local_5780 = CONCAT44(fStack_5d5c,local_5d60);
        uStack_5778 = CONCAT44(fStack_5d54,fStack_5d58);
        uStack_5770 = CONCAT44(fStack_5d4c,fStack_5d50);
        uStack_5768 = CONCAT44(uStack_67a8._4_4_,fStack_5d48);
        auVar35._8_8_ = uStack_5778;
        auVar35._0_8_ = local_5780;
        auVar35._16_8_ = uStack_5770;
        auVar35._24_8_ = uStack_5768;
        auVar4 = vsubps_avx(ZEXT832(0),auVar35);
        local_5c20._0_8_ = auVar4._0_8_;
        local_2f20 = local_5c20._0_8_;
        local_5c20._8_8_ = auVar4._8_8_;
        uStack_2f18 = local_5c20._8_8_;
        local_5c20._16_8_ = auVar4._16_8_;
        uStack_2f10 = local_5c20._16_8_;
        local_5c20._24_8_ = auVar4._24_8_;
        uStack_2f08 = local_5c20._24_8_;
        auVar119._8_8_ = 0x42b0c0a542b0c0a5;
        auVar119._0_8_ = 0x42b0c0a542b0c0a5;
        auVar119._16_8_ = 0x42b0c0a542b0c0a5;
        auVar119._24_8_ = 0x42b0c0a542b0c0a5;
        auVar4 = vminps_avx(auVar4,auVar119);
        local_5c20._0_8_ = auVar4._0_8_;
        local_5460 = local_5c20._0_8_;
        local_5c20._8_8_ = auVar4._8_8_;
        uStack_5458 = local_5c20._8_8_;
        local_5c20._16_8_ = auVar4._16_8_;
        uStack_5450 = local_5c20._16_8_;
        local_5c20._24_8_ = auVar4._24_8_;
        uStack_5448 = local_5c20._24_8_;
        auVar40._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar40._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar40._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar246 = vmaxps_avx(auVar4,auVar40);
        local_4b00 = local_5c20;
        local_4a68 = ::_ps256_cephes_LOG2EF;
        local_4a70 = ::_ps256_0p5;
        local_5c20._0_8_ = auVar246._0_8_;
        local_3840 = local_5c20._0_8_;
        local_5c20._8_8_ = auVar246._8_8_;
        uStack_3838 = local_5c20._8_8_;
        local_5c20._16_8_ = auVar246._16_8_;
        uStack_3830 = local_5c20._16_8_;
        local_5c20._24_8_ = auVar246._24_8_;
        uStack_3828 = local_5c20._24_8_;
        local_3860[0] = 1.442695;
        local_3860[1] = 1.442695;
        afStack_3858[0] = 1.442695;
        afStack_3858[1] = 1.442695;
        afStack_3850[0] = 1.442695;
        afStack_3850[1] = 1.442695;
        afStack_3848[0] = 1.442695;
        afStack_3848[1] = 1.442695;
        local_3880[0] = 0.5;
        local_3880[1] = 0.5;
        afStack_3878[0] = 0.5;
        afStack_3878[1] = 0.5;
        afStack_3870[0] = 0.5;
        afStack_3870[1] = 0.5;
        afStack_3868[0] = 0.5;
        afStack_3868[1] = 0.5;
        auVar95._8_4_ = 1.442695;
        auVar95._12_4_ = 1.442695;
        auVar95._0_4_ = 1.442695;
        auVar95._4_4_ = 1.442695;
        auVar95._16_4_ = 1.442695;
        auVar95._20_4_ = 1.442695;
        auVar95._24_4_ = 1.442695;
        auVar95._28_4_ = 1.442695;
        auVar94._8_4_ = 0.5;
        auVar94._12_4_ = 0.5;
        auVar94._0_4_ = 0.5;
        auVar94._4_4_ = 0.5;
        auVar94._16_4_ = 0.5;
        auVar94._20_4_ = 0.5;
        auVar94._24_4_ = 0.5;
        auVar94._28_4_ = 0.5;
        auVar9 = vfmadd213ps_fma(auVar95,auVar246,auVar94);
        auVar8 = vroundps_avx(ZEXT1632(auVar9),1);
        auVar4 = vcmpps_avx(ZEXT1632(auVar9),auVar8,1);
        local_5cc0._0_8_ = auVar4._0_8_;
        local_5120 = local_5cc0._0_8_;
        local_5cc0._8_8_ = auVar4._8_8_;
        uStack_5118 = local_5cc0._8_8_;
        local_5cc0._16_8_ = auVar4._16_8_;
        uStack_5110 = local_5cc0._16_8_;
        local_5cc0._24_8_ = auVar4._24_8_;
        uStack_5108 = local_5cc0._24_8_;
        local_5140 = 0x3f8000003f800000;
        uStack_5138 = 0x3f8000003f800000;
        uStack_5130 = 0x3f8000003f800000;
        uStack_5128 = 0x3f8000003f800000;
        auVar48._8_8_ = 0x3f8000003f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._16_8_ = 0x3f8000003f800000;
        auVar48._24_8_ = 0x3f8000003f800000;
        local_5cc0 = vandps_avx(auVar4,auVar48);
        local_5c40 = auVar8._0_8_;
        local_57a0 = local_5c40;
        uStack_5c38 = auVar8._8_8_;
        uStack_5798 = uStack_5c38;
        uStack_5c30 = auVar8._16_8_;
        uStack_5790 = uStack_5c30;
        uStack_5c28 = auVar8._24_8_;
        uStack_5788 = uStack_5c28;
        local_57c0 = local_5cc0._0_8_;
        uStack_57b8 = local_5cc0._8_8_;
        uStack_57b0 = local_5cc0._16_8_;
        uStack_57a8 = local_5cc0._24_8_;
        local_5c60 = vsubps_avx(auVar8,local_5cc0);
        local_46e8 = local_5c60;
        local_46d8 = ::_ps256_cephes_exp_C1;
        local_30c0 = local_5c60._0_8_;
        uStack_30b8 = local_5c60._8_8_;
        uStack_30b0 = local_5c60._16_8_;
        uStack_30a8 = local_5c60._24_8_;
        local_30e0[0] = 0.6933594;
        local_30e0[1] = 0.6933594;
        afStack_30d8[0] = 0.6933594;
        afStack_30d8[1] = 0.6933594;
        afStack_30d0[0] = 0.6933594;
        afStack_30d0[1] = 0.6933594;
        afStack_30c8[0] = 0.6933594;
        afStack_30c8[1] = 0.6933594;
        local_3100 = local_5c20._0_8_;
        uStack_30f8 = local_5c20._8_8_;
        uStack_30f0 = local_5c20._16_8_;
        uStack_30e8 = local_5c20._24_8_;
        auVar114._8_4_ = 0.6933594;
        auVar114._12_4_ = 0.6933594;
        auVar114._0_4_ = 0.6933594;
        auVar114._4_4_ = 0.6933594;
        auVar114._16_4_ = 0.6933594;
        auVar114._20_4_ = 0.6933594;
        auVar114._24_4_ = 0.6933594;
        auVar114._28_4_ = 0.6933594;
        auVar9 = vfnmadd213ps_fma(auVar114,local_5c60,auVar246);
        local_46f0 = ::_ps256_cephes_exp_C2;
        local_3060 = local_5c60._0_8_;
        uStack_3058 = local_5c60._8_8_;
        uStack_3050 = local_5c60._16_8_;
        uStack_3048 = local_5c60._24_8_;
        local_3080[0] = -0.00021219444;
        local_3080[1] = -0.00021219444;
        afStack_3078[0] = -0.00021219444;
        afStack_3078[1] = -0.00021219444;
        afStack_3070[0] = -0.00021219444;
        afStack_3070[1] = -0.00021219444;
        afStack_3068[0] = -0.00021219444;
        afStack_3068[1] = -0.00021219444;
        local_5c20._0_8_ = auVar9._0_8_;
        local_30a0 = local_5c20._0_8_;
        local_5c20._8_8_ = auVar9._8_8_;
        uStack_3098 = local_5c20._8_8_;
        uStack_3090 = 0;
        uStack_3088 = 0;
        auVar115._8_4_ = -0.00021219444;
        auVar115._12_4_ = -0.00021219444;
        auVar115._0_4_ = -0.00021219444;
        auVar115._4_4_ = -0.00021219444;
        auVar115._16_4_ = -0.00021219444;
        auVar115._20_4_ = -0.00021219444;
        auVar115._24_4_ = -0.00021219444;
        auVar115._28_4_ = -0.00021219444;
        auVar9 = vfnmadd213ps_fma(auVar115,local_5c60,ZEXT1632(auVar9));
        auVar254 = ZEXT1632(auVar9);
        local_5c20._0_8_ = auVar9._0_8_;
        local_5bc0 = local_5c20._0_8_;
        local_5c20._8_8_ = auVar9._8_8_;
        uStack_5bb8 = local_5c20._8_8_;
        uStack_5bb0 = 0;
        uStack_5ba8 = 0;
        local_5ba0._0_4_ = auVar9._0_4_;
        local_5ba0._4_4_ = auVar9._4_4_;
        uStack_5b98._0_4_ = auVar9._8_4_;
        uStack_5b98._4_4_ = auVar9._12_4_;
        local_5c40._4_4_ = local_5ba0._4_4_ * local_5ba0._4_4_;
        local_5c40._0_4_ = (float)local_5ba0 * (float)local_5ba0;
        local_3620 = local_5c40;
        uStack_5c38._0_4_ = (float)uStack_5b98 * (float)uStack_5b98;
        uStack_5c38._4_4_ = uStack_5b98._4_4_ * uStack_5b98._4_4_;
        auVar1 = _local_5c40;
        _local_5c40 = ZEXT1632(_local_5c40);
        auVar36 = _local_5c40;
        uStack_5cd8 = 0x3950696739506967;
        local_5ce0 = (undefined1  [8])0x3950696739506967;
        uStack_5cd0 = 0x3950696739506967;
        uStack_5cc8 = 0x3950696739506967;
        local_4af0 = local_5ce0;
        local_4a88 = ::_ps256_cephes_exp_p1;
        local_37e0 = 0x3950696739506967;
        uStack_37d8 = 0x3950696739506967;
        uStack_37d0 = 0x3950696739506967;
        uStack_37c8 = 0x3950696739506967;
        local_3800 = local_5c20._0_8_;
        uStack_37f8 = local_5c20._8_8_;
        uStack_37f0 = 0;
        uStack_37e8 = 0;
        local_3820[0] = 0.0013981999;
        local_3820[1] = 0.0013981999;
        afStack_3818[0] = 0.0013981999;
        afStack_3818[1] = 0.0013981999;
        afStack_3810[0] = 0.0013981999;
        afStack_3810[1] = 0.0013981999;
        afStack_3808[0] = 0.0013981999;
        afStack_3808[1] = 0.0013981999;
        auVar96._8_4_ = 0.0013981999;
        auVar96._12_4_ = 0.0013981999;
        auVar96._0_4_ = 0.0013981999;
        auVar96._4_4_ = 0.0013981999;
        auVar96._16_4_ = 0.0013981999;
        auVar96._20_4_ = 0.0013981999;
        auVar96._24_4_ = 0.0013981999;
        auVar96._28_4_ = 0.0013981999;
        auVar9 = vfmadd213ps_fma(auVar254,_local_5ce0,auVar96);
        local_4aa0 = ::_ps256_cephes_exp_p2;
        local_5ce0 = auVar9._0_8_;
        local_3780 = local_5ce0;
        uStack_5cd8 = auVar9._8_8_;
        uStack_3778 = uStack_5cd8;
        uStack_3770 = 0;
        uStack_3768 = 0;
        local_37a0 = local_5c20._0_8_;
        uStack_3798 = local_5c20._8_8_;
        uStack_3790 = 0;
        uStack_3788 = 0;
        local_37c0[0] = 0.008333452;
        local_37c0[1] = 0.008333452;
        afStack_37b8[0] = 0.008333452;
        afStack_37b8[1] = 0.008333452;
        afStack_37b0[0] = 0.008333452;
        afStack_37b0[1] = 0.008333452;
        afStack_37a8[0] = 0.008333452;
        afStack_37a8[1] = 0.008333452;
        auVar97._8_4_ = 0.008333452;
        auVar97._12_4_ = 0.008333452;
        auVar97._0_4_ = 0.008333452;
        auVar97._4_4_ = 0.008333452;
        auVar97._16_4_ = 0.008333452;
        auVar97._20_4_ = 0.008333452;
        auVar97._24_4_ = 0.008333452;
        auVar97._28_4_ = 0.008333452;
        auVar9 = vfmadd213ps_fma(auVar254,ZEXT1632(auVar9),auVar97);
        local_4ab8 = ::_ps256_cephes_exp_p3;
        local_5ce0 = auVar9._0_8_;
        local_3720 = local_5ce0;
        uStack_5cd8 = auVar9._8_8_;
        uStack_3718 = uStack_5cd8;
        uStack_3710 = 0;
        uStack_3708 = 0;
        local_3740 = local_5c20._0_8_;
        uStack_3738 = local_5c20._8_8_;
        uStack_3730 = 0;
        uStack_3728 = 0;
        local_3760[0] = 0.041665796;
        local_3760[1] = 0.041665796;
        afStack_3758[0] = 0.041665796;
        afStack_3758[1] = 0.041665796;
        afStack_3750[0] = 0.041665796;
        afStack_3750[1] = 0.041665796;
        afStack_3748[0] = 0.041665796;
        afStack_3748[1] = 0.041665796;
        auVar98._8_4_ = 0.041665796;
        auVar98._12_4_ = 0.041665796;
        auVar98._0_4_ = 0.041665796;
        auVar98._4_4_ = 0.041665796;
        auVar98._16_4_ = 0.041665796;
        auVar98._20_4_ = 0.041665796;
        auVar98._24_4_ = 0.041665796;
        auVar98._28_4_ = 0.041665796;
        auVar9 = vfmadd213ps_fma(auVar254,ZEXT1632(auVar9),auVar98);
        local_4ad0 = ::_ps256_cephes_exp_p4;
        local_5ce0 = auVar9._0_8_;
        local_36c0 = local_5ce0;
        uStack_5cd8 = auVar9._8_8_;
        uStack_36b8 = uStack_5cd8;
        uStack_36b0 = 0;
        uStack_36a8 = 0;
        local_36e0 = local_5c20._0_8_;
        uStack_36d8 = local_5c20._8_8_;
        uStack_36d0 = 0;
        uStack_36c8 = 0;
        local_3700[0] = 0.16666666;
        local_3700[1] = 0.16666666;
        afStack_36f8[0] = 0.16666666;
        afStack_36f8[1] = 0.16666666;
        afStack_36f0[0] = 0.16666666;
        afStack_36f0[1] = 0.16666666;
        afStack_36e8[0] = 0.16666666;
        afStack_36e8[1] = 0.16666666;
        auVar99._8_4_ = 0.16666666;
        auVar99._12_4_ = 0.16666666;
        auVar99._0_4_ = 0.16666666;
        auVar99._4_4_ = 0.16666666;
        auVar99._16_4_ = 0.16666666;
        auVar99._20_4_ = 0.16666666;
        auVar99._24_4_ = 0.16666666;
        auVar99._28_4_ = 0.16666666;
        auVar9 = vfmadd213ps_fma(auVar254,ZEXT1632(auVar9),auVar99);
        local_4ae8 = ::_ps256_cephes_exp_p5;
        local_5ce0 = auVar9._0_8_;
        local_3660 = local_5ce0;
        uStack_5cd8 = auVar9._8_8_;
        uStack_3658 = uStack_5cd8;
        uStack_3650 = 0;
        uStack_3648 = 0;
        local_3680 = local_5c20._0_8_;
        uStack_3678 = local_5c20._8_8_;
        uStack_3670 = 0;
        uStack_3668 = 0;
        local_36a0[0] = 0.5;
        local_36a0[1] = 0.5;
        afStack_3698[0] = 0.5;
        afStack_3698[1] = 0.5;
        afStack_3690[0] = 0.5;
        afStack_3690[1] = 0.5;
        afStack_3688[0] = 0.5;
        afStack_3688[1] = 0.5;
        auVar100._8_4_ = 0.5;
        auVar100._12_4_ = 0.5;
        auVar100._0_4_ = 0.5;
        auVar100._4_4_ = 0.5;
        auVar100._16_4_ = 0.5;
        auVar100._20_4_ = 0.5;
        auVar100._24_4_ = 0.5;
        auVar100._28_4_ = 0.5;
        auVar9 = vfmadd213ps_fma(auVar254,ZEXT1632(auVar9),auVar100);
        local_4af8 = local_5c40;
        local_5ce0 = auVar9._0_8_;
        local_3600 = local_5ce0;
        uStack_5cd8 = auVar9._8_8_;
        uStack_35f8 = uStack_5cd8;
        uStack_35f0 = 0;
        uStack_35e8 = 0;
        uStack_5c38 = auVar1._8_8_;
        uStack_3618 = uStack_5c38;
        uStack_3610 = 0;
        uStack_3608 = 0;
        local_3640 = local_5c20._0_8_;
        uStack_3638 = local_5c20._8_8_;
        uStack_3630 = 0;
        uStack_3628 = 0;
        auVar9 = vfmadd213ps_fma(auVar36,ZEXT1632(auVar9),auVar254);
        local_5ce0 = auVar9._0_8_;
        uVar25 = local_5ce0;
        uStack_5cd8 = auVar9._8_8_;
        uVar26 = uStack_5cd8;
        uStack_5b50 = 0;
        uStack_5b48 = 0;
        local_5b80 = 0x3f8000003f800000;
        uStack_5b78 = 0x3f8000003f800000;
        uStack_5b70 = 0x3f8000003f800000;
        uStack_5b68 = 0x3f8000003f800000;
        local_5b60._0_4_ = auVar9._0_4_;
        local_5b60._4_4_ = auVar9._4_4_;
        uStack_5b58._0_4_ = auVar9._8_4_;
        uStack_5b58._4_4_ = auVar9._12_4_;
        local_5ce0._4_4_ = local_5b60._4_4_ + 1.0;
        local_5ce0._0_4_ = (float)local_5b60 + 1.0;
        uStack_5cd8._0_4_ = (float)uStack_5b58 + 1.0;
        uStack_5cd8._4_4_ = uStack_5b58._4_4_ + 1.0;
        uStack_5cd0._0_4_ = 0x3f800000;
        uStack_5cd0._4_4_ = 0x3f800000;
        auVar244 = _local_5ce0;
        uStack_5cc8._0_4_ = 0x3f800000;
        uStack_5cc8._4_4_ = 0x3f800000;
        auVar4 = _local_5ce0;
        local_2e60._0_4_ = local_5c60._0_4_;
        local_2e60._4_4_ = local_5c60._4_4_;
        uStack_2e58._0_4_ = local_5c60._8_4_;
        uStack_2e58._4_4_ = local_5c60._12_4_;
        uStack_2e50._0_4_ = local_5c60._16_4_;
        uStack_2e50._4_4_ = local_5c60._20_4_;
        uStack_2e48._0_4_ = local_5c60._24_4_;
        uStack_2e48._4_4_ = local_5c60._28_4_;
        local_5c80 = CONCAT44((int)local_2e60._4_4_,(int)(float)local_2e60);
        uStack_5c78 = CONCAT44((int)uStack_2e58._4_4_,(int)(float)uStack_2e58);
        uStack_5c70 = CONCAT44((int)uStack_2e50._4_4_,(int)(float)uStack_2e50);
        uStack_5c68 = CONCAT44((int)uStack_2e48._4_4_,(int)(float)uStack_2e48);
        local_2c20 = local_5c80;
        uStack_2c18 = uStack_5c78;
        uStack_2c10 = uStack_5c70;
        uStack_2c08 = uStack_5c68;
        local_2cc0 = local_5c80;
        uStack_2cb8 = uStack_5c78;
        uStack_2cb0 = uStack_5c70;
        uStack_2ca8 = uStack_5c68;
        local_2ce0 = 0x7f0000007f;
        uStack_2cd8 = 0x7f0000007f;
        uStack_2cd0 = 0x7f0000007f;
        uStack_2cc8 = 0x7f0000007f;
        local_2c70 = 0x7f0000007f;
        uStack_2c68 = 0x7f0000007f;
        local_2c80 = 0x7f0000007f;
        uStack_2c78 = 0x7f0000007f;
        local_25d0 = local_5c80;
        uStack_25c8 = uStack_5c78;
        local_25e0 = 0x7f0000007f;
        uStack_25d8 = 0x7f0000007f;
        auVar129._8_8_ = uStack_5c78;
        auVar129._0_8_ = local_5c80;
        auVar128._8_8_ = 0x7f0000007f;
        auVar128._0_8_ = 0x7f0000007f;
        local_2c50 = vpaddd_avx(auVar129,auVar128);
        local_25f0 = uStack_5c70;
        uStack_25e8 = uStack_5c68;
        local_2600 = 0x7f0000007f;
        uStack_25f8 = 0x7f0000007f;
        auVar127._8_8_ = uStack_5c68;
        auVar127._0_8_ = uStack_5c70;
        auVar126._8_8_ = 0x7f0000007f;
        auVar126._0_8_ = 0x7f0000007f;
        local_2c60 = vpaddd_avx(auVar127,auVar126);
        local_2d00 = local_2c50._0_8_;
        uStack_2cf8 = local_2c50._8_8_;
        uStack_2cf0 = local_2c60._0_8_;
        uStack_2ce8 = local_2c60._8_8_;
        local_2ca0 = local_2c50._0_8_;
        uStack_2c98 = local_2c50._8_8_;
        uStack_2c90 = local_2c60._0_8_;
        uStack_2c88 = local_2c60._8_8_;
        local_28a0 = local_2c50._0_8_;
        uStack_2898 = local_2c50._8_8_;
        uStack_2890 = local_2c60._0_8_;
        uStack_2888 = local_2c60._8_8_;
        local_28a4 = 0x17;
        local_2920 = local_2c50._0_8_;
        uStack_2918 = local_2c50._8_8_;
        uStack_2910 = local_2c60._0_8_;
        uStack_2908 = local_2c60._8_8_;
        local_24d0 = local_2c50._0_8_;
        uStack_24c8 = local_2c50._8_8_;
        local_24d4 = 0x17;
        local_28c0 = vpslld_avx(local_2c50,ZEXT416(0x17));
        local_24f0 = local_2c60._0_8_;
        uStack_24e8 = local_2c60._8_8_;
        local_24f4 = 0x17;
        local_28d0 = vpslld_avx(local_2c60,ZEXT416(0x17));
        local_2940 = local_28c0._0_8_;
        uStack_2938 = local_28c0._8_8_;
        uStack_2930 = local_28d0._0_8_;
        uStack_2928 = local_28d0._8_8_;
        local_2900 = local_28c0._0_8_;
        uStack_28f8 = local_28c0._8_8_;
        uStack_28f0 = local_28d0._0_8_;
        uStack_28e8 = local_28d0._8_8_;
        local_5c80 = local_28c0._0_8_;
        uStack_5c78 = local_28c0._8_8_;
        uStack_5c70 = local_28d0._0_8_;
        uStack_5c68 = local_28d0._8_8_;
        local_26e0 = local_28c0._0_8_;
        uStack_26d8 = local_28c0._8_8_;
        uStack_26d0 = local_28d0._0_8_;
        uStack_26c8 = local_28d0._8_8_;
        local_5d00 = local_28c0._0_8_;
        uStack_5cf8 = local_28c0._8_8_;
        uStack_5cf0 = local_28d0._0_8_;
        uStack_5ce8 = local_28d0._8_8_;
        local_5be0 = local_5ce0;
        uStack_5bd8 = uStack_5cd8;
        uStack_5cd0 = auVar244._16_8_;
        uStack_5bd0 = uStack_5cd0;
        uStack_5cc8 = auVar4._24_8_;
        uStack_5bc8 = uStack_5cc8;
        local_5c00._0_4_ = local_28c0._0_4_;
        local_5c00._4_4_ = local_28c0._4_4_;
        uStack_5bf8._0_4_ = local_28c0._8_4_;
        uStack_5bf8._4_4_ = local_28c0._12_4_;
        uStack_5bf0._0_4_ = local_28d0._0_4_;
        uStack_5bf0._4_4_ = local_28d0._4_4_;
        uStack_5be8._0_4_ = local_28d0._8_4_;
        local_5ce0._0_4_ = ((float)local_5b60 + 1.0) * (float)local_5c00;
        local_5ce0._4_4_ = (local_5b60._4_4_ + 1.0) * local_5c00._4_4_;
        uStack_5bf8._0_4_ = ((float)uStack_5b58 + 1.0) * (float)uStack_5bf8;
        uStack_5bf8._4_4_ = (uStack_5b58._4_4_ + 1.0) * uStack_5bf8._4_4_;
        uStack_5cd8._0_4_ = (float)uStack_5bf8;
        uStack_5cd8._4_4_ = uStack_5bf8._4_4_;
        uStack_5cd0._0_4_ = (float)uStack_5bf0 * 1.0;
        uStack_5cd0._4_4_ = uStack_5bf0._4_4_ * 1.0;
        auVar244 = _local_5ce0;
        uStack_5cc8._0_4_ = (float)uStack_5be8 * 1.0;
        uStack_5cc8._4_4_ = 0x3f800000;
        auVar35 = _local_5ce0;
        local_5d40 = local_5ce0;
        uStack_5d38 = uStack_5cd8;
        uStack_5cd0 = auVar244._16_8_;
        uStack_5d30 = uStack_5cd0;
        uStack_5cc8 = auVar35._24_8_;
        uStack_5d28 = uStack_5cc8;
        local_5880 = (float)local_5d80 + (float)local_5ce0._0_4_;
        fStack_587c = local_5d80._4_4_ + (float)local_5ce0._4_4_;
        fStack_5878 = (float)uStack_5d78 + (float)uStack_5bf8;
        fStack_5874 = uStack_5d78._4_4_ + uStack_5bf8._4_4_;
        fStack_5870 = (float)uStack_5d70 + (float)uStack_5bf0 * 1.0;
        fStack_586c = uStack_5d70._4_4_ + uStack_5bf0._4_4_ * 1.0;
        fStack_5868 = (float)uStack_5d68 + (float)uStack_5be8 * 1.0;
        fStack_5864 = uStack_5d68._4_4_ + 1.0;
        auVar33._16_4_ = (float)uStack_5d70;
        auVar33._0_16_ = local_2440;
        auVar33._20_4_ = uStack_5d70._4_4_;
        auVar33._24_4_ = (float)uStack_5d68;
        auVar33._28_4_ = uStack_5d68._4_4_;
        auVar5._4_4_ = fStack_587c;
        auVar5._0_4_ = local_5880;
        auVar5._8_4_ = fStack_5878;
        auVar5._12_4_ = fStack_5874;
        auVar5._16_4_ = fStack_5870;
        auVar5._20_4_ = fStack_586c;
        auVar5._24_4_ = fStack_5868;
        auVar5._28_4_ = fStack_5864;
        auVar4 = vrcpps_avx(auVar5);
        auVar246._4_4_ = local_5d80._4_4_ * auVar4._4_4_;
        auVar246._0_4_ = (float)local_5d80 * auVar4._0_4_;
        auVar246._8_4_ = (float)uStack_5d78 * auVar4._8_4_;
        auVar246._12_4_ = uStack_5d78._4_4_ * auVar4._12_4_;
        auVar246._16_4_ = (float)uStack_5d70 * auVar4._16_4_;
        auVar246._20_4_ = uStack_5d70._4_4_ * auVar4._20_4_;
        auVar246._24_4_ = (float)uStack_5d68 * auVar4._24_4_;
        auVar246._28_4_ = uStack_5d68._4_4_;
        auVar9 = vfmsub213ps_fma(auVar246,auVar5,auVar33);
        auVar9 = vfnmadd213ps_fma(ZEXT1632(auVar9),auVar4,auVar246);
        local_5e20 = local_22c0._0_8_;
        uStack_5e18 = local_22c0._8_8_;
        uStack_5e10 = auStack_22b0._0_8_;
        uStack_5e08 = auStack_22b0._8_8_;
        local_5e00 = ZEXT1632(auVar9);
        auVar8._16_8_ = auStack_22b0._0_8_;
        auVar8._0_16_ = local_22c0;
        auVar8._24_8_ = auStack_22b0._8_8_;
        local_5e40._0_4_ = local_2300._0_4_;
        local_5e40._4_4_ = local_2300._4_4_;
        uStack_5e38._0_4_ = local_2300._8_4_;
        uStack_5e38._4_4_ = local_2300._12_4_;
        uStack_5e30._0_4_ = auStack_22f0._0_4_;
        uStack_5e30._4_4_ = auStack_22f0._4_4_;
        uStack_5e28._0_4_ = auStack_22f0._8_4_;
        uStack_5e28._4_4_ = auStack_22f0._12_4_;
        auVar253._0_4_ = (uint)local_5e40 ^ (uint)DAT_01c7a1e0;
        auVar253._4_4_ = local_5e40._4_4_ ^ DAT_01c7a1e0._4_4_;
        auVar253._8_4_ = (uint)uStack_5e38 ^ DAT_01c7a1e0._8_4_;
        auVar253._12_4_ = uStack_5e38._4_4_ ^ DAT_01c7a1e0._12_4_;
        auVar253._16_4_ = (uint)uStack_5e30 ^ DAT_01c7a1e0._16_4_;
        auVar253._20_4_ = uStack_5e30._4_4_ ^ DAT_01c7a1e0._20_4_;
        auVar253._24_4_ = (uint)uStack_5e28 ^ DAT_01c7a1e0._24_4_;
        auVar253._28_4_ = uStack_5e28._4_4_ ^ DAT_01c7a1e0._28_4_;
        auVar9 = vfmadd213ps_fma(auVar8,local_5e00,auVar253);
        local_6900._0_4_ = auVar239._0_4_;
        local_6900._4_4_ = auVar239._4_4_;
        fStack_68f8 = auVar239._8_4_;
        fStack_68f4 = auVar239._12_4_;
        fStack_68f0 = auVar239._16_4_;
        fStack_68ec = auVar239._20_4_;
        fStack_68e8 = (float)uStack_6c28;
        uStack_68e4 = (undefined4)((ulong)uStack_6c28 >> 0x20);
        local_6920._0_4_ = auVar9._0_4_;
        local_6920._4_4_ = auVar9._4_4_;
        fStack_6918 = auVar9._8_4_;
        fStack_6914 = auVar9._12_4_;
        local_6ec0 = CONCAT44((float)local_6900._4_4_ * (float)local_6920._4_4_,
                              (float)local_6900._0_4_ * (float)local_6920._0_4_);
        uStack_6eb8 = CONCAT44(fStack_68f4 * fStack_6914,fStack_68f8 * fStack_6918);
        uStack_6eb0 = CONCAT44(fStack_68ec * 0.0,fStack_68f0 * 0.0);
        uStack_6ea8 = CONCAT44(uStack_68e4,fStack_68e8 * 0.0);
        local_6bc8 = local_6e40;
        local_6c00 = local_6ec0;
        uStack_6bf8 = uStack_6eb8;
        uStack_6bf0 = uStack_6eb0;
        uStack_6be8 = uStack_6ea8;
        auVar4._8_8_ = uStack_6eb8;
        auVar4._0_8_ = local_6ec0;
        auVar4._16_8_ = uStack_6eb0;
        auVar4._24_8_ = uStack_6ea8;
        *local_6e40 = auVar4;
        local_6e40 = local_6e40 + 1;
        _local_6920 = ZEXT1632(auVar9);
        _local_6900 = auVar10;
        local_67e0 = local_22c0._0_8_;
        uStack_67d8 = local_22c0._8_8_;
        uStack_67d0 = auStack_22b0._0_8_;
        uStack_67c8 = auStack_22b0._8_8_;
        local_67c0 = local_65c0;
        uStack_67b8 = uStack_65b8;
        uStack_67b0 = uStack_65b0;
        uStack_67a8 = uStack_65a8;
        _local_64c0 = ZEXT1632(auVar6);
        local_6440 = uVar21;
        uStack_6438 = uVar22;
        local_6400 = local_6420;
        uStack_63f8 = uStack_6418;
        uStack_63f0 = uStack_6410;
        uStack_63e8 = uStack_6408;
        local_63e0 = uVar23;
        uStack_63d8 = uVar24;
        local_63a0 = local_6580._0_8_;
        uStack_6398 = local_6580._8_8_;
        uStack_6390 = local_6580._16_8_;
        uStack_6388 = local_6580._24_8_;
        local_6380 = uVar17;
        uStack_6378 = uVar18;
        uStack_6370 = uVar19;
        uStack_6368 = uVar20;
        local_6340 = uVar13;
        uStack_6338 = uVar14;
        uStack_6330 = uVar15;
        uStack_6328 = uVar16;
        local_6220 = local_2400._0_8_;
        uStack_6218 = local_2400._8_8_;
        uStack_6210 = auStack_23f0._0_8_;
        uStack_6208 = auStack_23f0._8_8_;
        _local_6000 = auVar41;
        local_5fc0 = local_6500;
        uStack_5fb8 = uStack_64f8;
        uStack_5fb0 = uStack_64f0;
        uStack_5fa8 = uStack_64e8;
        _local_5f60 = auVar49;
        local_5f40 = auVar247;
        local_5f20 = local_2800._0_8_;
        uStack_5f18 = local_2800._8_8_;
        uStack_5f10 = local_2810._0_8_;
        uStack_5f08 = local_2810._8_8_;
        local_5ec0 = local_5ee0;
        uStack_5eb8 = uStack_5ed8;
        uStack_5eb0 = uStack_5ed0;
        uStack_5ea8 = uStack_5ec8;
        local_5e80 = uVar11;
        uStack_5e78 = uVar12;
        local_5e40 = local_2300._0_8_;
        uStack_5e38 = local_2300._8_8_;
        uStack_5e30 = auStack_22f0._0_8_;
        uStack_5e28 = auStack_22f0._8_8_;
        local_5d80 = local_2440._0_8_;
        uStack_5d78 = local_2440._8_8_;
        uStack_5d70 = auStack_2430._0_8_;
        uStack_5d68 = auStack_2430._8_8_;
        _local_5ce0 = auVar35;
        local_5ca0 = local_6500;
        uStack_5c98 = uStack_64f8;
        uStack_5c90 = uStack_64f0;
        uStack_5c88 = uStack_64e8;
        _local_5c40 = auVar36;
        local_5c20 = auVar254;
        local_5c00 = local_28c0._0_8_;
        uStack_5bf8 = local_28c0._8_8_;
        uStack_5bf0 = local_28d0._0_8_;
        uStack_5be8 = local_28d0._8_8_;
        local_5ba0 = local_5bc0;
        uStack_5b98 = uStack_5bb8;
        uStack_5b90 = uStack_5bb0;
        uStack_5b88 = uStack_5ba8;
        local_5b60 = uVar25;
        uStack_5b58 = uVar26;
        local_5860 = local_5d20;
        fStack_585c = fStack_5d1c;
        fStack_5858 = fStack_5d18;
        fStack_5854 = fStack_5d14;
        fStack_5850 = fStack_5d10;
        fStack_584c = fStack_5d0c;
        fStack_5848 = fStack_5d08;
        fStack_5844 = fStack_5d04;
        local_5560 = local_5580;
        local_5500 = local_5540;
        local_5440 = local_5480;
        uStack_5438 = uStack_5478;
        uStack_5430 = uStack_5470;
        uStack_5428 = uStack_5468;
        local_4ae0 = local_4b00;
        local_4ad8 = local_4af0;
        local_4ac8 = local_4b00;
        local_4ac0 = local_4af0;
        local_4ab0 = local_4b00;
        local_4aa8 = local_4af0;
        local_4a98 = local_4b00;
        local_4a90 = local_4af0;
        local_4a80 = local_4b00;
        local_4a78 = local_4af0;
        local_4a60 = local_4b00;
        local_4a38 = local_4a58;
        local_4a30 = local_4a48;
        local_4a20 = local_4a58;
        local_4a18 = local_4a48;
        local_4a08 = local_4a58;
        local_4a00 = local_4a48;
        local_49f0 = local_4a58;
        local_49e8 = local_4a48;
        local_49d8 = local_4a58;
        local_49d0 = local_4a48;
        local_49b8 = local_4a58;
        local_48e0 = local_48f8;
        local_48d0 = local_4908;
        local_48c8 = local_48f0;
        local_48b8 = local_4908;
        local_48b0 = local_48f0;
        local_48a0 = local_4908;
        local_4898 = local_48f0;
        local_4888 = local_4908;
        local_4880 = local_48f0;
        local_4870 = local_4908;
        local_4868 = local_48f0;
        local_4858 = local_4908;
        local_4850 = local_48f0;
        local_4840 = local_4908;
        local_4838 = local_48f0;
        local_4828 = local_4908;
        local_4820 = local_48f0;
        local_46f8 = local_4b00;
        local_46e0 = local_4b00;
        local_46d0 = local_46e8;
        local_46c8 = local_4a58;
        local_46b0 = local_4a58;
        local_46a0 = local_46b8;
        local_4668 = local_48f0;
        local_2f00 = local_2f40;
        uStack_2ef8 = uStack_2f38;
        uStack_2ef0 = uStack_2f30;
        uStack_2ee8 = uStack_2f28;
        uStack_2ec8 = uStack_6c28;
        local_2e60 = local_5c60._0_8_;
        uStack_2e58 = local_5c60._8_8_;
        uStack_2e50 = local_5c60._16_8_;
        uStack_2e48 = local_5c60._24_8_;
        local_2e40 = local_5f80._0_8_;
        uStack_2e38 = local_5f80._8_8_;
        uStack_2e30 = local_5f80._16_8_;
        uStack_2e28 = local_5f80._24_8_;
        local_2c40 = local_4d40;
        uStack_2c38 = uStack_4d38;
        uStack_2c30 = uStack_4d30;
        uStack_2c28 = uStack_4d28;
        local_2b40 = local_4d40;
        uStack_2b38 = uStack_4d38;
        uStack_2b30 = uStack_4d30;
        uStack_2b28 = uStack_4d28;
        local_241c = local_2420;
        local_2418 = local_2420;
        local_2414 = local_2420;
        local_2410 = local_2420;
        local_240c = local_2420;
        local_2408 = local_2420;
        local_2404 = local_2420;
        local_23dc = local_23e0;
        local_23d8 = local_23e0;
        local_23d4 = local_23e0;
        local_23d0 = local_23e0;
        local_23cc = local_23e0;
        local_23c8 = local_23e0;
        local_23c4 = local_23e0;
        local_22dc = local_22e0;
        local_22d8 = local_22e0;
        local_22d4 = local_22e0;
        local_22d0 = local_22e0;
        local_22cc = local_22e0;
        local_22c8 = local_22e0;
        local_22c4 = local_22e0;
        local_229c = local_22a0;
        local_2298 = local_22a0;
        local_2294 = local_22a0;
        local_2290 = local_22a0;
        local_228c = local_22a0;
        local_2288 = local_22a0;
        local_2284 = local_22a0;
      }
      for (; local_6a20 = local_6c60, local_6e68 = local_6aa0, local_6e8c + 3 < local_6d2c;
          local_6e8c = local_6e8c + 4) {
        local_6b80 = local_6e40;
        local_6b70 = *(undefined8 *)*local_6e40;
        uStack_6b68 = *(undefined8 *)(*local_6e40 + 8);
        auVar2 = *(undefined1 (*) [16])*local_6e40;
        local_1500 = 0;
        uStack_14f8 = 0;
        local_1fd0 = 0x3f8000003f800000;
        uStack_1fc8 = 0x3f8000003f800000;
        local_1f0 = 0x42b0c0a542b0c0a5;
        uStack_1e8 = 0x42b0c0a542b0c0a5;
        auVar233._8_8_ = 0x42b0c0a542b0c0a5;
        auVar233._0_8_ = 0x42b0c0a542b0c0a5;
        auVar9 = vminps_avx(*(undefined1 (*) [16])*local_6e40,auVar233);
        local_1c30._0_8_ = auVar9._0_8_;
        local_1430 = local_1c30._0_8_;
        local_1c30._8_8_ = auVar9._8_8_;
        uStack_1428 = local_1c30._8_8_;
        local_1460 = 0xc2b0c0a5c2b0c0a5;
        uStack_1458 = 0xc2b0c0a5c2b0c0a5;
        auVar159._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar159._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar9,auVar159);
        local_1c30._0_8_ = auVar1._0_8_;
        uVar11 = local_1c30._0_8_;
        local_1c30._8_8_ = auVar1._8_8_;
        uVar12 = local_1c30._8_8_;
        local_1ba0 = 0x3fb8aa3b3fb8aa3b;
        uStack_1b98 = 0x3fb8aa3b3fb8aa3b;
        local_1b90._0_4_ = auVar1._0_4_;
        local_1b90._4_4_ = auVar1._4_4_;
        uStack_1b88._0_4_ = auVar1._8_4_;
        uStack_1b88._4_4_ = auVar1._12_4_;
        local_1c50._4_4_ = local_1b90._4_4_ * 1.442695;
        local_1c50._0_4_ = (float)local_1b90 * 1.442695;
        uStack_1c48._0_4_ = (float)uStack_1b88 * 1.442695;
        uStack_1c48._4_4_ = uStack_1b88._4_4_ * 1.442695;
        local_1b50 = local_1c50;
        uStack_1b48 = uStack_1c48;
        local_1b60 = 0x3f0000003f000000;
        uStack_1b58 = 0x3f0000003f000000;
        local_1c50._0_4_ = (float)local_1b90 * 1.442695 + 0.5;
        local_1c50._4_4_ = local_1b90._4_4_ * 1.442695 + 0.5;
        fVar245 = (float)uStack_1b88 * 1.442695 + 0.5;
        fVar248 = uStack_1b88._4_4_ * 1.442695 + 0.5;
        uStack_1c48._0_4_ = fVar245;
        uStack_1c48._4_4_ = fVar248;
        local_140 = local_1c50;
        uStack_138 = uStack_1c48;
        local_1c60._4_4_ = (int)(float)local_1c50._4_4_;
        local_1c60._0_4_ = (int)(float)local_1c50._0_4_;
        local_1c60._8_4_ = (int)fVar245;
        local_1c60._12_4_ = (int)fVar248;
        local_11c0 = local_1c60._0_8_;
        uStack_11b8 = local_1c60._8_8_;
        auVar177._8_8_ = local_1c60._8_8_;
        auVar177._0_8_ = local_1c60._0_8_;
        auVar6 = vcvtdq2ps_avx(auVar177);
        local_1c40 = auVar6._0_8_;
        local_c0 = local_1c40;
        uStack_1c38 = auVar6._8_8_;
        uStack_b8 = uStack_1c38;
        local_d0 = local_1c50;
        uStack_c8 = uStack_1c48;
        auVar237._8_8_ = uStack_1c48;
        auVar237._0_8_ = local_1c50;
        auVar9 = vcmpps_avx(auVar237,auVar6,1);
        local_1c80._0_8_ = auVar9._0_8_;
        local_1350 = local_1c80._0_8_;
        local_1c80._8_8_ = auVar9._8_8_;
        uStack_1348 = local_1c80._8_8_;
        local_1360 = 0x3f8000003f800000;
        uStack_1358 = 0x3f8000003f800000;
        auVar167._8_8_ = 0x3f8000003f800000;
        auVar167._0_8_ = 0x3f8000003f800000;
        local_1c80 = vpand_avx(auVar9,auVar167);
        local_1a70 = local_1c40;
        uStack_1a68 = uStack_1c38;
        local_1a80 = local_1c80._0_8_;
        uStack_1a78 = local_1c80._8_8_;
        _local_1c50 = vsubps_avx(auVar6,local_1c80);
        local_cb0 = local_1c50;
        local_ca0 = ::_ps_cephes_exp_C1;
        local_1020 = local_1c30;
        local_310 = local_1c50;
        uStack_308 = uStack_1c48;
        local_320[0] = 0.6933594;
        local_320[1] = 0.6933594;
        afStack_318[0] = 0.6933594;
        afStack_318[1] = 0.6933594;
        local_330 = local_1c30._0_8_;
        uStack_328 = local_1c30._8_8_;
        auVar225._8_4_ = 0.6933594;
        auVar225._12_4_ = 0.6933594;
        auVar225._0_4_ = 0.6933594;
        auVar225._4_4_ = 0.6933594;
        auVar9 = vfnmadd213ps_fma(auVar225,_local_1c50,auVar1);
        local_cb8 = ::_ps_cephes_exp_C2;
        local_2e0 = local_1c50;
        uStack_2d8 = uStack_1c48;
        local_2f0[0] = -0.00021219444;
        local_2f0[1] = -0.00021219444;
        afStack_2e8[0] = -0.00021219444;
        afStack_2e8[1] = -0.00021219444;
        local_1c30._0_8_ = auVar9._0_8_;
        local_300 = local_1c30._0_8_;
        local_1c30._8_8_ = auVar9._8_8_;
        uStack_2f8 = local_1c30._8_8_;
        auVar226._8_4_ = -0.00021219444;
        auVar226._12_4_ = -0.00021219444;
        auVar226._0_4_ = -0.00021219444;
        auVar226._4_4_ = -0.00021219444;
        local_1c30 = vfnmadd213ps_fma(auVar226,_local_1c50,auVar9);
        local_1bc0 = local_1c30._0_8_;
        uStack_1bb8 = local_1c30._8_8_;
        local_1bb0._0_4_ = local_1c30._0_4_;
        local_1bb0._4_4_ = local_1c30._4_4_;
        uStack_1ba8._0_4_ = local_1c30._8_4_;
        uStack_1ba8._4_4_ = local_1c30._12_4_;
        local_1c40._4_4_ = local_1bb0._4_4_ * local_1bb0._4_4_;
        local_1c40._0_4_ = (float)local_1bb0 * (float)local_1bb0;
        uStack_1c38._0_4_ = (float)uStack_1ba8 * (float)uStack_1ba8;
        uStack_1c38._4_4_ = uStack_1ba8._4_4_ * uStack_1ba8._4_4_;
        uStack_1c88 = 0x3950696739506967;
        local_1c90 = (undefined1  [8])0x3950696739506967;
        local_1010 = local_1c90;
        local_fa8 = ::_ps_cephes_exp_p1;
        local_730 = 0x3950696739506967;
        uStack_728 = 0x3950696739506967;
        local_740 = local_1c30._0_8_;
        uStack_738 = local_1c30._8_8_;
        local_750[0] = 0.0013981999;
        local_750[1] = 0.0013981999;
        afStack_748[0] = 0.0013981999;
        afStack_748[1] = 0.0013981999;
        auVar206._8_4_ = 0.0013981999;
        auVar206._12_4_ = 0.0013981999;
        auVar206._0_4_ = 0.0013981999;
        auVar206._4_4_ = 0.0013981999;
        auVar9 = vfmadd213ps_fma(local_1c30,_local_1c90,auVar206);
        local_fc0 = ::_ps_cephes_exp_p2;
        local_1c90 = auVar9._0_8_;
        local_700 = local_1c90;
        uStack_1c88 = auVar9._8_8_;
        uStack_6f8 = uStack_1c88;
        local_710 = local_1c30._0_8_;
        uStack_708 = local_1c30._8_8_;
        local_720[0] = 0.008333452;
        local_720[1] = 0.008333452;
        afStack_718[0] = 0.008333452;
        afStack_718[1] = 0.008333452;
        auVar207._8_4_ = 0.008333452;
        auVar207._12_4_ = 0.008333452;
        auVar207._0_4_ = 0.008333452;
        auVar207._4_4_ = 0.008333452;
        auVar9 = vfmadd213ps_fma(local_1c30,auVar9,auVar207);
        local_fd8 = ::_ps_cephes_exp_p3;
        local_1c90 = auVar9._0_8_;
        local_6d0 = local_1c90;
        uStack_1c88 = auVar9._8_8_;
        uStack_6c8 = uStack_1c88;
        local_6e0 = local_1c30._0_8_;
        uStack_6d8 = local_1c30._8_8_;
        local_6f0[0] = 0.041665796;
        local_6f0[1] = 0.041665796;
        afStack_6e8[0] = 0.041665796;
        afStack_6e8[1] = 0.041665796;
        auVar208._8_4_ = 0.041665796;
        auVar208._12_4_ = 0.041665796;
        auVar208._0_4_ = 0.041665796;
        auVar208._4_4_ = 0.041665796;
        auVar9 = vfmadd213ps_fma(local_1c30,auVar9,auVar208);
        local_ff0 = ::_ps_cephes_exp_p4;
        local_1c90 = auVar9._0_8_;
        local_6a0 = local_1c90;
        uStack_1c88 = auVar9._8_8_;
        uStack_698 = uStack_1c88;
        local_6b0 = local_1c30._0_8_;
        uStack_6a8 = local_1c30._8_8_;
        local_6c0[0] = 0.16666666;
        local_6c0[1] = 0.16666666;
        afStack_6b8[0] = 0.16666666;
        afStack_6b8[1] = 0.16666666;
        auVar209._8_4_ = 0.16666666;
        auVar209._12_4_ = 0.16666666;
        auVar209._0_4_ = 0.16666666;
        auVar209._4_4_ = 0.16666666;
        auVar9 = vfmadd213ps_fma(local_1c30,auVar9,auVar209);
        local_1008 = ::_ps_cephes_exp_p5;
        local_1c90 = auVar9._0_8_;
        local_670 = local_1c90;
        uStack_1c88 = auVar9._8_8_;
        uStack_668 = uStack_1c88;
        local_680 = local_1c30._0_8_;
        uStack_678 = local_1c30._8_8_;
        local_690[0] = 0.5;
        local_690[1] = 0.5;
        afStack_688[0] = 0.5;
        afStack_688[1] = 0.5;
        auVar210._8_4_ = 0.5;
        auVar210._12_4_ = 0.5;
        auVar210._0_4_ = 0.5;
        auVar210._4_4_ = 0.5;
        auVar9 = vfmadd213ps_fma(local_1c30,auVar9,auVar210);
        local_1018 = local_1c40;
        local_1c90 = auVar9._0_8_;
        local_640 = local_1c90;
        uStack_1c88 = auVar9._8_8_;
        uStack_638 = uStack_1c88;
        local_650 = local_1c40;
        uStack_648 = uStack_1c38;
        local_660 = local_1c30._0_8_;
        uStack_658 = local_1c30._8_8_;
        auVar9 = vfmadd213ps_fma(_local_1c40,auVar9,local_1c30);
        local_1c90 = auVar9._0_8_;
        uVar13 = local_1c90;
        uStack_1c88 = auVar9._8_8_;
        uVar14 = uStack_1c88;
        local_1b80 = 0x3f8000003f800000;
        uStack_1b78 = 0x3f8000003f800000;
        local_1b70._0_4_ = auVar9._0_4_;
        local_1b70._4_4_ = auVar9._4_4_;
        uStack_1b68._0_4_ = auVar9._8_4_;
        uStack_1b68._4_4_ = auVar9._12_4_;
        local_1c90._4_4_ = local_1b70._4_4_ + 1.0;
        local_1c90._0_4_ = (float)local_1b70 + 1.0;
        uStack_1c88._0_4_ = (float)uStack_1b68 + 1.0;
        uStack_1c88._4_4_ = uStack_1b68._4_4_ + 1.0;
        local_150._0_4_ = local_1c50._0_4_;
        local_150._4_4_ = local_1c50._4_4_;
        uStack_148._0_4_ = local_1c50._8_4_;
        uStack_148._4_4_ = local_1c50._12_4_;
        local_1c60._4_4_ = (int)local_150._4_4_;
        local_1c60._0_4_ = (int)(float)local_150;
        local_1c60._8_4_ = (int)(float)uStack_148;
        local_1c60._12_4_ = (int)uStack_148._4_4_;
        local_1c10 = local_1c60._0_8_;
        uStack_1c08 = local_1c60._8_8_;
        local_1f80 = 0x7f0000007f;
        uStack_1f78 = 0x7f0000007f;
        auVar139._8_8_ = local_1c60._8_8_;
        auVar139._0_8_ = local_1c60._0_8_;
        auVar138._8_8_ = 0x7f0000007f;
        auVar138._0_8_ = 0x7f0000007f;
        auVar9 = vpaddd_avx(auVar139,auVar138);
        local_1c60._0_8_ = auVar9._0_8_;
        local_1bf0 = local_1c60._0_8_;
        local_1c60._8_8_ = auVar9._8_8_;
        uStack_1be8 = local_1c60._8_8_;
        local_1bf4 = 0x17;
        local_1c60 = vpslld_avx(auVar9,ZEXT416(0x17));
        local_70 = local_1c60._0_8_;
        uStack_68 = local_1c60._8_8_;
        local_1ca0 = local_1c60._0_8_;
        uStack_1c98 = local_1c60._8_8_;
        local_1bd0 = local_1c90;
        uStack_1bc8 = uStack_1c88;
        local_1be0._0_4_ = local_1c60._0_4_;
        local_1be0._4_4_ = local_1c60._4_4_;
        uStack_1bd8._0_4_ = local_1c60._8_4_;
        uStack_1bd8._4_4_ = local_1c60._12_4_;
        local_1c90._0_4_ = ((float)local_1b70 + 1.0) * (float)local_1be0;
        local_1c90._4_4_ = (local_1b70._4_4_ + 1.0) * local_1be0._4_4_;
        uStack_1bd8._0_4_ = ((float)uStack_1b68 + 1.0) * (float)uStack_1bd8;
        uStack_1bd8._4_4_ = (uStack_1b68._4_4_ + 1.0) * uStack_1bd8._4_4_;
        uStack_1c88._0_4_ = (float)uStack_1bd8;
        uStack_1c88._4_4_ = uStack_1bd8._4_4_;
        local_1e10 = local_1c90;
        uStack_1e08 = uStack_1c88;
        local_1a84 = 0x3f800000;
        local_1aa0 = 0x3f800000;
        local_1e20 = 0x3f8000003f800000;
        uStack_1e18 = 0x3f8000003f800000;
        local_1fb0._4_4_ = (float)local_1c90._4_4_ + 1.0;
        local_1fb0._0_4_ = (float)local_1c90._0_4_ + 1.0;
        uStack_1fa8._0_4_ = (float)uStack_1bd8 + 1.0;
        uStack_1fa8._4_4_ = uStack_1bd8._4_4_ + 1.0;
        local_14b0 = local_1fb0;
        uStack_14a8 = uStack_1fa8;
        local_14e0 = 0;
        uStack_14d8 = 0;
        local_14c0 = 0;
        uStack_14b8 = 0;
        auVar155._8_8_ = uStack_1fa8;
        auVar155._0_8_ = local_1fb0;
        local_1fe0 = vcmpps_avx(auVar155,ZEXT816(0),2);
        local_13f0 = local_1fb0;
        uStack_13e8 = uStack_1fa8;
        local_1400 = 0x80000000800000;
        uStack_13f8 = 0x80000000800000;
        auVar162._8_8_ = uStack_1fa8;
        auVar162._0_8_ = local_1fb0;
        auVar161._8_8_ = 0x80000000800000;
        auVar161._0_8_ = 0x80000000800000;
        auVar9 = vmaxps_avx(auVar162,auVar161);
        local_1fb0 = auVar9._0_8_;
        local_13c0 = local_1fb0;
        uStack_1fa8 = auVar9._8_8_;
        uStack_13b8 = uStack_1fa8;
        local_1f90 = local_1fb0;
        uStack_1f88 = uStack_1fa8;
        local_1f94 = 0x17;
        auVar1 = vpsrld_avx(auVar9,ZEXT416(0x17));
        local_12d0 = local_1fb0;
        uStack_12c8 = uStack_1fa8;
        local_12e0 = 0x807fffff807fffff;
        uStack_12d8 = 0x807fffff807fffff;
        auVar170._8_8_ = 0x807fffff807fffff;
        auVar170._0_8_ = 0x807fffff807fffff;
        auVar9 = vpand_avx(auVar9,auVar170);
        local_1fb0 = auVar9._0_8_;
        local_1230 = local_1fb0;
        uStack_1fa8 = auVar9._8_8_;
        uStack_1228 = uStack_1fa8;
        auVar173._8_8_ = 0x3f0000003f000000;
        auVar173._0_8_ = 0x3f0000003f000000;
        auVar6 = vpor_avx(auVar9,auVar173);
        local_1fc0._0_8_ = auVar1._0_8_;
        local_1f70 = local_1fc0._0_8_;
        local_1fc0._8_8_ = auVar1._8_8_;
        uStack_1f68 = local_1fc0._8_8_;
        auVar135._8_8_ = 0x7f0000007f;
        auVar135._0_8_ = 0x7f0000007f;
        local_1fc0 = vpsubd_avx(auVar1,auVar135);
        local_11a0 = local_1fc0._0_8_;
        uStack_1198 = local_1fc0._8_8_;
        auVar9 = vcvtdq2ps_avx(local_1fc0);
        local_1ff0 = auVar9._0_8_;
        uVar15 = local_1ff0;
        uStack_1fe8 = auVar9._8_8_;
        uVar16 = uStack_1fe8;
        local_1ec0 = 0x3f8000003f800000;
        uStack_1eb8 = 0x3f8000003f800000;
        local_1eb0._0_4_ = auVar9._0_4_;
        local_1eb0._4_4_ = auVar9._4_4_;
        uStack_1ea8._0_4_ = auVar9._8_4_;
        uStack_1ea8._4_4_ = auVar9._12_4_;
        local_1ff0._4_4_ = local_1eb0._4_4_ + 1.0;
        local_1ff0._0_4_ = (float)local_1eb0 + 1.0;
        uStack_1fe8._0_4_ = (float)uStack_1ea8 + 1.0;
        uStack_1fe8._4_4_ = uStack_1ea8._4_4_ + 1.0;
        local_1fb0 = auVar6._0_8_;
        local_1170 = local_1fb0;
        uStack_1fa8 = auVar6._8_8_;
        uStack_1168 = uStack_1fa8;
        local_1180 = 0x3f3504f33f3504f3;
        uStack_1178 = 0x3f3504f33f3504f3;
        auVar179._8_8_ = 0x3f3504f33f3504f3;
        auVar179._0_8_ = 0x3f3504f33f3504f3;
        local_2000 = vcmpps_avx(auVar6,auVar179,1);
        local_12f0 = local_1fb0;
        uStack_12e8 = uStack_1fa8;
        local_1300 = local_2000._0_8_;
        uStack_12f8 = local_2000._8_8_;
        local_2010 = vpand_avx(auVar6,local_2000);
        local_1a10 = local_1fb0;
        uStack_1a08 = uStack_1fa8;
        local_1a20 = 0x3f8000003f800000;
        uStack_1a18 = 0x3f8000003f800000;
        auVar141._8_8_ = 0x3f8000003f800000;
        auVar141._0_8_ = 0x3f8000003f800000;
        auVar9 = vsubps_avx(auVar6,auVar141);
        local_1a30 = local_1ff0;
        uStack_1a28 = uStack_1fe8;
        local_1310 = 0x3f8000003f800000;
        uStack_1308 = 0x3f8000003f800000;
        local_1320 = local_2000._0_8_;
        uStack_1318 = local_2000._8_8_;
        auVar169._8_8_ = 0x3f8000003f800000;
        auVar169._0_8_ = 0x3f8000003f800000;
        local_1a40 = vpand_avx(local_2000,auVar169);
        auVar140._8_8_ = uStack_1fe8;
        auVar140._0_8_ = local_1ff0;
        _local_1ff0 = vsubps_avx(auVar140,local_1a40);
        local_1fb0 = auVar9._0_8_;
        uVar17 = local_1fb0;
        uStack_1fa8 = auVar9._8_8_;
        uVar18 = uStack_1fa8;
        local_1ed0._0_4_ = auVar9._0_4_;
        local_1ed0._4_4_ = auVar9._4_4_;
        uStack_1ec8._0_4_ = auVar9._8_4_;
        uStack_1ec8._4_4_ = auVar9._12_4_;
        local_1ee0._0_4_ = local_2010._0_4_;
        local_1ee0._4_4_ = local_2010._4_4_;
        uStack_1ed8._0_4_ = local_2010._8_4_;
        uStack_1ed8._4_4_ = local_2010._12_4_;
        local_1fb0._0_4_ = (float)local_1ed0 + (float)local_1ee0;
        local_1fb0._4_4_ = local_1ed0._4_4_ + local_1ee0._4_4_;
        uStack_1ec8._0_4_ = (float)uStack_1ec8 + (float)uStack_1ed8;
        uStack_1ec8._4_4_ = uStack_1ec8._4_4_ + uStack_1ed8._4_4_;
        uStack_1fa8._0_4_ = (float)uStack_1ec8;
        uStack_1fa8._4_4_ = uStack_1ec8._4_4_;
        local_1f20 = local_1fb0;
        uStack_1f18 = uStack_1fa8;
        local_2020 = (float)local_1fb0._0_4_ * (float)local_1fb0._0_4_;
        fStack_201c = (float)local_1fb0._4_4_ * (float)local_1fb0._4_4_;
        fStack_2018 = (float)uStack_1ec8 * (float)uStack_1ec8;
        fStack_2014 = uStack_1ec8._4_4_ * uStack_1ec8._4_4_;
        uStack_2028 = 0x3d9021bb3d9021bb;
        local_2030 = (undefined1  [8])0x3d9021bb3d9021bb;
        local_ee8 = local_2030;
        local_f00 = local_1fb0;
        local_e28 = ::_ps_cephes_log_p1;
        local_a30 = 0x3d9021bb3d9021bb;
        uStack_a28 = 0x3d9021bb3d9021bb;
        local_a40 = local_1fb0;
        uStack_a38 = uStack_1fa8;
        local_a50[0] = -0.1151461;
        local_a50[1] = -0.1151461;
        afStack_a48[0] = -0.1151461;
        afStack_a48[1] = -0.1151461;
        auVar191._8_4_ = -0.1151461;
        auVar191._12_4_ = -0.1151461;
        auVar191._0_4_ = -0.1151461;
        auVar191._4_4_ = -0.1151461;
        auVar9 = vfmadd213ps_fma(_local_1fb0,_local_2030,auVar191);
        local_e40 = ::_ps_cephes_log_p2;
        local_2030 = auVar9._0_8_;
        local_a00 = local_2030;
        uStack_2028 = auVar9._8_8_;
        uStack_9f8 = uStack_2028;
        local_a10 = local_1fb0;
        uStack_a08 = uStack_1fa8;
        local_a20[0] = 0.116769984;
        local_a20[1] = 0.116769984;
        afStack_a18[0] = 0.116769984;
        afStack_a18[1] = 0.116769984;
        auVar192._8_4_ = 0.116769984;
        auVar192._12_4_ = 0.116769984;
        auVar192._0_4_ = 0.116769984;
        auVar192._4_4_ = 0.116769984;
        auVar9 = vfmadd213ps_fma(_local_1fb0,auVar9,auVar192);
        local_e58 = ::_ps_cephes_log_p3;
        local_2030 = auVar9._0_8_;
        local_9d0 = local_2030;
        uStack_2028 = auVar9._8_8_;
        uStack_9c8 = uStack_2028;
        local_9e0 = local_1fb0;
        uStack_9d8 = uStack_1fa8;
        local_9f0[0] = -0.12420141;
        local_9f0[1] = -0.12420141;
        afStack_9e8[0] = -0.12420141;
        afStack_9e8[1] = -0.12420141;
        auVar193._8_4_ = -0.12420141;
        auVar193._12_4_ = -0.12420141;
        auVar193._0_4_ = -0.12420141;
        auVar193._4_4_ = -0.12420141;
        auVar9 = vfmadd213ps_fma(_local_1fb0,auVar9,auVar193);
        local_e70 = ::_ps_cephes_log_p4;
        local_2030 = auVar9._0_8_;
        local_9a0 = local_2030;
        uStack_2028 = auVar9._8_8_;
        uStack_998 = uStack_2028;
        local_9b0 = local_1fb0;
        uStack_9a8 = uStack_1fa8;
        local_9c0[0] = 0.14249323;
        local_9c0[1] = 0.14249323;
        afStack_9b8[0] = 0.14249323;
        afStack_9b8[1] = 0.14249323;
        auVar194._8_4_ = 0.14249323;
        auVar194._12_4_ = 0.14249323;
        auVar194._0_4_ = 0.14249323;
        auVar194._4_4_ = 0.14249323;
        auVar9 = vfmadd213ps_fma(_local_1fb0,auVar9,auVar194);
        local_e88 = ::_ps_cephes_log_p5;
        local_2030 = auVar9._0_8_;
        local_970 = local_2030;
        uStack_2028 = auVar9._8_8_;
        uStack_968 = uStack_2028;
        local_980 = local_1fb0;
        uStack_978 = uStack_1fa8;
        local_990[0] = -0.16668057;
        local_990[1] = -0.16668057;
        afStack_988[0] = -0.16668057;
        afStack_988[1] = -0.16668057;
        auVar195._8_4_ = -0.16668057;
        auVar195._12_4_ = -0.16668057;
        auVar195._0_4_ = -0.16668057;
        auVar195._4_4_ = -0.16668057;
        auVar9 = vfmadd213ps_fma(_local_1fb0,auVar9,auVar195);
        local_ea0 = ::_ps_cephes_log_p6;
        local_2030 = auVar9._0_8_;
        local_940 = local_2030;
        uStack_2028 = auVar9._8_8_;
        uStack_938 = uStack_2028;
        local_950 = local_1fb0;
        uStack_948 = uStack_1fa8;
        local_960[0] = 0.20000714;
        local_960[1] = 0.20000714;
        afStack_958[0] = 0.20000714;
        afStack_958[1] = 0.20000714;
        auVar196._8_4_ = 0.20000714;
        auVar196._12_4_ = 0.20000714;
        auVar196._0_4_ = 0.20000714;
        auVar196._4_4_ = 0.20000714;
        auVar9 = vfmadd213ps_fma(_local_1fb0,auVar9,auVar196);
        local_eb8 = ::_ps_cephes_log_p7;
        local_2030 = auVar9._0_8_;
        local_910 = local_2030;
        uStack_2028 = auVar9._8_8_;
        uStack_908 = uStack_2028;
        local_920 = local_1fb0;
        uStack_918 = uStack_1fa8;
        local_930[0] = -0.24999994;
        local_930[1] = -0.24999994;
        afStack_928[0] = -0.24999994;
        afStack_928[1] = -0.24999994;
        auVar197._8_4_ = -0.24999994;
        auVar197._12_4_ = -0.24999994;
        auVar197._0_4_ = -0.24999994;
        auVar197._4_4_ = -0.24999994;
        auVar9 = vfmadd213ps_fma(_local_1fb0,auVar9,auVar197);
        local_ed0 = ::_ps_cephes_log_p8;
        local_2030 = auVar9._0_8_;
        local_8e0 = local_2030;
        uStack_2028 = auVar9._8_8_;
        uStack_8d8 = uStack_2028;
        local_8f0 = local_1fb0;
        uStack_8e8 = uStack_1fa8;
        local_900[0] = 0.3333333;
        local_900[1] = 0.3333333;
        afStack_8f8[0] = 0.3333333;
        afStack_8f8[1] = 0.3333333;
        auVar198._8_4_ = 0.3333333;
        auVar198._12_4_ = 0.3333333;
        auVar198._0_4_ = 0.3333333;
        auVar198._4_4_ = 0.3333333;
        auVar9 = vfmadd213ps_fma(_local_1fb0,auVar9,auVar198);
        local_2030 = auVar9._0_8_;
        uVar19 = local_2030;
        uStack_2028 = auVar9._8_8_;
        uVar20 = uStack_2028;
        local_1f40 = local_1fb0;
        uStack_1f38 = uStack_1fa8;
        local_1f30._0_4_ = auVar9._0_4_;
        local_1f30._4_4_ = auVar9._4_4_;
        uStack_1f28._0_4_ = auVar9._8_4_;
        uStack_1f28._4_4_ = auVar9._12_4_;
        local_2030._4_4_ = local_1f30._4_4_ * (float)local_1fb0._4_4_;
        local_2030._0_4_ = (float)local_1f30 * (float)local_1fb0._0_4_;
        uStack_2028._0_4_ = (float)uStack_1f28 * (float)uStack_1ec8;
        uStack_2028._4_4_ = uStack_1f28._4_4_ * uStack_1ec8._4_4_;
        local_1f50 = local_2030;
        uStack_1f48 = uStack_2028;
        local_1f60 = CONCAT44(fStack_201c,local_2020);
        uStack_1f58 = CONCAT44(fStack_2014,fStack_2018);
        local_2030._4_4_ = local_1f30._4_4_ * (float)local_1fb0._4_4_ * fStack_201c;
        local_2030._0_4_ = (float)local_1f30 * (float)local_1fb0._0_4_ * local_2020;
        uStack_2028._0_4_ = (float)uStack_1f28 * (float)uStack_1ec8 * fStack_2018;
        uStack_2028._4_4_ = uStack_1f28._4_4_ * uStack_1ec8._4_4_ * fStack_2014;
        local_ef0 = local_1ff0;
        local_ee0 = ::_ps_cephes_log_q1;
        local_8b0 = local_1ff0;
        uStack_8a8 = uStack_1fe8;
        local_8c0[0] = -0.00021219444;
        local_8c0[1] = -0.00021219444;
        afStack_8b8[0] = -0.00021219444;
        afStack_8b8[1] = -0.00021219444;
        local_8d0 = local_2030;
        uStack_8c8 = uStack_2028;
        auVar199._8_4_ = -0.00021219444;
        auVar199._12_4_ = -0.00021219444;
        auVar199._0_4_ = -0.00021219444;
        auVar199._4_4_ = -0.00021219444;
        auVar9 = vfmadd213ps_fma(auVar199,_local_1ff0,_local_2030);
        local_c50 = &local_2020;
        local_c58 = ::_ps_0p5;
        local_3a0 = CONCAT44(fStack_201c,local_2020);
        uStack_398 = CONCAT44(fStack_2014,fStack_2018);
        auVar243._4_4_ = fStack_201c;
        auVar243._0_4_ = local_2020;
        auVar243._8_4_ = fStack_2018;
        auVar243._12_4_ = fStack_2014;
        local_3b0[0] = 0.5;
        local_3b0[1] = 0.5;
        afStack_3a8[0] = 0.5;
        afStack_3a8[1] = 0.5;
        local_2030 = auVar9._0_8_;
        local_3c0 = local_2030;
        uStack_2028 = auVar9._8_8_;
        uStack_3b8 = uStack_2028;
        auVar222._8_4_ = 0.5;
        auVar222._12_4_ = 0.5;
        auVar222._0_4_ = 0.5;
        auVar222._4_4_ = 0.5;
        _local_2030 = vfnmadd213ps_fma(auVar222,auVar243,auVar9);
        local_1ef0 = local_1fb0;
        uStack_1ee8 = uStack_1fa8;
        local_1f00._0_4_ = local_2030._0_4_;
        local_1f00._4_4_ = local_2030._4_4_;
        uStack_1ef8._0_4_ = local_2030._8_4_;
        uStack_1ef8._4_4_ = local_2030._12_4_;
        local_1fb0._4_4_ = (float)local_1fb0._4_4_ + local_1f00._4_4_;
        local_1fb0._0_4_ = (float)local_1fb0._0_4_ + (float)local_1f00;
        uStack_1fa8._0_4_ = (float)uStack_1ec8 + (float)uStack_1ef8;
        uStack_1fa8._4_4_ = uStack_1ec8._4_4_ + uStack_1ef8._4_4_;
        local_ef8 = ::_ps_cephes_log_q2;
        local_880 = local_1ff0;
        uStack_878 = uStack_1fe8;
        local_890[0] = 0.6933594;
        local_890[1] = 0.6933594;
        afStack_888[0] = 0.6933594;
        afStack_888[1] = 0.6933594;
        local_8a0 = local_1fb0;
        uStack_898 = uStack_1fa8;
        auVar200._8_4_ = 0.6933594;
        auVar200._12_4_ = 0.6933594;
        auVar200._0_4_ = 0.6933594;
        auVar200._4_4_ = 0.6933594;
        auVar9 = vfmadd213ps_fma(auVar200,_local_1ff0,_local_1fb0);
        local_1fb0 = auVar9._0_8_;
        local_1250 = local_1fb0;
        uStack_1fa8 = auVar9._8_8_;
        uStack_1248 = uStack_1fa8;
        local_1260 = local_1fe0._0_8_;
        uStack_1258 = local_1fe0._8_8_;
        _local_1fb0 = vpor_avx(auVar9,local_1fe0);
        local_21b0 = local_1fb0;
        uStack_21a8 = uStack_1fa8;
        local_1b04 = 0x3f800000;
        local_1b20 = 0x3f800000;
        local_21c0 = 0x3f8000003f800000;
        uStack_21b8 = 0x3f8000003f800000;
        local_1b24 = 0x40000000;
        local_1b40 = 0x40000000;
        local_21d0 = 0x4000000040000000;
        uStack_21c8 = 0x4000000040000000;
        local_2170._0_4_ = local_1fb0._0_4_;
        local_2170._4_4_ = local_1fb0._4_4_;
        uStack_2168._0_4_ = local_1fb0._8_4_;
        uStack_2168._4_4_ = local_1fb0._12_4_;
        local_1970 = (float)local_2170 * 2.0;
        fStack_196c = local_2170._4_4_ * 2.0;
        fStack_1968 = (float)uStack_2168 * 2.0;
        fStack_1964 = uStack_2168._4_4_ * 2.0;
        local_17c4 = 0x3f800000;
        local_17e0 = 0x3f800000;
        local_1980 = 0x3f8000003f800000;
        uStack_1978 = 0x3f8000003f800000;
        local_1950._8_8_ = 0x3f8000003f800000;
        local_1950._0_8_ = 0x3f8000003f800000;
        local_1510 = 0;
        uStack_1508 = 0;
        local_1790 = 0;
        uStack_1788 = 0;
        local_17a0 = CONCAT44(fStack_196c,local_1970);
        uStack_1798 = CONCAT44(fStack_1964,fStack_1968);
        auVar148._8_8_ = uStack_1798;
        auVar148._0_8_ = local_17a0;
        auVar9 = vsubps_avx(ZEXT816(0),auVar148);
        local_1520 = 0;
        uStack_1518 = 0;
        local_18d0._0_8_ = auVar9._0_8_;
        local_1e0 = local_18d0._0_8_;
        local_18d0._8_8_ = auVar9._8_8_;
        uStack_1d8 = local_18d0._8_8_;
        auVar232._8_8_ = 0x42b0c0a542b0c0a5;
        auVar232._0_8_ = 0x42b0c0a542b0c0a5;
        auVar9 = vminps_avx(auVar9,auVar232);
        local_18d0._0_8_ = auVar9._0_8_;
        local_1450 = local_18d0._0_8_;
        local_18d0._8_8_ = auVar9._8_8_;
        uStack_1448 = local_18d0._8_8_;
        auVar158._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar158._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar158,auVar9);
        local_18d0._0_8_ = auVar1._0_8_;
        uVar21 = local_18d0._0_8_;
        local_18d0._8_8_ = auVar1._8_8_;
        uVar22 = local_18d0._8_8_;
        local_1830._0_4_ = auVar1._0_4_;
        local_1830._4_4_ = auVar1._4_4_;
        uStack_1828._0_4_ = auVar1._8_4_;
        uStack_1828._4_4_ = auVar1._12_4_;
        local_18f0._4_4_ = local_1830._4_4_ * 1.442695;
        local_18f0._0_4_ = (float)local_1830 * 1.442695;
        uStack_18e8._0_4_ = (float)uStack_1828 * 1.442695;
        uStack_18e8._4_4_ = uStack_1828._4_4_ * 1.442695;
        local_17f0 = local_18f0;
        uStack_17e8 = uStack_18e8;
        local_18f0._0_4_ = (float)local_1830 * 1.442695 + 0.5;
        local_18f0._4_4_ = local_1830._4_4_ * 1.442695 + 0.5;
        fVar245 = (float)uStack_1828 * 1.442695 + 0.5;
        fVar248 = uStack_1828._4_4_ * 1.442695 + 0.5;
        uStack_18e8._0_4_ = fVar245;
        uStack_18e8._4_4_ = fVar248;
        local_160 = local_18f0;
        uStack_158 = uStack_18e8;
        local_1900._4_4_ = (int)(float)local_18f0._4_4_;
        local_1900._0_4_ = (int)(float)local_18f0._0_4_;
        local_1900._8_4_ = (int)fVar245;
        local_1900._12_4_ = (int)fVar248;
        local_11d0 = local_1900._0_8_;
        uStack_11c8 = local_1900._8_8_;
        auVar176._8_8_ = local_1900._8_8_;
        auVar176._0_8_ = local_1900._0_8_;
        auVar6 = vcvtdq2ps_avx(auVar176);
        local_18e0 = auVar6._0_8_;
        local_e0 = local_18e0;
        uStack_18d8 = auVar6._8_8_;
        uStack_d8 = uStack_18d8;
        local_f0 = local_18f0;
        uStack_e8 = uStack_18e8;
        auVar236._8_8_ = uStack_18e8;
        auVar236._0_8_ = local_18f0;
        auVar9 = vcmpps_avx(auVar236,auVar6,1);
        local_1920._0_8_ = auVar9._0_8_;
        local_1370 = local_1920._0_8_;
        local_1920._8_8_ = auVar9._8_8_;
        uStack_1368 = local_1920._8_8_;
        local_1380 = 0x3f8000003f800000;
        uStack_1378 = 0x3f8000003f800000;
        auVar166._8_8_ = 0x3f8000003f800000;
        auVar166._0_8_ = 0x3f8000003f800000;
        local_1920 = vpand_avx(auVar9,auVar166);
        local_17b0 = local_18e0;
        uStack_17a8 = uStack_18d8;
        local_17c0 = local_1920._0_8_;
        uStack_17b8 = local_1920._8_8_;
        _local_18f0 = vsubps_avx(auVar6,local_1920);
        local_ce0 = local_18f0;
        local_cd0 = ::_ps_cephes_exp_C1;
        local_10b0 = local_18d0;
        local_2b0 = local_18f0;
        uStack_2a8 = uStack_18e8;
        local_2c0[0] = 0.6933594;
        local_2c0[1] = 0.6933594;
        afStack_2b8[0] = 0.6933594;
        afStack_2b8[1] = 0.6933594;
        local_2d0 = local_18d0._0_8_;
        uStack_2c8 = local_18d0._8_8_;
        auVar227._8_4_ = 0.6933594;
        auVar227._12_4_ = 0.6933594;
        auVar227._0_4_ = 0.6933594;
        auVar227._4_4_ = 0.6933594;
        auVar9 = vfnmadd213ps_fma(auVar227,_local_18f0,auVar1);
        local_ce8 = ::_ps_cephes_exp_C2;
        local_280 = local_18f0;
        uStack_278 = uStack_18e8;
        local_290[0] = -0.00021219444;
        local_290[1] = -0.00021219444;
        afStack_288[0] = -0.00021219444;
        afStack_288[1] = -0.00021219444;
        local_18d0._0_8_ = auVar9._0_8_;
        local_2a0 = local_18d0._0_8_;
        local_18d0._8_8_ = auVar9._8_8_;
        uStack_298 = local_18d0._8_8_;
        auVar228._8_4_ = -0.00021219444;
        auVar228._12_4_ = -0.00021219444;
        auVar228._0_4_ = -0.00021219444;
        auVar228._4_4_ = -0.00021219444;
        local_18d0 = vfnmadd213ps_fma(auVar228,_local_18f0,auVar9);
        local_1860 = local_18d0._0_8_;
        uStack_1858 = local_18d0._8_8_;
        local_1850._0_4_ = local_18d0._0_4_;
        local_1850._4_4_ = local_18d0._4_4_;
        uStack_1848._0_4_ = local_18d0._8_4_;
        uStack_1848._4_4_ = local_18d0._12_4_;
        local_18e0._4_4_ = local_1850._4_4_ * local_1850._4_4_;
        local_18e0._0_4_ = (float)local_1850 * (float)local_1850;
        uStack_18d8._0_4_ = (float)uStack_1848 * (float)uStack_1848;
        uStack_18d8._4_4_ = uStack_1848._4_4_ * uStack_1848._4_4_;
        uStack_1928 = 0x3950696739506967;
        local_1930 = (undefined1  [8])0x3950696739506967;
        local_10a0 = local_1930;
        local_1038 = ::_ps_cephes_exp_p1;
        local_610 = 0x3950696739506967;
        uStack_608 = 0x3950696739506967;
        local_620 = local_18d0._0_8_;
        uStack_618 = local_18d0._8_8_;
        local_630[0] = 0.0013981999;
        local_630[1] = 0.0013981999;
        afStack_628[0] = 0.0013981999;
        afStack_628[1] = 0.0013981999;
        auVar211._8_4_ = 0.0013981999;
        auVar211._12_4_ = 0.0013981999;
        auVar211._0_4_ = 0.0013981999;
        auVar211._4_4_ = 0.0013981999;
        auVar9 = vfmadd213ps_fma(local_18d0,_local_1930,auVar211);
        local_1050 = ::_ps_cephes_exp_p2;
        local_1930 = auVar9._0_8_;
        local_5e0 = local_1930;
        uStack_1928 = auVar9._8_8_;
        uStack_5d8 = uStack_1928;
        local_5f0 = local_18d0._0_8_;
        uStack_5e8 = local_18d0._8_8_;
        local_600[0] = 0.008333452;
        local_600[1] = 0.008333452;
        afStack_5f8[0] = 0.008333452;
        afStack_5f8[1] = 0.008333452;
        auVar212._8_4_ = 0.008333452;
        auVar212._12_4_ = 0.008333452;
        auVar212._0_4_ = 0.008333452;
        auVar212._4_4_ = 0.008333452;
        auVar9 = vfmadd213ps_fma(local_18d0,auVar9,auVar212);
        local_1068 = ::_ps_cephes_exp_p3;
        local_1930 = auVar9._0_8_;
        local_5b0 = local_1930;
        uStack_1928 = auVar9._8_8_;
        uStack_5a8 = uStack_1928;
        local_5c0 = local_18d0._0_8_;
        uStack_5b8 = local_18d0._8_8_;
        local_5d0[0] = 0.041665796;
        local_5d0[1] = 0.041665796;
        afStack_5c8[0] = 0.041665796;
        afStack_5c8[1] = 0.041665796;
        auVar213._8_4_ = 0.041665796;
        auVar213._12_4_ = 0.041665796;
        auVar213._0_4_ = 0.041665796;
        auVar213._4_4_ = 0.041665796;
        auVar9 = vfmadd213ps_fma(local_18d0,auVar9,auVar213);
        local_1080 = ::_ps_cephes_exp_p4;
        local_1930 = auVar9._0_8_;
        local_580 = local_1930;
        uStack_1928 = auVar9._8_8_;
        uStack_578 = uStack_1928;
        local_590 = local_18d0._0_8_;
        uStack_588 = local_18d0._8_8_;
        local_5a0[0] = 0.16666666;
        local_5a0[1] = 0.16666666;
        afStack_598[0] = 0.16666666;
        afStack_598[1] = 0.16666666;
        auVar214._8_4_ = 0.16666666;
        auVar214._12_4_ = 0.16666666;
        auVar214._0_4_ = 0.16666666;
        auVar214._4_4_ = 0.16666666;
        auVar9 = vfmadd213ps_fma(local_18d0,auVar9,auVar214);
        local_1098 = ::_ps_cephes_exp_p5;
        local_1930 = auVar9._0_8_;
        local_550 = local_1930;
        uStack_1928 = auVar9._8_8_;
        uStack_548 = uStack_1928;
        local_560 = local_18d0._0_8_;
        uStack_558 = local_18d0._8_8_;
        local_570[0] = 0.5;
        local_570[1] = 0.5;
        afStack_568[0] = 0.5;
        afStack_568[1] = 0.5;
        auVar215._8_4_ = 0.5;
        auVar215._12_4_ = 0.5;
        auVar215._0_4_ = 0.5;
        auVar215._4_4_ = 0.5;
        auVar9 = vfmadd213ps_fma(local_18d0,auVar9,auVar215);
        local_10a8 = local_18e0;
        local_1930 = auVar9._0_8_;
        local_520 = local_1930;
        uStack_1928 = auVar9._8_8_;
        uStack_518 = uStack_1928;
        local_530 = local_18e0;
        uStack_528 = uStack_18d8;
        local_540 = local_18d0._0_8_;
        uStack_538 = local_18d0._8_8_;
        auVar9 = vfmadd213ps_fma(_local_18e0,auVar9,local_18d0);
        local_1930 = auVar9._0_8_;
        uVar23 = local_1930;
        uStack_1928 = auVar9._8_8_;
        uVar24 = uStack_1928;
        local_1820 = 0x3f8000003f800000;
        uStack_1818 = 0x3f8000003f800000;
        local_1810._0_4_ = auVar9._0_4_;
        local_1810._4_4_ = auVar9._4_4_;
        uStack_1808._0_4_ = auVar9._8_4_;
        uStack_1808._4_4_ = auVar9._12_4_;
        local_1930._4_4_ = local_1810._4_4_ + 1.0;
        local_1930._0_4_ = (float)local_1810 + 1.0;
        uStack_1928._0_4_ = (float)uStack_1808 + 1.0;
        uStack_1928._4_4_ = uStack_1808._4_4_ + 1.0;
        local_170._0_4_ = local_18f0._0_4_;
        local_170._4_4_ = local_18f0._4_4_;
        uStack_168._0_4_ = local_18f0._8_4_;
        uStack_168._4_4_ = local_18f0._12_4_;
        local_1900._4_4_ = (int)local_170._4_4_;
        local_1900._0_4_ = (int)(float)local_170;
        local_1900._8_4_ = (int)(float)uStack_168;
        local_1900._12_4_ = (int)uStack_168._4_4_;
        local_18b0 = local_1900._0_8_;
        uStack_18a8 = local_1900._8_8_;
        auVar147._8_8_ = local_1900._8_8_;
        auVar147._0_8_ = local_1900._0_8_;
        auVar146._8_8_ = 0x7f0000007f;
        auVar146._0_8_ = 0x7f0000007f;
        auVar9 = vpaddd_avx(auVar147,auVar146);
        local_1900._0_8_ = auVar9._0_8_;
        local_1890 = local_1900._0_8_;
        local_1900._8_8_ = auVar9._8_8_;
        uStack_1888 = local_1900._8_8_;
        local_1894 = 0x17;
        local_1900 = vpslld_avx(auVar9,ZEXT416(0x17));
        local_80 = local_1900._0_8_;
        uStack_78 = local_1900._8_8_;
        local_1940 = local_1900._0_8_;
        uStack_1938 = local_1900._8_8_;
        local_1870 = _local_1930;
        local_1880._0_4_ = local_1900._0_4_;
        local_1880._4_4_ = local_1900._4_4_;
        uStack_1878._0_4_ = local_1900._8_4_;
        uStack_1878._4_4_ = local_1900._12_4_;
        local_1930._0_4_ = ((float)local_1810 + 1.0) * (float)local_1880;
        local_1930._4_4_ = (local_1810._4_4_ + 1.0) * local_1880._4_4_;
        uStack_1878._0_4_ = ((float)uStack_1808 + 1.0) * (float)uStack_1878;
        uStack_1878._4_4_ = (uStack_1808._4_4_ + 1.0) * uStack_1878._4_4_;
        uStack_1928._0_4_ = (float)uStack_1878;
        uStack_1928._4_4_ = uStack_1878._4_4_;
        local_1960 = local_1930;
        uStack_1958 = uStack_1928;
        local_1560 = (float)local_1930._0_4_ + 1.0;
        fStack_155c = (float)local_1930._4_4_ + 1.0;
        fStack_1558 = (float)uStack_1878 + 1.0;
        fStack_1554 = uStack_1878._4_4_ + 1.0;
        auVar154._4_4_ = fStack_155c;
        auVar154._0_4_ = local_1560;
        auVar154._8_4_ = fStack_1558;
        auVar154._12_4_ = fStack_1554;
        _local_2190 = vdivps_avx(local_1950,auVar154);
        local_19b0._0_4_ = (float)local_2190._0_4_ * 2.0;
        local_19b0._4_4_ = (float)local_2190._4_4_ * 2.0;
        local_19b0._8_4_ = fStack_2188 * 2.0;
        local_19b0._12_4_ = fStack_2184 * 2.0;
        auVar144._8_8_ = 0x3f8000003f800000;
        auVar144._0_8_ = 0x3f8000003f800000;
        _local_2260 = vsubps_avx(local_19b0,auVar144);
        local_2250._0_4_ = (undefined4)local_6b70;
        local_2250._4_4_ = (undefined4)((ulong)local_6b70 >> 0x20);
        fStack_2248 = (float)uStack_6b68;
        fStack_2244 = (float)((ulong)uStack_6b68 >> 0x20);
        local_6ed0 = CONCAT44((float)local_2250._4_4_ * (float)local_2260._4_4_,
                              (float)local_2250._0_4_ * (float)local_2260._0_4_);
        uStack_6ec8 = CONCAT44(fStack_2244 * fStack_2254,fStack_2248 * fStack_2258);
        local_6b38 = local_6e40;
        local_6b50 = local_6ed0;
        uStack_6b48 = uStack_6ec8;
        auVar28._8_8_ = uStack_6ec8;
        auVar28._0_8_ = local_6ed0;
        *(undefined1 (*) [16])*local_6e40 = auVar28;
        local_6e40 = (undefined1 (*) [32])(*local_6e40 + 0x10);
        _local_2250 = auVar2;
        local_21a0 = local_21d0;
        uStack_2198 = uStack_21c8;
        local_2180 = local_21d0;
        uStack_2178 = uStack_21c8;
        local_2170 = local_1fb0;
        uStack_2168 = uStack_1fa8;
        local_1f30 = uVar19;
        uStack_1f28 = uVar20;
        local_1f10 = local_1f20;
        uStack_1f08 = uStack_1f18;
        local_1f00 = local_2030;
        uStack_1ef8 = uStack_2028;
        local_1ee0 = local_2010._0_8_;
        uStack_1ed8 = local_2010._8_8_;
        local_1ed0 = uVar17;
        uStack_1ec8 = uVar18;
        local_1eb0 = uVar15;
        uStack_1ea8 = uVar16;
        local_1c70 = local_1fd0;
        uStack_1c68 = uStack_1fc8;
        local_1c20 = local_1f80;
        uStack_1c18 = uStack_1f78;
        local_1be0 = local_1c60._0_8_;
        uStack_1bd8 = local_1c60._8_8_;
        local_1bb0 = local_1bc0;
        uStack_1ba8 = uStack_1bb8;
        local_1b90 = uVar11;
        uStack_1b88 = uVar12;
        local_1b70 = uVar13;
        uStack_1b68 = uVar14;
        uStack_1b3c = local_1b40;
        uStack_1b38 = local_1b40;
        uStack_1b34 = local_1b40;
        uStack_1b1c = local_1b20;
        uStack_1b18 = local_1b20;
        uStack_1b14 = local_1b20;
        uStack_1a9c = local_1aa0;
        uStack_1a98 = local_1aa0;
        uStack_1a94 = local_1aa0;
        local_19c0 = local_21c0;
        uStack_19b8 = uStack_21b8;
        local_1910 = local_1fd0;
        uStack_1908 = uStack_1fc8;
        local_18c0 = local_1f80;
        uStack_18b8 = uStack_1f78;
        local_1880 = local_1900._0_8_;
        uStack_1878 = local_1900._8_8_;
        local_1850 = local_1860;
        uStack_1848 = uStack_1858;
        local_1840 = local_1ba0;
        uStack_1838 = uStack_1b98;
        local_1830 = uVar21;
        uStack_1828 = uVar22;
        local_1810 = uVar23;
        uStack_1808 = uVar24;
        local_1800 = local_1b60;
        uStack_17f8 = uStack_1b58;
        uStack_17dc = local_17e0;
        uStack_17d8 = local_17e0;
        uStack_17d4 = local_17e0;
        local_1550 = local_1950;
        local_1440 = local_1460;
        uStack_1438 = uStack_1458;
        local_1240 = local_1b60;
        uStack_1238 = uStack_1b58;
        local_1090 = local_10b0;
        local_1088 = local_10a0;
        local_1078 = local_10b0;
        local_1070 = local_10a0;
        local_1060 = local_10b0;
        local_1058 = local_10a0;
        local_1048 = local_10b0;
        local_1040 = local_10a0;
        local_1030 = local_10b0;
        local_1028 = local_10a0;
        local_1000 = local_1020;
        local_ff8 = local_1010;
        local_fe8 = local_1020;
        local_fe0 = local_1010;
        local_fd0 = local_1020;
        local_fc8 = local_1010;
        local_fb8 = local_1020;
        local_fb0 = local_1010;
        local_fa0 = local_1020;
        local_f98 = local_1010;
        local_ed8 = local_ef0;
        local_ec8 = local_f00;
        local_ec0 = local_ee8;
        local_eb0 = local_f00;
        local_ea8 = local_ee8;
        local_e98 = local_f00;
        local_e90 = local_ee8;
        local_e80 = local_f00;
        local_e78 = local_ee8;
        local_e68 = local_f00;
        local_e60 = local_ee8;
        local_e50 = local_f00;
        local_e48 = local_ee8;
        local_e38 = local_f00;
        local_e30 = local_ee8;
        local_e20 = local_f00;
        local_e18 = local_ee8;
        local_cf0 = local_10b0;
        local_cd8 = local_10b0;
        local_cc8 = local_ce0;
        local_cc0 = local_1020;
        local_ca8 = local_1020;
        local_c98 = local_cb0;
        local_c60 = local_ee8;
        local_1d0 = local_1f0;
        uStack_1c8 = uStack_1e8;
        local_1c0 = local_6b70;
        uStack_1b8 = uStack_6b68;
        local_170 = local_18f0;
        uStack_168 = uStack_18e8;
        local_150 = local_1c50;
        uStack_148 = uStack_1c48;
      }
      for (; local_6e8c < local_6d2c; local_6e8c = local_6e8c + 1) {
        fVar245 = *(float *)*local_6e40;
        fVar248 = expf(*(float *)*local_6e40);
        fVar248 = logf(fVar248 + 1.0);
        fVar248 = tanhf(fVar248);
        *(float *)*local_6e40 = fVar245 * fVar248;
        local_6e40 = (undefined1 (*) [32])(*local_6e40 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}